

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx::CurveNiMBIntersectorK<8,8>::
     intersect_t<embree::avx::SweepCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  Primitive PVar25;
  Geometry *pGVar26;
  __int_type_conflict _Var27;
  long lVar28;
  long lVar29;
  RTCRayQueryContext *pRVar30;
  RTCFilterFunctionN p_Var31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [16];
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  bool bVar101;
  undefined1 auVar102 [12];
  bool bVar103;
  bool bVar104;
  bool bVar105;
  bool bVar106;
  bool bVar107;
  bool bVar108;
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  uint uVar126;
  ulong uVar127;
  uint uVar128;
  long lVar129;
  uint uVar130;
  long lVar131;
  long lVar132;
  ulong uVar133;
  ulong uVar134;
  bool bVar135;
  float fVar136;
  float fVar168;
  float fVar170;
  __m128 a;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar174;
  float fVar176;
  float fVar177;
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  float fVar172;
  undefined1 auVar154 [32];
  float fVar169;
  float fVar171;
  float fVar173;
  float fVar175;
  undefined1 auVar155 [32];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  float fVar178;
  float fVar217;
  float fVar218;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  float fVar179;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  float fVar221;
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  float fVar219;
  float fVar220;
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [32];
  float fVar244;
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  float fVar245;
  float fVar261;
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [28];
  float fVar260;
  float fVar262;
  float fVar263;
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  float fVar264;
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  float fVar265;
  float fVar282;
  float fVar283;
  float fVar284;
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar280 [32];
  float fVar285;
  float fVar286;
  float fVar287;
  undefined1 auVar281 [64];
  float fVar288;
  float fVar303;
  float fVar304;
  undefined1 auVar289 [16];
  float fVar305;
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  float fVar306;
  float fVar307;
  float fVar309;
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  float fVar308;
  float fVar310;
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  float fVar311;
  float fVar312;
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  float fVar324;
  float fVar326;
  float fVar330;
  float fVar333;
  float fVar337;
  undefined1 auVar316 [32];
  float fVar328;
  float fVar331;
  float fVar334;
  float fVar335;
  float fVar338;
  float fVar339;
  float fVar341;
  undefined1 auVar317 [32];
  float fVar325;
  float fVar327;
  float fVar329;
  float fVar332;
  float fVar336;
  float fVar340;
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [64];
  float fVar342;
  float fVar353;
  float fVar354;
  float fVar356;
  float fVar358;
  float fVar360;
  float fVar362;
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  float fVar355;
  float fVar357;
  float fVar359;
  float fVar361;
  float fVar363;
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [64];
  float fVar364;
  float fVar365;
  float fVar366;
  float fVar367;
  float fVar368;
  float fVar378;
  float fVar383;
  float fVar388;
  float fVar393;
  float fVar398;
  float fVar403;
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  float fVar379;
  float fVar380;
  float fVar381;
  float fVar382;
  float fVar384;
  float fVar385;
  float fVar386;
  float fVar387;
  float fVar389;
  float fVar390;
  float fVar391;
  float fVar392;
  float fVar394;
  float fVar395;
  float fVar396;
  float fVar397;
  float fVar399;
  float fVar400;
  float fVar401;
  float fVar402;
  float fVar404;
  float fVar405;
  float fVar406;
  float fVar407;
  float fVar408;
  float fVar409;
  float fVar410;
  float fVar411;
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  undefined1 auVar377 [32];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  float fVar422;
  undefined1 auVar415 [32];
  undefined1 auVar416 [32];
  undefined1 auVar417 [32];
  undefined1 auVar418 [32];
  float fVar423;
  float fVar424;
  undefined1 auVar419 [32];
  undefined1 auVar420 [32];
  undefined1 auVar425 [16];
  undefined1 auVar426 [32];
  undefined1 auVar427 [32];
  undefined1 auVar428 [32];
  undefined1 auVar429 [32];
  undefined1 auVar430 [32];
  undefined1 auVar433 [16];
  float fVar432;
  float fVar440;
  float fVar441;
  float fVar442;
  float fVar443;
  float fVar444;
  float fVar445;
  undefined1 auVar434 [32];
  undefined1 auVar435 [32];
  undefined1 auVar436 [32];
  undefined1 auVar437 [32];
  undefined1 auVar438 [32];
  float fVar446;
  float fVar447;
  float fVar455;
  float fVar456;
  float fVar457;
  float fVar458;
  float fVar459;
  float fVar460;
  float in_register_0000151c;
  undefined1 auVar448 [32];
  undefined1 auVar449 [32];
  undefined1 auVar450 [32];
  undefined1 auVar451 [32];
  undefined1 auVar452 [32];
  undefined1 auVar453 [32];
  undefined1 auVar454 [64];
  float fVar461;
  float fVar462;
  float fVar463;
  float fVar470;
  float fVar473;
  float fVar475;
  float fVar477;
  float fVar479;
  float fVar481;
  undefined1 auVar464 [32];
  undefined1 auVar465 [32];
  float fVar471;
  float fVar474;
  float fVar476;
  float fVar478;
  float fVar480;
  float fVar482;
  undefined1 auVar466 [32];
  float fVar472;
  undefined1 auVar468 [32];
  undefined1 auVar469 [32];
  float in_register_0000159c;
  undefined1 auVar483 [32];
  undefined1 auVar484 [32];
  undefined1 auVar485 [32];
  float in_register_000015dc;
  undefined1 auVar486 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  vboolx_conflict valid;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  float local_c80;
  float local_bc0;
  float fStack_bbc;
  float fStack_bb8;
  float fStack_bb4;
  float local_ba0;
  float fStack_b9c;
  float fStack_b98;
  float fStack_b94;
  float fStack_b90;
  float fStack_b8c;
  float fStack_b88;
  float fStack_b84;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 local_b30;
  undefined8 uStack_b28;
  undefined1 local_b10 [8];
  float fStack_b08;
  float fStack_b04;
  undefined1 local_b00 [8];
  float fStack_af8;
  float fStack_af4;
  undefined1 local_af0 [8];
  float fStack_ae8;
  float fStack_ae4;
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  RTCFilterFunctionNArguments local_ad0;
  undefined1 local_aa0 [32];
  undefined8 *local_a80;
  undefined8 *local_a78;
  undefined1 (*local_a70) [32];
  ulong local_a68;
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [8];
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined8 local_970;
  undefined8 uStack_968;
  undefined1 local_960 [16];
  Primitive *local_950;
  ulong local_948;
  undefined1 local_940 [8];
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [8];
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float fStack_8a8;
  float fStack_8a4;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [16];
  undefined1 auStack_7d0 [16];
  undefined1 local_7c0 [32];
  ulong local_7a0;
  undefined1 auStack_798 [24];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [32];
  float local_6a0 [4];
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  float local_680 [4];
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  RTCHitN local_660 [16];
  undefined1 auStack_650 [16];
  undefined1 local_640 [16];
  undefined1 auStack_630 [16];
  undefined1 local_620 [16];
  undefined1 auStack_610 [16];
  undefined1 local_600 [16];
  undefined1 auStack_5f0 [16];
  undefined1 local_5e0 [32];
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  uint local_580;
  uint uStack_57c;
  uint uStack_578;
  uint uStack_574;
  uint uStack_570;
  uint uStack_56c;
  uint uStack_568;
  uint uStack_564;
  uint local_560;
  uint uStack_55c;
  uint uStack_558;
  uint uStack_554;
  uint uStack_550;
  uint uStack_54c;
  uint uStack_548;
  uint uStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined4 uStack_1c4;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  undefined4 uStack_1a4;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar421 [64];
  undefined1 auVar431 [64];
  undefined1 auVar439 [64];
  undefined1 auVar467 [32];
  
  PVar25 = prim[1];
  uVar133 = (ulong)(byte)PVar25;
  lVar129 = uVar133 * 0x25;
  auVar183 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar183 = vinsertps_avx(auVar183,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar36 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar36 = vinsertps_avx(auVar36,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar183 = vsubps_avx(auVar183,*(undefined1 (*) [16])(prim + lVar129 + 6));
  fVar245 = *(float *)(prim + lVar129 + 0x12);
  auVar180._0_4_ = fVar245 * auVar183._0_4_;
  auVar180._4_4_ = fVar245 * auVar183._4_4_;
  auVar180._8_4_ = fVar245 * auVar183._8_4_;
  auVar180._12_4_ = fVar245 * auVar183._12_4_;
  auVar183 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar133 * 4 + 6)));
  auVar289._0_4_ = fVar245 * auVar36._0_4_;
  auVar289._4_4_ = fVar245 * auVar36._4_4_;
  auVar289._8_4_ = fVar245 * auVar36._8_4_;
  auVar289._12_4_ = fVar245 * auVar36._12_4_;
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar133 * 4 + 10)));
  auVar149._16_16_ = auVar36;
  auVar149._0_16_ = auVar183;
  auVar149 = vcvtdq2ps_avx(auVar149);
  lVar28 = uVar133 * 5;
  auVar183 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar28 + 6)));
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar28 + 10)));
  auVar234._16_16_ = auVar36;
  auVar234._0_16_ = auVar183;
  auVar183 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar133 * 6 + 6)));
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar133 * 6 + 10)));
  auVar164 = vcvtdq2ps_avx(auVar234);
  auVar253._16_16_ = auVar36;
  auVar253._0_16_ = auVar183;
  auVar32 = vcvtdq2ps_avx(auVar253);
  auVar183 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar133 * 0xf + 6)));
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar133 * 0xf + 10)));
  auVar254._16_16_ = auVar36;
  auVar254._0_16_ = auVar183;
  auVar198 = vcvtdq2ps_avx(auVar254);
  lVar131 = (ulong)(byte)PVar25 * 0x10;
  auVar183 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar131 + 6)));
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar131 + 10)));
  auVar316._16_16_ = auVar36;
  auVar316._0_16_ = auVar183;
  auVar183 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar131 + uVar133 + 6)));
  auVar33 = vcvtdq2ps_avx(auVar316);
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar131 + uVar133 + 10)));
  auVar343._16_16_ = auVar36;
  auVar343._0_16_ = auVar183;
  auVar183 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar133 * 0x1a + 6)));
  auVar420 = vcvtdq2ps_avx(auVar343);
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar133 * 0x1a + 10)));
  auVar344._16_16_ = auVar36;
  auVar344._0_16_ = auVar183;
  auVar34 = vcvtdq2ps_avx(auVar344);
  auVar183 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar133 * 0x1b + 6)));
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar133 * 0x1b + 10)));
  auVar415._16_16_ = auVar36;
  auVar415._0_16_ = auVar183;
  auVar183 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar133 * 0x1c + 6)));
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar133 * 0x1c + 10)));
  auVar202 = vcvtdq2ps_avx(auVar415);
  auVar426._16_16_ = auVar36;
  auVar426._0_16_ = auVar183;
  auVar35 = vcvtdq2ps_avx(auVar426);
  auVar183 = vshufps_avx(auVar289,auVar289,0);
  auVar36 = vshufps_avx(auVar289,auVar289,0x55);
  auVar188 = vshufps_avx(auVar289,auVar289,0xaa);
  fVar245 = auVar188._0_4_;
  fVar179 = auVar188._4_4_;
  fVar260 = auVar188._8_4_;
  fVar219 = auVar188._12_4_;
  fVar244 = auVar36._0_4_;
  fVar221 = auVar36._4_4_;
  fVar261 = auVar36._8_4_;
  fVar174 = auVar36._12_4_;
  fVar262 = auVar183._0_4_;
  fVar263 = auVar183._4_4_;
  fVar264 = auVar183._8_4_;
  fVar265 = auVar183._12_4_;
  auVar448._0_4_ = fVar262 * auVar149._0_4_ + fVar244 * auVar164._0_4_ + fVar245 * auVar32._0_4_;
  auVar448._4_4_ = fVar263 * auVar149._4_4_ + fVar221 * auVar164._4_4_ + fVar179 * auVar32._4_4_;
  auVar448._8_4_ = fVar264 * auVar149._8_4_ + fVar261 * auVar164._8_4_ + fVar260 * auVar32._8_4_;
  auVar448._12_4_ = fVar265 * auVar149._12_4_ + fVar174 * auVar164._12_4_ + fVar219 * auVar32._12_4_
  ;
  auVar448._16_4_ = fVar262 * auVar149._16_4_ + fVar244 * auVar164._16_4_ + fVar245 * auVar32._16_4_
  ;
  auVar448._20_4_ = fVar263 * auVar149._20_4_ + fVar221 * auVar164._20_4_ + fVar179 * auVar32._20_4_
  ;
  auVar448._24_4_ = fVar264 * auVar149._24_4_ + fVar261 * auVar164._24_4_ + fVar260 * auVar32._24_4_
  ;
  auVar448._28_4_ = fVar174 + in_register_000015dc + in_register_0000151c;
  auVar434._0_4_ = fVar262 * auVar198._0_4_ + fVar244 * auVar33._0_4_ + auVar420._0_4_ * fVar245;
  auVar434._4_4_ = fVar263 * auVar198._4_4_ + fVar221 * auVar33._4_4_ + auVar420._4_4_ * fVar179;
  auVar434._8_4_ = fVar264 * auVar198._8_4_ + fVar261 * auVar33._8_4_ + auVar420._8_4_ * fVar260;
  auVar434._12_4_ = fVar265 * auVar198._12_4_ + fVar174 * auVar33._12_4_ + auVar420._12_4_ * fVar219
  ;
  auVar434._16_4_ = fVar262 * auVar198._16_4_ + fVar244 * auVar33._16_4_ + auVar420._16_4_ * fVar245
  ;
  auVar434._20_4_ = fVar263 * auVar198._20_4_ + fVar221 * auVar33._20_4_ + auVar420._20_4_ * fVar179
  ;
  auVar434._24_4_ = fVar264 * auVar198._24_4_ + fVar261 * auVar33._24_4_ + auVar420._24_4_ * fVar260
  ;
  auVar434._28_4_ = fVar174 + in_register_000015dc + in_register_0000159c;
  auVar295._0_4_ = fVar262 * auVar34._0_4_ + fVar244 * auVar202._0_4_ + auVar35._0_4_ * fVar245;
  auVar295._4_4_ = fVar263 * auVar34._4_4_ + fVar221 * auVar202._4_4_ + auVar35._4_4_ * fVar179;
  auVar295._8_4_ = fVar264 * auVar34._8_4_ + fVar261 * auVar202._8_4_ + auVar35._8_4_ * fVar260;
  auVar295._12_4_ = fVar265 * auVar34._12_4_ + fVar174 * auVar202._12_4_ + auVar35._12_4_ * fVar219;
  auVar295._16_4_ = fVar262 * auVar34._16_4_ + fVar244 * auVar202._16_4_ + auVar35._16_4_ * fVar245;
  auVar295._20_4_ = fVar263 * auVar34._20_4_ + fVar221 * auVar202._20_4_ + auVar35._20_4_ * fVar179;
  auVar295._24_4_ = fVar264 * auVar34._24_4_ + fVar261 * auVar202._24_4_ + auVar35._24_4_ * fVar260;
  auVar295._28_4_ = fVar265 + fVar174 + fVar219;
  auVar183 = vshufps_avx(auVar180,auVar180,0);
  auVar36 = vshufps_avx(auVar180,auVar180,0x55);
  auVar188 = vshufps_avx(auVar180,auVar180,0xaa);
  fVar245 = auVar188._0_4_;
  fVar179 = auVar188._4_4_;
  fVar260 = auVar188._8_4_;
  fVar219 = auVar188._12_4_;
  fVar263 = auVar36._0_4_;
  fVar264 = auVar36._4_4_;
  fVar265 = auVar36._8_4_;
  fVar282 = auVar36._12_4_;
  fVar244 = auVar164._28_4_ + auVar32._28_4_;
  fVar221 = auVar183._0_4_;
  fVar261 = auVar183._4_4_;
  fVar174 = auVar183._8_4_;
  fVar262 = auVar183._12_4_;
  auVar199._0_4_ = fVar221 * auVar149._0_4_ + fVar263 * auVar164._0_4_ + fVar245 * auVar32._0_4_;
  auVar199._4_4_ = fVar261 * auVar149._4_4_ + fVar264 * auVar164._4_4_ + fVar179 * auVar32._4_4_;
  auVar199._8_4_ = fVar174 * auVar149._8_4_ + fVar265 * auVar164._8_4_ + fVar260 * auVar32._8_4_;
  auVar199._12_4_ = fVar262 * auVar149._12_4_ + fVar282 * auVar164._12_4_ + fVar219 * auVar32._12_4_
  ;
  auVar199._16_4_ = fVar221 * auVar149._16_4_ + fVar263 * auVar164._16_4_ + fVar245 * auVar32._16_4_
  ;
  auVar199._20_4_ = fVar261 * auVar149._20_4_ + fVar264 * auVar164._20_4_ + fVar179 * auVar32._20_4_
  ;
  auVar199._24_4_ = fVar174 * auVar149._24_4_ + fVar265 * auVar164._24_4_ + fVar260 * auVar32._24_4_
  ;
  auVar199._28_4_ = auVar149._28_4_ + fVar244;
  auVar150._0_4_ = fVar221 * auVar198._0_4_ + auVar420._0_4_ * fVar245 + fVar263 * auVar33._0_4_;
  auVar150._4_4_ = fVar261 * auVar198._4_4_ + auVar420._4_4_ * fVar179 + fVar264 * auVar33._4_4_;
  auVar150._8_4_ = fVar174 * auVar198._8_4_ + auVar420._8_4_ * fVar260 + fVar265 * auVar33._8_4_;
  auVar150._12_4_ = fVar262 * auVar198._12_4_ + auVar420._12_4_ * fVar219 + fVar282 * auVar33._12_4_
  ;
  auVar150._16_4_ = fVar221 * auVar198._16_4_ + auVar420._16_4_ * fVar245 + fVar263 * auVar33._16_4_
  ;
  auVar150._20_4_ = fVar261 * auVar198._20_4_ + auVar420._20_4_ * fVar179 + fVar264 * auVar33._20_4_
  ;
  auVar150._24_4_ = fVar174 * auVar198._24_4_ + auVar420._24_4_ * fVar260 + fVar265 * auVar33._24_4_
  ;
  auVar150._28_4_ = auVar149._28_4_ + auVar420._28_4_ + auVar32._28_4_;
  auVar345._8_4_ = 0x7fffffff;
  auVar345._0_8_ = 0x7fffffff7fffffff;
  auVar345._12_4_ = 0x7fffffff;
  auVar345._16_4_ = 0x7fffffff;
  auVar345._20_4_ = 0x7fffffff;
  auVar345._24_4_ = 0x7fffffff;
  auVar345._28_4_ = 0x7fffffff;
  auVar369._8_4_ = 0x219392ef;
  auVar369._0_8_ = 0x219392ef219392ef;
  auVar369._12_4_ = 0x219392ef;
  auVar369._16_4_ = 0x219392ef;
  auVar369._20_4_ = 0x219392ef;
  auVar369._24_4_ = 0x219392ef;
  auVar369._28_4_ = 0x219392ef;
  auVar149 = vandps_avx(auVar448,auVar345);
  auVar149 = vcmpps_avx(auVar149,auVar369,1);
  auVar164 = vblendvps_avx(auVar448,auVar369,auVar149);
  auVar149 = vandps_avx(auVar434,auVar345);
  auVar149 = vcmpps_avx(auVar149,auVar369,1);
  auVar32 = vblendvps_avx(auVar434,auVar369,auVar149);
  auVar149 = vandps_avx(auVar295,auVar345);
  auVar149 = vcmpps_avx(auVar149,auVar369,1);
  auVar149 = vblendvps_avx(auVar295,auVar369,auVar149);
  auVar235._0_4_ = fVar221 * auVar34._0_4_ + fVar263 * auVar202._0_4_ + auVar35._0_4_ * fVar245;
  auVar235._4_4_ = fVar261 * auVar34._4_4_ + fVar264 * auVar202._4_4_ + auVar35._4_4_ * fVar179;
  auVar235._8_4_ = fVar174 * auVar34._8_4_ + fVar265 * auVar202._8_4_ + auVar35._8_4_ * fVar260;
  auVar235._12_4_ = fVar262 * auVar34._12_4_ + fVar282 * auVar202._12_4_ + auVar35._12_4_ * fVar219;
  auVar235._16_4_ = fVar221 * auVar34._16_4_ + fVar263 * auVar202._16_4_ + auVar35._16_4_ * fVar245;
  auVar235._20_4_ = fVar261 * auVar34._20_4_ + fVar264 * auVar202._20_4_ + auVar35._20_4_ * fVar179;
  auVar235._24_4_ = fVar174 * auVar34._24_4_ + fVar265 * auVar202._24_4_ + auVar35._24_4_ * fVar260;
  auVar235._28_4_ = fVar244 + auVar33._28_4_ + fVar219;
  auVar198 = vrcpps_avx(auVar164);
  fVar245 = auVar198._0_4_;
  fVar260 = auVar198._4_4_;
  auVar33._4_4_ = auVar164._4_4_ * fVar260;
  auVar33._0_4_ = auVar164._0_4_ * fVar245;
  fVar244 = auVar198._8_4_;
  auVar33._8_4_ = auVar164._8_4_ * fVar244;
  fVar261 = auVar198._12_4_;
  auVar33._12_4_ = auVar164._12_4_ * fVar261;
  fVar262 = auVar198._16_4_;
  auVar33._16_4_ = auVar164._16_4_ * fVar262;
  fVar263 = auVar198._20_4_;
  auVar33._20_4_ = auVar164._20_4_ * fVar263;
  fVar264 = auVar198._24_4_;
  auVar33._24_4_ = auVar164._24_4_ * fVar264;
  auVar33._28_4_ = auVar164._28_4_;
  auVar370._8_4_ = 0x3f800000;
  auVar370._0_8_ = &DAT_3f8000003f800000;
  auVar370._12_4_ = 0x3f800000;
  auVar370._16_4_ = 0x3f800000;
  auVar370._20_4_ = 0x3f800000;
  auVar370._24_4_ = 0x3f800000;
  auVar370._28_4_ = 0x3f800000;
  auVar420 = vsubps_avx(auVar370,auVar33);
  auVar33 = vrcpps_avx(auVar32);
  fVar245 = fVar245 + fVar245 * auVar420._0_4_;
  fVar260 = fVar260 + fVar260 * auVar420._4_4_;
  fVar244 = fVar244 + fVar244 * auVar420._8_4_;
  fVar261 = fVar261 + fVar261 * auVar420._12_4_;
  fVar262 = fVar262 + fVar262 * auVar420._16_4_;
  fVar263 = fVar263 + fVar263 * auVar420._20_4_;
  fVar264 = fVar264 + fVar264 * auVar420._24_4_;
  fVar265 = auVar33._0_4_;
  fVar282 = auVar33._4_4_;
  auVar164._4_4_ = fVar282 * auVar32._4_4_;
  auVar164._0_4_ = fVar265 * auVar32._0_4_;
  fVar283 = auVar33._8_4_;
  auVar164._8_4_ = fVar283 * auVar32._8_4_;
  fVar284 = auVar33._12_4_;
  auVar164._12_4_ = fVar284 * auVar32._12_4_;
  fVar285 = auVar33._16_4_;
  auVar164._16_4_ = fVar285 * auVar32._16_4_;
  fVar286 = auVar33._20_4_;
  auVar164._20_4_ = fVar286 * auVar32._20_4_;
  fVar287 = auVar33._24_4_;
  auVar164._24_4_ = fVar287 * auVar32._24_4_;
  auVar164._28_4_ = auVar32._28_4_;
  auVar32 = vsubps_avx(auVar370,auVar164);
  fVar265 = fVar265 + fVar265 * auVar32._0_4_;
  fVar282 = fVar282 + fVar282 * auVar32._4_4_;
  fVar283 = fVar283 + fVar283 * auVar32._8_4_;
  fVar284 = fVar284 + fVar284 * auVar32._12_4_;
  fVar285 = fVar285 + fVar285 * auVar32._16_4_;
  fVar286 = fVar286 + fVar286 * auVar32._20_4_;
  fVar287 = fVar287 + fVar287 * auVar32._24_4_;
  auVar164 = vrcpps_avx(auVar149);
  fVar288 = auVar164._0_4_;
  fVar303 = auVar164._4_4_;
  auVar34._4_4_ = fVar303 * auVar149._4_4_;
  auVar34._0_4_ = fVar288 * auVar149._0_4_;
  fVar304 = auVar164._8_4_;
  auVar34._8_4_ = fVar304 * auVar149._8_4_;
  fVar305 = auVar164._12_4_;
  auVar34._12_4_ = fVar305 * auVar149._12_4_;
  fVar306 = auVar164._16_4_;
  auVar34._16_4_ = fVar306 * auVar149._16_4_;
  fVar307 = auVar164._20_4_;
  auVar34._20_4_ = fVar307 * auVar149._20_4_;
  fVar309 = auVar164._24_4_;
  auVar34._24_4_ = fVar309 * auVar149._24_4_;
  auVar34._28_4_ = auVar149._28_4_;
  auVar149 = vsubps_avx(auVar370,auVar34);
  fVar288 = fVar288 + fVar288 * auVar149._0_4_;
  fVar303 = fVar303 + fVar303 * auVar149._4_4_;
  fVar304 = fVar304 + fVar304 * auVar149._8_4_;
  fVar305 = fVar305 + fVar305 * auVar149._12_4_;
  fVar306 = fVar306 + fVar306 * auVar149._16_4_;
  fVar307 = fVar307 + fVar307 * auVar149._20_4_;
  fVar309 = fVar309 + fVar309 * auVar149._24_4_;
  auVar183 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar129 + 0x16)) *
                           *(float *)(prim + lVar129 + 0x1a)));
  auVar225 = vshufps_avx(auVar183,auVar183,0);
  auVar183._8_8_ = 0;
  auVar183._0_8_ = *(ulong *)(prim + uVar133 * 7 + 6);
  auVar183 = vpmovsxwd_avx(auVar183);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(prim + uVar133 * 7 + 0xe);
  auVar36 = vpmovsxwd_avx(auVar36);
  auVar346._16_16_ = auVar36;
  auVar346._0_16_ = auVar183;
  auVar149 = vcvtdq2ps_avx(auVar346);
  auVar188._8_8_ = 0;
  auVar188._0_8_ = *(ulong *)(prim + uVar133 * 0xb + 6);
  auVar183 = vpmovsxwd_avx(auVar188);
  auVar224._8_8_ = 0;
  auVar224._0_8_ = *(ulong *)(prim + uVar133 * 0xb + 0xe);
  auVar36 = vpmovsxwd_avx(auVar224);
  auVar371._16_16_ = auVar36;
  auVar371._0_16_ = auVar183;
  auVar164 = vcvtdq2ps_avx(auVar371);
  auVar164 = vsubps_avx(auVar164,auVar149);
  fVar179 = auVar225._0_4_;
  fVar219 = auVar225._4_4_;
  fVar221 = auVar225._8_4_;
  fVar174 = auVar225._12_4_;
  auVar225._8_8_ = 0;
  auVar225._0_8_ = *(ulong *)(prim + uVar133 * 9 + 6);
  auVar183 = vpmovsxwd_avx(auVar225);
  auVar141._8_8_ = 0;
  auVar141._0_8_ = *(ulong *)(prim + uVar133 * 9 + 0xe);
  auVar36 = vpmovsxwd_avx(auVar141);
  auVar347._0_4_ = auVar164._0_4_ * fVar179 + auVar149._0_4_;
  auVar347._4_4_ = auVar164._4_4_ * fVar219 + auVar149._4_4_;
  auVar347._8_4_ = auVar164._8_4_ * fVar221 + auVar149._8_4_;
  auVar347._12_4_ = auVar164._12_4_ * fVar174 + auVar149._12_4_;
  auVar347._16_4_ = auVar164._16_4_ * fVar179 + auVar149._16_4_;
  auVar347._20_4_ = auVar164._20_4_ * fVar219 + auVar149._20_4_;
  auVar347._24_4_ = auVar164._24_4_ * fVar221 + auVar149._24_4_;
  auVar347._28_4_ = auVar164._28_4_ + auVar149._28_4_;
  auVar372._16_16_ = auVar36;
  auVar372._0_16_ = auVar183;
  auVar149 = vcvtdq2ps_avx(auVar372);
  auVar184._8_8_ = 0;
  auVar184._0_8_ = *(ulong *)(prim + uVar133 * 0xd + 6);
  auVar183 = vpmovsxwd_avx(auVar184);
  auVar140._8_8_ = 0;
  auVar140._0_8_ = *(ulong *)(prim + uVar133 * 0xd + 0xe);
  auVar36 = vpmovsxwd_avx(auVar140);
  auVar416._16_16_ = auVar36;
  auVar416._0_16_ = auVar183;
  auVar164 = vcvtdq2ps_avx(auVar416);
  auVar164 = vsubps_avx(auVar164,auVar149);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar133 * 0x12 + 6);
  auVar183 = vpmovsxwd_avx(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar133 * 0x12 + 0xe);
  auVar36 = vpmovsxwd_avx(auVar11);
  auVar373._0_4_ = auVar149._0_4_ + auVar164._0_4_ * fVar179;
  auVar373._4_4_ = auVar149._4_4_ + auVar164._4_4_ * fVar219;
  auVar373._8_4_ = auVar149._8_4_ + auVar164._8_4_ * fVar221;
  auVar373._12_4_ = auVar149._12_4_ + auVar164._12_4_ * fVar174;
  auVar373._16_4_ = auVar149._16_4_ + auVar164._16_4_ * fVar179;
  auVar373._20_4_ = auVar149._20_4_ + auVar164._20_4_ * fVar219;
  auVar373._24_4_ = auVar149._24_4_ + auVar164._24_4_ * fVar221;
  auVar373._28_4_ = auVar149._28_4_ + auVar164._28_4_;
  auVar417._16_16_ = auVar36;
  auVar417._0_16_ = auVar183;
  auVar149 = vcvtdq2ps_avx(auVar417);
  uVar127 = (ulong)(uint)((int)lVar28 << 2);
  lVar129 = uVar133 * 2 + uVar127;
  auVar187._8_8_ = 0;
  auVar187._0_8_ = *(ulong *)(prim + lVar129 + 6);
  auVar183 = vpmovsxwd_avx(auVar187);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + lVar129 + 0xe);
  auVar36 = vpmovsxwd_avx(auVar12);
  auVar427._16_16_ = auVar36;
  auVar427._0_16_ = auVar183;
  auVar164 = vcvtdq2ps_avx(auVar427);
  auVar164 = vsubps_avx(auVar164,auVar149);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar127 + 6);
  auVar183 = vpmovsxwd_avx(auVar13);
  auVar418._0_4_ = auVar149._0_4_ + auVar164._0_4_ * fVar179;
  auVar418._4_4_ = auVar149._4_4_ + auVar164._4_4_ * fVar219;
  auVar418._8_4_ = auVar149._8_4_ + auVar164._8_4_ * fVar221;
  auVar418._12_4_ = auVar149._12_4_ + auVar164._12_4_ * fVar174;
  auVar418._16_4_ = auVar149._16_4_ + auVar164._16_4_ * fVar179;
  auVar418._20_4_ = auVar149._20_4_ + auVar164._20_4_ * fVar219;
  auVar418._24_4_ = auVar149._24_4_ + auVar164._24_4_ * fVar221;
  auVar418._28_4_ = auVar149._28_4_ + auVar164._28_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar127 + 0xe);
  auVar36 = vpmovsxwd_avx(auVar14);
  auVar428._16_16_ = auVar36;
  auVar428._0_16_ = auVar183;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar133 * 0x18 + 6);
  auVar183 = vpmovsxwd_avx(auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar133 * 0x18 + 0xe);
  auVar36 = vpmovsxwd_avx(auVar16);
  auVar149 = vcvtdq2ps_avx(auVar428);
  auVar435._16_16_ = auVar36;
  auVar435._0_16_ = auVar183;
  auVar164 = vcvtdq2ps_avx(auVar435);
  auVar164 = vsubps_avx(auVar164,auVar149);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar133 * 0x1d + 6);
  auVar183 = vpmovsxwd_avx(auVar17);
  auVar429._0_4_ = auVar149._0_4_ + auVar164._0_4_ * fVar179;
  auVar429._4_4_ = auVar149._4_4_ + auVar164._4_4_ * fVar219;
  auVar429._8_4_ = auVar149._8_4_ + auVar164._8_4_ * fVar221;
  auVar429._12_4_ = auVar149._12_4_ + auVar164._12_4_ * fVar174;
  auVar429._16_4_ = auVar149._16_4_ + auVar164._16_4_ * fVar179;
  auVar429._20_4_ = auVar149._20_4_ + auVar164._20_4_ * fVar219;
  auVar429._24_4_ = auVar149._24_4_ + auVar164._24_4_ * fVar221;
  auVar429._28_4_ = auVar149._28_4_ + auVar164._28_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar133 * 0x1d + 0xe);
  auVar36 = vpmovsxwd_avx(auVar18);
  lVar129 = uVar133 + (ulong)(byte)PVar25 * 0x20;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + lVar129 + 6);
  auVar188 = vpmovsxwd_avx(auVar19);
  auVar436._16_16_ = auVar36;
  auVar436._0_16_ = auVar183;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + lVar129 + 0xe);
  auVar183 = vpmovsxwd_avx(auVar20);
  auVar449._16_16_ = auVar183;
  auVar449._0_16_ = auVar188;
  auVar149 = vcvtdq2ps_avx(auVar436);
  auVar164 = vcvtdq2ps_avx(auVar449);
  auVar164 = vsubps_avx(auVar164,auVar149);
  auVar437._0_4_ = auVar149._0_4_ + auVar164._0_4_ * fVar179;
  auVar437._4_4_ = auVar149._4_4_ + auVar164._4_4_ * fVar219;
  auVar437._8_4_ = auVar149._8_4_ + auVar164._8_4_ * fVar221;
  auVar437._12_4_ = auVar149._12_4_ + auVar164._12_4_ * fVar174;
  auVar437._16_4_ = auVar149._16_4_ + auVar164._16_4_ * fVar179;
  auVar437._20_4_ = auVar149._20_4_ + auVar164._20_4_ * fVar219;
  auVar437._24_4_ = auVar149._24_4_ + auVar164._24_4_ * fVar221;
  auVar437._28_4_ = auVar149._28_4_ + auVar164._28_4_;
  lVar129 = (ulong)(byte)PVar25 * 0x20 - uVar133;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + lVar129 + 6);
  auVar183 = vpmovsxwd_avx(auVar21);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + lVar129 + 0xe);
  auVar36 = vpmovsxwd_avx(auVar22);
  auVar450._16_16_ = auVar36;
  auVar450._0_16_ = auVar183;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar133 * 0x23 + 6);
  auVar183 = vpmovsxwd_avx(auVar23);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar133 * 0x23 + 0xe);
  auVar36 = vpmovsxwd_avx(auVar24);
  auVar464._16_16_ = auVar36;
  auVar464._0_16_ = auVar183;
  auVar149 = vcvtdq2ps_avx(auVar450);
  auVar164 = vcvtdq2ps_avx(auVar464);
  auVar164 = vsubps_avx(auVar164,auVar149);
  auVar451._0_4_ = auVar149._0_4_ + auVar164._0_4_ * fVar179;
  auVar451._4_4_ = auVar149._4_4_ + auVar164._4_4_ * fVar219;
  auVar451._8_4_ = auVar149._8_4_ + auVar164._8_4_ * fVar221;
  auVar451._12_4_ = auVar149._12_4_ + auVar164._12_4_ * fVar174;
  auVar451._16_4_ = auVar149._16_4_ + auVar164._16_4_ * fVar179;
  auVar451._20_4_ = auVar149._20_4_ + auVar164._20_4_ * fVar219;
  auVar451._24_4_ = auVar149._24_4_ + auVar164._24_4_ * fVar221;
  auVar451._28_4_ = auVar149._28_4_ + fVar174;
  auVar149 = vsubps_avx(auVar347,auVar199);
  auVar313._0_4_ = fVar245 * auVar149._0_4_;
  auVar313._4_4_ = fVar260 * auVar149._4_4_;
  auVar313._8_4_ = fVar244 * auVar149._8_4_;
  auVar313._12_4_ = fVar261 * auVar149._12_4_;
  auVar202._16_4_ = fVar262 * auVar149._16_4_;
  auVar202._0_16_ = auVar313;
  auVar202._20_4_ = fVar263 * auVar149._20_4_;
  auVar202._24_4_ = fVar264 * auVar149._24_4_;
  auVar202._28_4_ = auVar149._28_4_;
  auVar149 = vsubps_avx(auVar373,auVar199);
  auVar246._0_4_ = fVar245 * auVar149._0_4_;
  auVar246._4_4_ = fVar260 * auVar149._4_4_;
  auVar246._8_4_ = fVar244 * auVar149._8_4_;
  auVar246._12_4_ = fVar261 * auVar149._12_4_;
  auVar35._16_4_ = fVar262 * auVar149._16_4_;
  auVar35._0_16_ = auVar246;
  auVar35._20_4_ = fVar263 * auVar149._20_4_;
  auVar35._24_4_ = fVar264 * auVar149._24_4_;
  auVar35._28_4_ = auVar198._28_4_ + auVar420._28_4_;
  auVar149 = vsubps_avx(auVar418,auVar150);
  auVar181._0_4_ = fVar265 * auVar149._0_4_;
  auVar181._4_4_ = fVar282 * auVar149._4_4_;
  auVar181._8_4_ = fVar283 * auVar149._8_4_;
  auVar181._12_4_ = fVar284 * auVar149._12_4_;
  auVar198._16_4_ = fVar285 * auVar149._16_4_;
  auVar198._0_16_ = auVar181;
  auVar198._20_4_ = fVar286 * auVar149._20_4_;
  auVar198._24_4_ = fVar287 * auVar149._24_4_;
  auVar198._28_4_ = auVar149._28_4_;
  auVar149 = vsubps_avx(auVar429,auVar150);
  auVar266._0_4_ = fVar265 * auVar149._0_4_;
  auVar266._4_4_ = fVar282 * auVar149._4_4_;
  auVar266._8_4_ = fVar283 * auVar149._8_4_;
  auVar266._12_4_ = fVar284 * auVar149._12_4_;
  auVar420._16_4_ = fVar285 * auVar149._16_4_;
  auVar420._0_16_ = auVar266;
  auVar420._20_4_ = fVar286 * auVar149._20_4_;
  auVar420._24_4_ = fVar287 * auVar149._24_4_;
  auVar420._28_4_ = auVar33._28_4_ + auVar32._28_4_;
  auVar149 = vsubps_avx(auVar437,auVar235);
  auVar137._0_4_ = fVar288 * auVar149._0_4_;
  auVar137._4_4_ = fVar303 * auVar149._4_4_;
  auVar137._8_4_ = fVar304 * auVar149._8_4_;
  auVar137._12_4_ = fVar305 * auVar149._12_4_;
  auVar32._16_4_ = fVar306 * auVar149._16_4_;
  auVar32._0_16_ = auVar137;
  auVar32._20_4_ = fVar307 * auVar149._20_4_;
  auVar32._24_4_ = fVar309 * auVar149._24_4_;
  auVar32._28_4_ = auVar149._28_4_;
  auVar149 = vsubps_avx(auVar451,auVar235);
  auVar222._0_4_ = fVar288 * auVar149._0_4_;
  auVar222._4_4_ = fVar303 * auVar149._4_4_;
  auVar222._8_4_ = fVar304 * auVar149._8_4_;
  auVar222._12_4_ = fVar305 * auVar149._12_4_;
  auVar45._16_4_ = fVar306 * auVar149._16_4_;
  auVar45._0_16_ = auVar222;
  auVar45._20_4_ = fVar307 * auVar149._20_4_;
  auVar45._24_4_ = fVar309 * auVar149._24_4_;
  auVar45._28_4_ = auVar149._28_4_;
  auVar183 = vpminsd_avx(auVar202._16_16_,auVar35._16_16_);
  auVar36 = vpminsd_avx(auVar313,auVar246);
  auVar374._16_16_ = auVar183;
  auVar374._0_16_ = auVar36;
  auVar183 = vpminsd_avx(auVar198._16_16_,auVar420._16_16_);
  auVar36 = vpminsd_avx(auVar181,auVar266);
  auVar438._16_16_ = auVar183;
  auVar438._0_16_ = auVar36;
  auVar149 = vmaxps_avx(auVar374,auVar438);
  auVar183 = vpminsd_avx(auVar32._16_16_,auVar45._16_16_);
  auVar36 = vpminsd_avx(auVar137,auVar222);
  auVar465._16_16_ = auVar183;
  auVar465._0_16_ = auVar36;
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar483._4_4_ = uVar8;
  auVar483._0_4_ = uVar8;
  auVar483._8_4_ = uVar8;
  auVar483._12_4_ = uVar8;
  auVar483._16_4_ = uVar8;
  auVar483._20_4_ = uVar8;
  auVar483._24_4_ = uVar8;
  auVar483._28_4_ = uVar8;
  auVar164 = vmaxps_avx(auVar465,auVar483);
  auVar149 = vmaxps_avx(auVar149,auVar164);
  local_2c0._4_4_ = auVar149._4_4_ * 0.99999964;
  local_2c0._0_4_ = auVar149._0_4_ * 0.99999964;
  local_2c0._8_4_ = auVar149._8_4_ * 0.99999964;
  local_2c0._12_4_ = auVar149._12_4_ * 0.99999964;
  local_2c0._16_4_ = auVar149._16_4_ * 0.99999964;
  local_2c0._20_4_ = auVar149._20_4_ * 0.99999964;
  local_2c0._24_4_ = auVar149._24_4_ * 0.99999964;
  local_2c0._28_4_ = auVar149._28_4_;
  auVar183 = vpmaxsd_avx(auVar202._16_16_,auVar35._16_16_);
  auVar36 = vpmaxsd_avx(auVar313,auVar246);
  auVar255._16_16_ = auVar183;
  auVar255._0_16_ = auVar36;
  auVar183 = vpmaxsd_avx(auVar198._16_16_,auVar420._16_16_);
  auVar36 = vpmaxsd_avx(auVar181,auVar266);
  auVar195._16_16_ = auVar183;
  auVar195._0_16_ = auVar36;
  auVar149 = vminps_avx(auVar255,auVar195);
  auVar183 = vpmaxsd_avx(auVar32._16_16_,auVar45._16_16_);
  auVar36 = vpmaxsd_avx(auVar137,auVar222);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar236._4_4_ = uVar8;
  auVar236._0_4_ = uVar8;
  auVar236._8_4_ = uVar8;
  auVar236._12_4_ = uVar8;
  auVar236._16_4_ = uVar8;
  auVar236._20_4_ = uVar8;
  auVar236._24_4_ = uVar8;
  auVar236._28_4_ = uVar8;
  auVar151._16_16_ = auVar183;
  auVar151._0_16_ = auVar36;
  auVar164 = vminps_avx(auVar151,auVar236);
  auVar149 = vminps_avx(auVar149,auVar164);
  auVar46._4_4_ = auVar149._4_4_ * 1.0000004;
  auVar46._0_4_ = auVar149._0_4_ * 1.0000004;
  auVar46._8_4_ = auVar149._8_4_ * 1.0000004;
  auVar46._12_4_ = auVar149._12_4_ * 1.0000004;
  auVar46._16_4_ = auVar149._16_4_ * 1.0000004;
  auVar46._20_4_ = auVar149._20_4_ * 1.0000004;
  auVar46._24_4_ = auVar149._24_4_ * 1.0000004;
  auVar46._28_4_ = auVar149._28_4_;
  auVar149 = vcmpps_avx(local_2c0,auVar46,2);
  auVar183 = vpshufd_avx(ZEXT116((byte)PVar25),0);
  auVar196._16_16_ = auVar183;
  auVar196._0_16_ = auVar183;
  auVar164 = vcvtdq2ps_avx(auVar196);
  auVar164 = vcmpps_avx(_DAT_02020f40,auVar164,1);
  auVar149 = vandps_avx(auVar149,auVar164);
  uVar126 = vmovmskps_avx(auVar149);
  if (uVar126 == 0) {
    return;
  }
  uVar126 = uVar126 & 0xff;
  auVar152._16_16_ = mm_lookupmask_ps._240_16_;
  auVar152._0_16_ = mm_lookupmask_ps._240_16_;
  local_280 = vblendps_avx(auVar152,ZEXT832(0) << 0x20,0x80);
  local_a70 = (undefined1 (*) [32])&local_580;
  uVar128 = 1 << ((byte)k & 0x1f);
  local_a78 = (undefined8 *)(mm_lookupmask_ps + ((uVar128 & 0xf) << 4));
  local_a80 = (undefined8 *)(mm_lookupmask_ps + (long)((int)uVar128 >> 4) * 0x10);
  auVar352 = ZEXT1664((undefined1  [16])0x0);
  local_950 = prim;
LAB_0121ec41:
  local_948 = (ulong)uVar126;
  lVar129 = 0;
  if (local_948 != 0) {
    for (; (uVar126 >> lVar129 & 1) == 0; lVar129 = lVar129 + 1) {
    }
  }
  uVar126 = *(uint *)(local_950 + 2);
  local_a68 = (ulong)*(uint *)(local_950 + lVar129 * 4 + 6);
  pGVar26 = (context->scene->geometries).items[uVar126].ptr;
  uVar133 = (ulong)*(uint *)(*(long *)&pGVar26->field_0x58 +
                            local_a68 *
                            pGVar26[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  fVar245 = (pGVar26->time_range).lower;
  fVar245 = pGVar26->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar245) / ((pGVar26->time_range).upper - fVar245));
  auVar183 = vroundss_avx(ZEXT416((uint)fVar245),ZEXT416((uint)fVar245),9);
  auVar183 = vminss_avx(auVar183,ZEXT416((uint)(pGVar26->fnumTimeSegments + -1.0)));
  auVar183 = vmaxss_avx(auVar352._0_16_,auVar183);
  fVar245 = fVar245 - auVar183._0_4_;
  _Var27 = pGVar26[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar132 = (long)(int)auVar183._0_4_ * 0x38;
  lVar28 = *(long *)(_Var27 + 0x10 + lVar132);
  lVar131 = *(long *)(_Var27 + 0x38 + lVar132);
  lVar29 = *(long *)(_Var27 + 0x48 + lVar132);
  auVar183 = vshufps_avx(ZEXT416((uint)fVar245),ZEXT416((uint)fVar245),0);
  pfVar1 = (float *)(lVar131 + uVar133 * lVar29);
  fVar221 = auVar183._0_4_;
  fVar261 = auVar183._4_4_;
  fVar174 = auVar183._8_4_;
  fVar262 = auVar183._12_4_;
  pfVar2 = (float *)(lVar131 + (uVar133 + 1) * lVar29);
  pfVar3 = (float *)(lVar131 + (uVar133 + 2) * lVar29);
  pfVar4 = (float *)(lVar131 + lVar29 * (uVar133 + 3));
  lVar131 = *(long *)(_Var27 + lVar132);
  auVar183 = vshufps_avx(ZEXT416((uint)(1.0 - fVar245)),ZEXT416((uint)(1.0 - fVar245)),0);
  pfVar5 = (float *)(lVar131 + lVar28 * uVar133);
  fVar179 = auVar183._0_4_;
  fVar260 = auVar183._4_4_;
  fVar219 = auVar183._8_4_;
  fVar244 = auVar183._12_4_;
  pfVar6 = (float *)(lVar131 + lVar28 * (uVar133 + 1));
  pfVar7 = (float *)(lVar131 + lVar28 * (uVar133 + 2));
  auVar223._0_4_ = fVar221 * *pfVar1 + fVar179 * *pfVar5;
  auVar223._4_4_ = fVar261 * pfVar1[1] + fVar260 * pfVar5[1];
  auVar223._8_4_ = fVar174 * pfVar1[2] + fVar219 * pfVar5[2];
  auVar223._12_4_ = fVar262 * pfVar1[3] + fVar244 * pfVar5[3];
  auVar182._0_4_ = fVar179 * *pfVar6 + fVar221 * *pfVar2;
  auVar182._4_4_ = fVar260 * pfVar6[1] + fVar261 * pfVar2[1];
  auVar182._8_4_ = fVar219 * pfVar6[2] + fVar174 * pfVar2[2];
  auVar182._12_4_ = fVar244 * pfVar6[3] + fVar262 * pfVar2[3];
  pfVar1 = (float *)(lVar131 + lVar28 * (uVar133 + 3));
  auVar247._0_4_ = fVar179 * *pfVar7 + fVar221 * *pfVar3;
  auVar247._4_4_ = fVar260 * pfVar7[1] + fVar261 * pfVar3[1];
  auVar247._8_4_ = fVar219 * pfVar7[2] + fVar174 * pfVar3[2];
  auVar247._12_4_ = fVar244 * pfVar7[3] + fVar262 * pfVar3[3];
  auVar183 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar36 = vinsertps_avx(auVar183,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar245 = *(float *)(ray + k * 4 + 0x80);
  auVar412._4_4_ = fVar245;
  auVar412._0_4_ = fVar245;
  auVar412._8_4_ = fVar245;
  auVar412._12_4_ = fVar245;
  fStack_870 = fVar245;
  _local_880 = auVar412;
  fStack_86c = fVar245;
  fStack_868 = fVar245;
  fStack_864 = fVar245;
  auVar421 = ZEXT3264(_local_880);
  auVar290._0_4_ = fVar179 * *pfVar1 + fVar221 * *pfVar4;
  auVar290._4_4_ = fVar260 * pfVar1[1] + fVar261 * pfVar4[1];
  auVar290._8_4_ = fVar219 * pfVar1[2] + fVar174 * pfVar4[2];
  auVar290._12_4_ = fVar244 * pfVar1[3] + fVar262 * pfVar4[3];
  fVar179 = *(float *)(ray + k * 4 + 0xa0);
  auVar425._4_4_ = fVar179;
  auVar425._0_4_ = fVar179;
  auVar425._8_4_ = fVar179;
  auVar425._12_4_ = fVar179;
  fStack_890 = fVar179;
  _local_8a0 = auVar425;
  fStack_88c = fVar179;
  fStack_888 = fVar179;
  fStack_884 = fVar179;
  auVar431 = ZEXT3264(_local_8a0);
  auVar183 = vunpcklps_avx(auVar412,auVar425);
  fVar260 = *(float *)(ray + k * 4 + 0xc0);
  auVar433._4_4_ = fVar260;
  auVar433._0_4_ = fVar260;
  auVar433._8_4_ = fVar260;
  auVar433._12_4_ = fVar260;
  fStack_8b0 = fVar260;
  _local_8c0 = auVar433;
  fStack_8ac = fVar260;
  fStack_8a8 = fVar260;
  fStack_8a4 = fVar260;
  auVar439 = ZEXT3264(_local_8c0);
  _local_9d0 = vinsertps_avx(auVar183,auVar433,0x28);
  auVar454 = ZEXT1664(_local_9d0);
  auVar138._0_4_ = (auVar223._0_4_ + auVar182._0_4_ + auVar247._0_4_ + auVar290._0_4_) * 0.25;
  auVar138._4_4_ = (auVar223._4_4_ + auVar182._4_4_ + auVar247._4_4_ + auVar290._4_4_) * 0.25;
  auVar138._8_4_ = (auVar223._8_4_ + auVar182._8_4_ + auVar247._8_4_ + auVar290._8_4_) * 0.25;
  auVar138._12_4_ = (auVar223._12_4_ + auVar182._12_4_ + auVar247._12_4_ + auVar290._12_4_) * 0.25;
  auVar183 = vsubps_avx(auVar138,auVar36);
  auVar183 = vdpps_avx(auVar183,_local_9d0,0x7f);
  local_9e0 = vdpps_avx(_local_9d0,_local_9d0,0x7f);
  auVar188 = vrcpss_avx(local_9e0,local_9e0);
  fVar219 = auVar183._0_4_ * auVar188._0_4_ * (2.0 - local_9e0._0_4_ * auVar188._0_4_);
  auVar352 = ZEXT464((uint)fVar219);
  auVar188 = vshufps_avx(ZEXT416((uint)fVar219),ZEXT416((uint)fVar219),0);
  auVar267._0_4_ = auVar36._0_4_ + local_9d0._0_4_ * auVar188._0_4_;
  auVar267._4_4_ = auVar36._4_4_ + local_9d0._4_4_ * auVar188._4_4_;
  auVar267._8_4_ = auVar36._8_4_ + local_9d0._8_4_ * auVar188._8_4_;
  auVar267._12_4_ = auVar36._12_4_ + local_9d0._12_4_ * auVar188._12_4_;
  auVar183 = vblendps_avx(auVar267,_DAT_01feba10,8);
  _local_ae0 = vsubps_avx(auVar223,auVar183);
  _local_af0 = vsubps_avx(auVar247,auVar183);
  _local_b00 = vsubps_avx(auVar182,auVar183);
  _local_b10 = vsubps_avx(auVar290,auVar183);
  auVar183 = vshufps_avx(_local_ae0,_local_ae0,0);
  register0x00001250 = auVar183;
  _local_1a0 = auVar183;
  auVar183 = vshufps_avx(_local_ae0,_local_ae0,0x55);
  register0x00001250 = auVar183;
  _local_1c0 = auVar183;
  auVar183 = vshufps_avx(_local_ae0,_local_ae0,0xaa);
  register0x00001250 = auVar183;
  _local_1e0 = auVar183;
  auVar183 = vshufps_avx(_local_ae0,_local_ae0,0xff);
  register0x00001290 = auVar183;
  _local_380 = auVar183;
  auVar183 = vshufps_avx(_local_b00,_local_b00,0);
  register0x00001290 = auVar183;
  _local_200 = auVar183;
  auVar183 = vshufps_avx(_local_b00,_local_b00,0x55);
  register0x00001290 = auVar183;
  _local_220 = auVar183;
  auVar183 = vshufps_avx(_local_b00,_local_b00,0xaa);
  register0x00001290 = auVar183;
  _local_240 = auVar183;
  auVar183 = vshufps_avx(_local_b00,_local_b00,0xff);
  register0x00001290 = auVar183;
  _local_3a0 = auVar183;
  auVar183 = vshufps_avx(_local_af0,_local_af0,0);
  register0x00001290 = auVar183;
  _local_3c0 = auVar183;
  auVar183 = vshufps_avx(_local_af0,_local_af0,0x55);
  register0x00001290 = auVar183;
  _local_3e0 = auVar183;
  auVar183 = vshufps_avx(_local_af0,_local_af0,0xaa);
  register0x00001290 = auVar183;
  _local_400 = auVar183;
  auVar183 = vshufps_avx(_local_af0,_local_af0,0xff);
  register0x00001290 = auVar183;
  _local_420 = auVar183;
  auVar183 = vshufps_avx(_local_b10,_local_b10,0);
  register0x00001290 = auVar183;
  _local_440 = auVar183;
  auVar183 = vshufps_avx(_local_b10,_local_b10,0x55);
  register0x00001290 = auVar183;
  _local_460 = auVar183;
  auVar183 = vshufps_avx(_local_b10,_local_b10,0xaa);
  register0x00001290 = auVar183;
  _local_480 = auVar183;
  auVar183 = vshufps_avx(_local_b10,_local_b10,0xff);
  register0x00001290 = auVar183;
  _local_4a0 = auVar183;
  auVar183 = ZEXT416((uint)(fVar245 * fVar245 + fVar179 * fVar179 + fVar260 * fVar260));
  auVar183 = vshufps_avx(auVar183,auVar183,0);
  local_260._16_16_ = auVar183;
  local_260._0_16_ = auVar183;
  fVar245 = *(float *)(ray + k * 4 + 0x60);
  local_960 = ZEXT416((uint)fVar219);
  auVar183 = vshufps_avx(ZEXT416((uint)(fVar245 - fVar219)),ZEXT416((uint)(fVar245 - fVar219)),0);
  local_2a0._16_16_ = auVar183;
  local_2a0._0_16_ = auVar183;
  auVar183 = vpshufd_avx(ZEXT416(uVar126),0);
  local_500._16_16_ = auVar183;
  local_500._0_16_ = auVar183;
  auVar183 = vpshufd_avx(ZEXT416(*(uint *)(local_950 + lVar129 * 4 + 6)),0);
  local_520._16_16_ = auVar183;
  local_520._0_16_ = auVar183;
  local_9a0._16_16_ = auVar188;
  local_9a0._0_16_ = auVar188;
  auVar323 = ZEXT3264(local_9a0);
  uVar127 = 0;
  uVar133 = 1;
  auVar153._8_4_ = 0x7fffffff;
  auVar153._0_8_ = 0x7fffffff7fffffff;
  auVar153._12_4_ = 0x7fffffff;
  auVar153._16_4_ = 0x7fffffff;
  auVar153._20_4_ = 0x7fffffff;
  auVar153._24_4_ = 0x7fffffff;
  auVar153._28_4_ = 0x7fffffff;
  local_4c0 = vandps_avx(local_260,auVar153);
  auVar183 = vsqrtss_avx(local_9e0,local_9e0);
  auVar36 = vsqrtss_avx(local_9e0,local_9e0);
  local_970 = 0x3f80000000000000;
  uStack_968 = 0;
  auVar281 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  do {
    auVar122._8_8_ = uStack_968;
    auVar122._0_8_ = local_970;
    auVar188 = vmovshdup_avx(auVar122);
    fVar262 = auVar188._0_4_ - (float)local_970;
    auVar188 = vshufps_avx(auVar122,auVar122,0);
    local_820._16_16_ = auVar188;
    local_820._0_16_ = auVar188;
    auVar224 = vshufps_avx(ZEXT416((uint)fVar262),ZEXT416((uint)fVar262),0);
    local_840._16_16_ = auVar224;
    local_840._0_16_ = auVar224;
    fVar178 = auVar224._0_4_;
    fVar217 = auVar224._4_4_;
    fVar218 = auVar224._8_4_;
    fVar220 = auVar224._12_4_;
    fVar136 = auVar188._0_4_;
    auVar256._0_4_ = fVar136 + fVar178 * 0.0;
    fVar168 = auVar188._4_4_;
    auVar256._4_4_ = fVar168 + fVar217 * 0.14285715;
    fVar170 = auVar188._8_4_;
    auVar256._8_4_ = fVar170 + fVar218 * 0.2857143;
    fVar172 = auVar188._12_4_;
    auVar256._12_4_ = fVar172 + fVar220 * 0.42857146;
    auVar256._16_4_ = fVar136 + fVar178 * 0.5714286;
    auVar256._20_4_ = fVar168 + fVar217 * 0.71428573;
    auVar256._24_4_ = fVar170 + fVar218 * 0.8571429;
    auVar256._28_4_ = fVar172 + fVar220;
    auVar149 = vsubps_avx(auVar281._0_32_,auVar256);
    fVar179 = auVar149._0_4_;
    fVar260 = auVar149._4_4_;
    fVar219 = auVar149._8_4_;
    fVar244 = auVar149._12_4_;
    fVar221 = auVar149._16_4_;
    fVar261 = auVar149._20_4_;
    fVar174 = auVar149._24_4_;
    fVar264 = fVar179 * fVar179 * fVar179;
    fVar288 = fVar260 * fVar260 * fVar260;
    fVar304 = fVar219 * fVar219 * fVar219;
    fVar306 = fVar244 * fVar244 * fVar244;
    fVar309 = fVar221 * fVar221 * fVar221;
    fVar333 = fVar261 * fVar261 * fVar261;
    fVar337 = fVar174 * fVar174 * fVar174;
    fVar342 = auVar256._0_4_ * auVar256._0_4_ * auVar256._0_4_;
    fVar353 = auVar256._4_4_ * auVar256._4_4_ * auVar256._4_4_;
    fVar354 = auVar256._8_4_ * auVar256._8_4_ * auVar256._8_4_;
    fVar356 = auVar256._12_4_ * auVar256._12_4_ * auVar256._12_4_;
    fVar358 = auVar256._16_4_ * auVar256._16_4_ * auVar256._16_4_;
    fVar360 = auVar256._20_4_ * auVar256._20_4_ * auVar256._20_4_;
    fVar362 = auVar256._24_4_ * auVar256._24_4_ * auVar256._24_4_;
    fVar263 = auVar256._0_4_ * fVar179;
    fVar265 = auVar256._4_4_ * fVar260;
    fVar282 = auVar256._8_4_ * fVar219;
    fVar283 = auVar256._12_4_ * fVar244;
    fVar284 = auVar256._16_4_ * fVar221;
    fVar285 = auVar256._20_4_ * fVar261;
    fVar287 = auVar256._24_4_ * fVar174;
    fVar286 = auVar431._28_4_ + auVar454._28_4_;
    fVar408 = auVar352._28_4_ + 1.0 + fVar286;
    fVar423 = fVar286 + auVar323._28_4_ + auVar439._28_4_ + auVar421._28_4_;
    fVar286 = fVar264 * 0.16666667;
    fVar303 = fVar288 * 0.16666667;
    fVar305 = fVar304 * 0.16666667;
    fVar307 = fVar306 * 0.16666667;
    fVar330 = fVar309 * 0.16666667;
    fVar334 = fVar333 * 0.16666667;
    fVar338 = fVar337 * 0.16666667;
    fVar364 = (fVar342 + fVar264 * 4.0 + fVar179 * fVar263 * 12.0 + auVar256._0_4_ * fVar263 * 6.0)
              * 0.16666667;
    fVar378 = (fVar353 + fVar288 * 4.0 + fVar260 * fVar265 * 12.0 + auVar256._4_4_ * fVar265 * 6.0)
              * 0.16666667;
    fVar383 = (fVar354 + fVar304 * 4.0 + fVar219 * fVar282 * 12.0 + auVar256._8_4_ * fVar282 * 6.0)
              * 0.16666667;
    fVar388 = (fVar356 + fVar306 * 4.0 + fVar244 * fVar283 * 12.0 + auVar256._12_4_ * fVar283 * 6.0)
              * 0.16666667;
    fVar393 = (fVar358 + fVar309 * 4.0 + fVar221 * fVar284 * 12.0 + auVar256._16_4_ * fVar284 * 6.0)
              * 0.16666667;
    fVar398 = (fVar360 + fVar333 * 4.0 + fVar261 * fVar285 * 12.0 + auVar256._20_4_ * fVar285 * 6.0)
              * 0.16666667;
    fVar403 = (fVar362 + fVar337 * 4.0 + fVar174 * fVar287 * 12.0 + auVar256._24_4_ * fVar287 * 6.0)
              * 0.16666667;
    fVar264 = (fVar342 * 4.0 + fVar264 + auVar256._0_4_ * fVar263 * 12.0 + fVar179 * fVar263 * 6.0)
              * 0.16666667;
    fVar288 = (fVar353 * 4.0 + fVar288 + auVar256._4_4_ * fVar265 * 12.0 + fVar260 * fVar265 * 6.0)
              * 0.16666667;
    fVar304 = (fVar354 * 4.0 + fVar304 + auVar256._8_4_ * fVar282 * 12.0 + fVar219 * fVar282 * 6.0)
              * 0.16666667;
    fVar306 = (fVar356 * 4.0 + fVar306 + auVar256._12_4_ * fVar283 * 12.0 + fVar244 * fVar283 * 6.0)
              * 0.16666667;
    fVar309 = (fVar358 * 4.0 + fVar309 + auVar256._16_4_ * fVar284 * 12.0 + fVar221 * fVar284 * 6.0)
              * 0.16666667;
    fVar333 = (fVar360 * 4.0 + fVar333 + auVar256._20_4_ * fVar285 * 12.0 + fVar261 * fVar285 * 6.0)
              * 0.16666667;
    fVar337 = (fVar362 * 4.0 + fVar337 + auVar256._24_4_ * fVar287 * 12.0 + fVar174 * fVar287 * 6.0)
              * 0.16666667;
    fVar342 = fVar342 * 0.16666667;
    fVar353 = fVar353 * 0.16666667;
    fVar354 = fVar354 * 0.16666667;
    fVar356 = fVar356 * 0.16666667;
    fVar358 = fVar358 * 0.16666667;
    fVar360 = fVar360 * 0.16666667;
    fVar362 = fVar362 * 0.16666667;
    fVar446 = auVar439._28_4_ + 12.0;
    fVar424 = fVar423 + 12.166667;
    fVar365 = (float)local_1a0._0_4_ * fVar286 +
              (float)local_200._0_4_ * fVar364 +
              fVar342 * (float)local_440._0_4_ + fVar264 * (float)local_3c0._0_4_;
    fVar379 = (float)local_1a0._4_4_ * fVar303 +
              (float)local_200._4_4_ * fVar378 +
              fVar353 * (float)local_440._4_4_ + fVar288 * (float)local_3c0._4_4_;
    fVar384 = fStack_198 * fVar305 +
              fStack_1f8 * fVar383 + fVar354 * fStack_438 + fVar304 * fStack_3b8;
    fVar389 = fStack_194 * fVar307 +
              fStack_1f4 * fVar388 + fVar356 * fStack_434 + fVar306 * fStack_3b4;
    fVar394 = fStack_190 * fVar330 +
              fStack_1f0 * fVar393 + fVar358 * fStack_430 + fVar309 * fStack_3b0;
    fVar399 = fStack_18c * fVar334 +
              fStack_1ec * fVar398 + fVar360 * fStack_42c + fVar333 * fStack_3ac;
    fVar404 = fStack_188 * fVar338 +
              fStack_1e8 * fVar403 + fVar362 * fStack_428 + fVar337 * fStack_3a8;
    fVar409 = fVar408 + fVar424;
    fVar366 = (float)local_1c0._0_4_ * fVar286 +
              (float)local_220._0_4_ * fVar364 +
              fVar342 * (float)local_460._0_4_ + fVar264 * (float)local_3e0._0_4_;
    fVar380 = (float)local_1c0._4_4_ * fVar303 +
              (float)local_220._4_4_ * fVar378 +
              fVar353 * (float)local_460._4_4_ + fVar288 * (float)local_3e0._4_4_;
    fVar385 = fStack_1b8 * fVar305 +
              fStack_218 * fVar383 + fVar354 * fStack_458 + fVar304 * fStack_3d8;
    fVar390 = fStack_1b4 * fVar307 +
              fStack_214 * fVar388 + fVar356 * fStack_454 + fVar306 * fStack_3d4;
    fVar395 = fStack_1b0 * fVar330 +
              fStack_210 * fVar393 + fVar358 * fStack_450 + fVar309 * fStack_3d0;
    fVar400 = fStack_1ac * fVar334 +
              fStack_20c * fVar398 + fVar360 * fStack_44c + fVar333 * fStack_3cc;
    fVar405 = fStack_1a8 * fVar338 +
              fStack_208 * fVar403 + fVar362 * fStack_448 + fVar337 * fStack_3c8;
    fVar410 = fVar409 + fVar446 + 12.166667;
    fVar367 = (float)local_1e0._0_4_ * fVar286 +
              fVar364 * (float)local_240._0_4_ +
              fVar342 * (float)local_480._0_4_ + fVar264 * (float)local_400._0_4_;
    fVar381 = (float)local_1e0._4_4_ * fVar303 +
              fVar378 * (float)local_240._4_4_ +
              fVar353 * (float)local_480._4_4_ + fVar288 * (float)local_400._4_4_;
    fVar386 = fStack_1d8 * fVar305 +
              fVar383 * fStack_238 + fVar354 * fStack_478 + fVar304 * fStack_3f8;
    fVar391 = fStack_1d4 * fVar307 +
              fVar388 * fStack_234 + fVar356 * fStack_474 + fVar306 * fStack_3f4;
    fVar396 = fStack_1d0 * fVar330 +
              fVar393 * fStack_230 + fVar358 * fStack_470 + fVar309 * fStack_3f0;
    fVar401 = fStack_1cc * fVar334 +
              fVar398 * fStack_22c + fVar360 * fStack_46c + fVar333 * fStack_3ec;
    fVar406 = fStack_1c8 * fVar338 +
              fVar403 * fStack_228 + fVar362 * fStack_468 + fVar337 * fStack_3e8;
    fVar411 = fVar410 + fVar446 + auVar454._28_4_ + 12.0;
    local_860._0_4_ =
         fVar286 * (float)local_380._0_4_ +
         fVar364 * (float)local_3a0._0_4_ +
         fVar264 * (float)local_420._0_4_ + fVar342 * (float)local_4a0._0_4_;
    local_860._4_4_ =
         fVar303 * (float)local_380._4_4_ +
         fVar378 * (float)local_3a0._4_4_ +
         fVar288 * (float)local_420._4_4_ + fVar353 * (float)local_4a0._4_4_;
    local_860._8_4_ =
         fVar305 * fStack_378 + fVar383 * fStack_398 + fVar304 * fStack_418 + fVar354 * fStack_498;
    local_860._12_4_ =
         fVar307 * fStack_374 + fVar388 * fStack_394 + fVar306 * fStack_414 + fVar356 * fStack_494;
    local_860._16_4_ =
         fVar330 * fStack_370 + fVar393 * fStack_390 + fVar309 * fStack_410 + fVar358 * fStack_490;
    local_860._20_4_ =
         fVar334 * fStack_36c + fVar398 * fStack_38c + fVar333 * fStack_40c + fVar360 * fStack_48c;
    local_860._24_4_ =
         fVar338 * fStack_368 + fVar403 * fStack_388 + fVar337 * fStack_408 + fVar362 * fStack_488;
    local_860._28_4_ = auVar323._28_4_ + fVar408 + fVar423 + auVar352._28_4_;
    auVar47._4_4_ = auVar256._4_4_ * -auVar256._4_4_;
    auVar47._0_4_ = auVar256._0_4_ * -auVar256._0_4_;
    auVar47._8_4_ = auVar256._8_4_ * -auVar256._8_4_;
    auVar47._12_4_ = auVar256._12_4_ * -auVar256._12_4_;
    auVar47._16_4_ = auVar256._16_4_ * -auVar256._16_4_;
    auVar47._20_4_ = auVar256._20_4_ * -auVar256._20_4_;
    auVar47._24_4_ = auVar256._24_4_ * -auVar256._24_4_;
    auVar47._28_4_ = auVar256._28_4_;
    auVar48._4_4_ = fVar265 * 4.0;
    auVar48._0_4_ = fVar263 * 4.0;
    auVar48._8_4_ = fVar282 * 4.0;
    auVar48._12_4_ = fVar283 * 4.0;
    auVar48._16_4_ = fVar284 * 4.0;
    auVar48._20_4_ = fVar285 * 4.0;
    auVar48._24_4_ = fVar287 * 4.0;
    auVar48._28_4_ = 0x3f800000;
    auVar149 = vsubps_avx(auVar47,auVar48);
    fVar307 = fVar179 * -fVar179 * 0.5;
    fVar330 = fVar260 * -fVar260 * 0.5;
    fVar338 = fVar219 * -fVar219 * 0.5;
    fVar342 = fVar244 * -fVar244 * 0.5;
    fVar353 = fVar221 * -fVar221 * 0.5;
    fVar354 = fVar261 * -fVar261 * 0.5;
    fVar356 = fVar174 * -fVar174 * 0.5;
    fVar286 = auVar149._0_4_ * 0.5;
    fVar304 = auVar149._4_4_ * 0.5;
    fVar305 = auVar149._8_4_ * 0.5;
    fVar306 = auVar149._12_4_ * 0.5;
    fVar333 = auVar149._16_4_ * 0.5;
    fVar334 = auVar149._20_4_ * 0.5;
    fVar337 = auVar149._24_4_ * 0.5;
    fVar264 = (fVar179 * fVar179 + fVar263 * 4.0) * 0.5;
    fVar265 = (fVar260 * fVar260 + fVar265 * 4.0) * 0.5;
    fVar282 = (fVar219 * fVar219 + fVar282 * 4.0) * 0.5;
    fVar283 = (fVar244 * fVar244 + fVar283 * 4.0) * 0.5;
    fVar284 = (fVar221 * fVar221 + fVar284 * 4.0) * 0.5;
    fVar288 = (fVar261 * fVar261 + fVar285 * 4.0) * 0.5;
    fVar303 = (fVar174 * fVar174 + fVar287 * 4.0) * 0.5;
    fVar179 = auVar256._0_4_ * auVar256._0_4_ * 0.5;
    fVar260 = auVar256._4_4_ * auVar256._4_4_ * 0.5;
    fVar219 = auVar256._8_4_ * auVar256._8_4_ * 0.5;
    fVar244 = auVar256._12_4_ * auVar256._12_4_ * 0.5;
    fVar221 = auVar256._16_4_ * auVar256._16_4_ * 0.5;
    fVar261 = auVar256._20_4_ * auVar256._20_4_ * 0.5;
    fVar263 = auVar256._24_4_ * auVar256._24_4_ * 0.5;
    fVar341 = fVar411 + fVar424 + fVar424 + 4.0;
    auVar188 = vpermilps_avx(ZEXT416((uint)(fVar262 * 0.04761905)),0);
    fVar174 = auVar188._0_4_;
    fVar311 = fVar174 * ((float)local_1a0._0_4_ * fVar307 +
                        (float)local_200._0_4_ * fVar286 +
                        fVar264 * (float)local_3c0._0_4_ + fVar179 * (float)local_440._0_4_);
    fVar285 = auVar188._4_4_;
    fVar324 = fVar285 * ((float)local_1a0._4_4_ * fVar330 +
                        (float)local_200._4_4_ * fVar304 +
                        fVar265 * (float)local_3c0._4_4_ + fVar260 * (float)local_440._4_4_);
    local_9c0._4_4_ = fVar324;
    local_9c0._0_4_ = fVar311;
    fVar287 = auVar188._8_4_;
    fVar326 = fVar287 * (fStack_198 * fVar338 +
                        fStack_1f8 * fVar305 + fVar282 * fStack_3b8 + fVar219 * fStack_438);
    local_9c0._8_4_ = fVar326;
    fVar309 = auVar188._12_4_;
    fVar328 = fVar309 * (fStack_194 * fVar342 +
                        fStack_1f4 * fVar306 + fVar283 * fStack_3b4 + fVar244 * fStack_434);
    local_9c0._12_4_ = fVar328;
    fVar331 = fVar174 * (fStack_190 * fVar353 +
                        fStack_1f0 * fVar333 + fVar284 * fStack_3b0 + fVar221 * fStack_430);
    local_9c0._16_4_ = fVar331;
    fVar335 = fVar285 * (fStack_18c * fVar354 +
                        fStack_1ec * fVar334 + fVar288 * fStack_3ac + fVar261 * fStack_42c);
    local_9c0._20_4_ = fVar335;
    fVar339 = fVar287 * (fStack_188 * fVar356 +
                        fStack_1e8 * fVar337 + fVar303 * fStack_3a8 + fVar263 * fStack_428);
    local_9c0._24_4_ = fVar339;
    local_9c0._28_4_ = fVar341;
    fVar447 = fVar174 * ((float)local_1c0._0_4_ * fVar307 +
                        (float)local_220._0_4_ * fVar286 +
                        fVar264 * (float)local_3e0._0_4_ + fVar179 * (float)local_460._0_4_);
    fVar455 = fVar285 * ((float)local_1c0._4_4_ * fVar330 +
                        (float)local_220._4_4_ * fVar304 +
                        fVar265 * (float)local_3e0._4_4_ + fVar260 * (float)local_460._4_4_);
    auVar49._4_4_ = fVar455;
    auVar49._0_4_ = fVar447;
    fVar456 = fVar287 * (fStack_1b8 * fVar338 +
                        fStack_218 * fVar305 + fVar282 * fStack_3d8 + fVar219 * fStack_458);
    auVar49._8_4_ = fVar456;
    fVar457 = fVar309 * (fStack_1b4 * fVar342 +
                        fStack_214 * fVar306 + fVar283 * fStack_3d4 + fVar244 * fStack_454);
    auVar49._12_4_ = fVar457;
    fVar458 = fVar174 * (fStack_1b0 * fVar353 +
                        fStack_210 * fVar333 + fVar284 * fStack_3d0 + fVar221 * fStack_450);
    auVar49._16_4_ = fVar458;
    fVar459 = fVar285 * (fStack_1ac * fVar354 +
                        fStack_20c * fVar334 + fVar288 * fStack_3cc + fVar261 * fStack_44c);
    auVar49._20_4_ = fVar459;
    fVar460 = fVar287 * (fStack_1a8 * fVar356 +
                        fStack_208 * fVar337 + fVar303 * fStack_3c8 + fVar263 * fStack_448);
    auVar49._24_4_ = fVar460;
    auVar49._28_4_ = fStack_184;
    fVar461 = fVar174 * ((float)local_1e0._0_4_ * fVar307 +
                        fVar179 * (float)local_480._0_4_ + fVar264 * (float)local_400._0_4_ +
                        (float)local_240._0_4_ * fVar286);
    fVar470 = fVar285 * ((float)local_1e0._4_4_ * fVar330 +
                        fVar260 * (float)local_480._4_4_ + fVar265 * (float)local_400._4_4_ +
                        (float)local_240._4_4_ * fVar304);
    auVar50._4_4_ = fVar470;
    auVar50._0_4_ = fVar461;
    fVar473 = fVar287 * (fStack_1d8 * fVar338 +
                        fVar219 * fStack_478 + fVar282 * fStack_3f8 + fStack_238 * fVar305);
    auVar50._8_4_ = fVar473;
    fVar475 = fVar309 * (fStack_1d4 * fVar342 +
                        fVar244 * fStack_474 + fVar283 * fStack_3f4 + fStack_234 * fVar306);
    auVar50._12_4_ = fVar475;
    fVar477 = fVar174 * (fStack_1d0 * fVar353 +
                        fVar221 * fStack_470 + fVar284 * fStack_3f0 + fStack_230 * fVar333);
    auVar50._16_4_ = fVar477;
    fVar479 = fVar285 * (fStack_1cc * fVar354 +
                        fVar261 * fStack_46c + fVar288 * fStack_3ec + fStack_22c * fVar334);
    auVar50._20_4_ = fVar479;
    fVar481 = fVar287 * (fStack_1c8 * fVar356 +
                        fVar263 * fStack_468 + fVar303 * fStack_3e8 + fStack_228 * fVar337);
    auVar50._24_4_ = fVar481;
    auVar50._28_4_ = uStack_1a4;
    fVar262 = fVar174 * (fVar307 * (float)local_380._0_4_ +
                        fVar286 * (float)local_3a0._0_4_ +
                        fVar179 * (float)local_4a0._0_4_ + fVar264 * (float)local_420._0_4_);
    fVar286 = fVar285 * (fVar330 * (float)local_380._4_4_ +
                        fVar304 * (float)local_3a0._4_4_ +
                        fVar260 * (float)local_4a0._4_4_ + fVar265 * (float)local_420._4_4_);
    auVar51._4_4_ = fVar286;
    auVar51._0_4_ = fVar262;
    fVar307 = fVar287 * (fVar338 * fStack_378 +
                        fVar305 * fStack_398 + fVar219 * fStack_498 + fVar282 * fStack_418);
    auVar51._8_4_ = fVar307;
    fVar330 = fVar309 * (fVar342 * fStack_374 +
                        fVar306 * fStack_394 + fVar244 * fStack_494 + fVar283 * fStack_414);
    auVar51._12_4_ = fVar330;
    fVar174 = fVar174 * (fVar353 * fStack_370 +
                        fVar333 * fStack_390 + fVar221 * fStack_490 + fVar284 * fStack_410);
    auVar51._16_4_ = fVar174;
    fVar285 = fVar285 * (fVar354 * fStack_36c +
                        fVar334 * fStack_38c + fVar261 * fStack_48c + fVar288 * fStack_40c);
    auVar51._20_4_ = fVar285;
    fVar287 = fVar287 * (fVar356 * fStack_368 +
                        fVar337 * fStack_388 + fVar263 * fStack_488 + fVar303 * fStack_408);
    auVar51._24_4_ = fVar287;
    auVar51._28_4_ = fVar309;
    auVar109._4_4_ = fVar380;
    auVar109._0_4_ = fVar366;
    auVar109._8_4_ = fVar385;
    auVar109._12_4_ = fVar390;
    auVar109._16_4_ = fVar395;
    auVar109._20_4_ = fVar400;
    auVar109._24_4_ = fVar405;
    auVar109._28_4_ = fVar410;
    auVar149 = vperm2f128_avx(auVar109,auVar109,1);
    auVar149 = vshufps_avx(auVar149,auVar109,0x30);
    auVar33 = vshufps_avx(auVar109,auVar149,0x29);
    auVar111._4_4_ = fVar381;
    auVar111._0_4_ = fVar367;
    auVar111._8_4_ = fVar386;
    auVar111._12_4_ = fVar391;
    auVar111._16_4_ = fVar396;
    auVar111._20_4_ = fVar401;
    auVar111._24_4_ = fVar406;
    auVar111._28_4_ = fVar411;
    auVar149 = vperm2f128_avx(auVar111,auVar111,1);
    auVar149 = vshufps_avx(auVar149,auVar111,0x30);
    auVar420 = vshufps_avx(auVar111,auVar149,0x29);
    auVar164 = vsubps_avx(local_860,auVar51);
    auVar149 = vperm2f128_avx(auVar164,auVar164,1);
    auVar149 = vshufps_avx(auVar149,auVar164,0x30);
    auVar34 = vshufps_avx(auVar164,auVar149,0x29);
    auVar32 = vsubps_avx(auVar33,auVar109);
    auVar198 = vsubps_avx(auVar420,auVar111);
    fVar260 = auVar32._0_4_;
    fVar264 = auVar32._4_4_;
    auVar52._4_4_ = fVar470 * fVar264;
    auVar52._0_4_ = fVar461 * fVar260;
    fVar288 = auVar32._8_4_;
    auVar52._8_4_ = fVar473 * fVar288;
    fVar333 = auVar32._12_4_;
    auVar52._12_4_ = fVar475 * fVar333;
    fVar358 = auVar32._16_4_;
    auVar52._16_4_ = fVar477 * fVar358;
    fVar398 = auVar32._20_4_;
    auVar52._20_4_ = fVar479 * fVar398;
    fVar38 = auVar32._24_4_;
    auVar52._24_4_ = fVar481 * fVar38;
    auVar52._28_4_ = auVar164._28_4_;
    fVar219 = auVar198._0_4_;
    fVar265 = auVar198._4_4_;
    auVar53._4_4_ = fVar455 * fVar265;
    auVar53._0_4_ = fVar447 * fVar219;
    fVar303 = auVar198._8_4_;
    auVar53._8_4_ = fVar456 * fVar303;
    fVar334 = auVar198._12_4_;
    auVar53._12_4_ = fVar457 * fVar334;
    fVar360 = auVar198._16_4_;
    auVar53._16_4_ = fVar458 * fVar360;
    fVar403 = auVar198._20_4_;
    auVar53._20_4_ = fVar459 * fVar403;
    fVar39 = auVar198._24_4_;
    auVar53._24_4_ = fVar460 * fVar39;
    auVar53._28_4_ = auVar149._28_4_;
    auVar202 = vsubps_avx(auVar53,auVar52);
    auVar113._4_4_ = fVar379;
    auVar113._0_4_ = fVar365;
    auVar113._8_4_ = fVar384;
    auVar113._12_4_ = fVar389;
    auVar113._16_4_ = fVar394;
    auVar113._20_4_ = fVar399;
    auVar113._24_4_ = fVar404;
    auVar113._28_4_ = fVar409;
    auVar149 = vperm2f128_avx(auVar113,auVar113,1);
    auVar149 = vshufps_avx(auVar149,auVar113,0x30);
    local_a00 = vshufps_avx(auVar113,auVar149,0x29);
    auVar164 = vsubps_avx(local_a00,auVar113);
    auVar54._4_4_ = fVar265 * fVar324;
    auVar54._0_4_ = fVar219 * fVar311;
    auVar54._8_4_ = fVar303 * fVar326;
    auVar54._12_4_ = fVar334 * fVar328;
    auVar54._16_4_ = fVar360 * fVar331;
    auVar54._20_4_ = fVar403 * fVar335;
    auVar54._24_4_ = fVar39 * fVar339;
    auVar54._28_4_ = auVar149._28_4_;
    fVar244 = auVar164._0_4_;
    fVar282 = auVar164._4_4_;
    auVar55._4_4_ = fVar470 * fVar282;
    auVar55._0_4_ = fVar461 * fVar244;
    fVar304 = auVar164._8_4_;
    auVar55._8_4_ = fVar473 * fVar304;
    fVar337 = auVar164._12_4_;
    auVar55._12_4_ = fVar475 * fVar337;
    fVar362 = auVar164._16_4_;
    auVar55._16_4_ = fVar477 * fVar362;
    fVar408 = auVar164._20_4_;
    auVar55._20_4_ = fVar479 * fVar408;
    fVar40 = auVar164._24_4_;
    auVar55._24_4_ = fVar481 * fVar40;
    auVar55._28_4_ = auVar420._28_4_;
    auVar35 = vsubps_avx(auVar55,auVar54);
    auVar56._4_4_ = fVar455 * fVar282;
    auVar56._0_4_ = fVar447 * fVar244;
    auVar56._8_4_ = fVar456 * fVar304;
    auVar56._12_4_ = fVar457 * fVar337;
    auVar56._16_4_ = fVar458 * fVar362;
    auVar56._20_4_ = fVar459 * fVar408;
    auVar56._24_4_ = fVar460 * fVar40;
    auVar56._28_4_ = auVar420._28_4_;
    auVar57._4_4_ = fVar264 * fVar324;
    auVar57._0_4_ = fVar260 * fVar311;
    auVar57._8_4_ = fVar288 * fVar326;
    auVar57._12_4_ = fVar333 * fVar328;
    auVar57._16_4_ = fVar358 * fVar331;
    auVar57._20_4_ = fVar398 * fVar335;
    auVar57._24_4_ = fVar38 * fVar339;
    auVar57._28_4_ = uStack_1c4;
    auVar45 = vsubps_avx(auVar57,auVar56);
    fVar179 = auVar45._28_4_;
    auVar197._0_4_ = fVar244 * fVar244 + fVar260 * fVar260 + fVar219 * fVar219;
    auVar197._4_4_ = fVar282 * fVar282 + fVar264 * fVar264 + fVar265 * fVar265;
    auVar197._8_4_ = fVar304 * fVar304 + fVar288 * fVar288 + fVar303 * fVar303;
    auVar197._12_4_ = fVar337 * fVar337 + fVar333 * fVar333 + fVar334 * fVar334;
    auVar197._16_4_ = fVar362 * fVar362 + fVar358 * fVar358 + fVar360 * fVar360;
    auVar197._20_4_ = fVar408 * fVar408 + fVar398 * fVar398 + fVar403 * fVar403;
    auVar197._24_4_ = fVar40 * fVar40 + fVar38 * fVar38 + fVar39 * fVar39;
    auVar197._28_4_ = fVar179 + fVar179 + auVar202._28_4_;
    auVar149 = vrcpps_avx(auVar197);
    fVar353 = auVar149._0_4_;
    fVar354 = auVar149._4_4_;
    auVar58._4_4_ = fVar354 * auVar197._4_4_;
    auVar58._0_4_ = fVar353 * auVar197._0_4_;
    fVar356 = auVar149._8_4_;
    auVar58._8_4_ = fVar356 * auVar197._8_4_;
    fVar383 = auVar149._12_4_;
    auVar58._12_4_ = fVar383 * auVar197._12_4_;
    fVar388 = auVar149._16_4_;
    auVar58._16_4_ = fVar388 * auVar197._16_4_;
    fVar393 = auVar149._20_4_;
    auVar58._20_4_ = fVar393 * auVar197._20_4_;
    fVar446 = auVar149._24_4_;
    auVar58._24_4_ = fVar446 * auVar197._24_4_;
    auVar58._28_4_ = uStack_1c4;
    auVar237._8_4_ = 0x3f800000;
    auVar237._0_8_ = &DAT_3f8000003f800000;
    auVar237._12_4_ = 0x3f800000;
    auVar237._16_4_ = 0x3f800000;
    auVar237._20_4_ = 0x3f800000;
    auVar237._24_4_ = 0x3f800000;
    auVar237._28_4_ = 0x3f800000;
    auVar46 = vsubps_avx(auVar237,auVar58);
    fVar353 = auVar46._0_4_ * fVar353 + fVar353;
    fVar354 = auVar46._4_4_ * fVar354 + fVar354;
    fVar356 = auVar46._8_4_ * fVar356 + fVar356;
    fVar383 = auVar46._12_4_ * fVar383 + fVar383;
    fVar388 = auVar46._16_4_ * fVar388 + fVar388;
    fVar393 = auVar46._20_4_ * fVar393 + fVar393;
    fVar446 = auVar46._24_4_ * fVar446 + fVar446;
    auVar32 = vperm2f128_avx(auVar49,auVar49,1);
    auVar32 = vshufps_avx(auVar32,auVar49,0x30);
    auVar32 = vshufps_avx(auVar49,auVar32,0x29);
    auVar198 = vperm2f128_avx(auVar50,auVar50,1);
    auVar198 = vshufps_avx(auVar198,auVar50,0x30);
    local_a40 = vshufps_avx(auVar50,auVar198,0x29);
    fVar462 = local_a40._0_4_;
    fVar471 = local_a40._4_4_;
    auVar59._4_4_ = fVar471 * fVar264;
    auVar59._0_4_ = fVar462 * fVar260;
    fVar474 = local_a40._8_4_;
    auVar59._8_4_ = fVar474 * fVar288;
    fVar476 = local_a40._12_4_;
    auVar59._12_4_ = fVar476 * fVar333;
    fVar478 = local_a40._16_4_;
    auVar59._16_4_ = fVar478 * fVar358;
    fVar480 = local_a40._20_4_;
    auVar59._20_4_ = fVar480 * fVar398;
    fVar482 = local_a40._24_4_;
    auVar59._24_4_ = fVar482 * fVar38;
    auVar59._28_4_ = auVar198._28_4_;
    fVar221 = auVar32._0_4_;
    fVar283 = auVar32._4_4_;
    auVar60._4_4_ = fVar265 * fVar283;
    auVar60._0_4_ = fVar219 * fVar221;
    fVar305 = auVar32._8_4_;
    auVar60._8_4_ = fVar303 * fVar305;
    fVar338 = auVar32._12_4_;
    auVar60._12_4_ = fVar334 * fVar338;
    fVar364 = auVar32._16_4_;
    auVar60._16_4_ = fVar360 * fVar364;
    fVar423 = auVar32._20_4_;
    auVar60._20_4_ = fVar403 * fVar423;
    fVar41 = auVar32._24_4_;
    auVar60._24_4_ = fVar39 * fVar41;
    auVar60._28_4_ = fStack_184;
    auVar198 = vsubps_avx(auVar60,auVar59);
    auVar32 = vperm2f128_avx(local_9c0,local_9c0,1);
    auVar32 = vshufps_avx(auVar32,local_9c0,0x30);
    local_a20 = vshufps_avx(local_9c0,auVar32,0x29);
    fVar261 = local_a20._0_4_;
    fVar284 = local_a20._4_4_;
    auVar61._4_4_ = fVar265 * fVar284;
    auVar61._0_4_ = fVar219 * fVar261;
    fVar306 = local_a20._8_4_;
    auVar61._8_4_ = fVar303 * fVar306;
    fVar342 = local_a20._12_4_;
    auVar61._12_4_ = fVar334 * fVar342;
    fVar378 = local_a20._16_4_;
    auVar61._16_4_ = fVar360 * fVar378;
    fVar424 = local_a20._20_4_;
    auVar61._20_4_ = fVar403 * fVar424;
    fVar42 = local_a20._24_4_;
    auVar61._24_4_ = fVar39 * fVar42;
    auVar61._28_4_ = auVar32._28_4_;
    auVar62._4_4_ = fVar471 * fVar282;
    auVar62._0_4_ = fVar462 * fVar244;
    auVar62._8_4_ = fVar474 * fVar304;
    auVar62._12_4_ = fVar476 * fVar337;
    auVar62._16_4_ = fVar478 * fVar362;
    auVar62._20_4_ = fVar480 * fVar408;
    uVar128 = local_a40._28_4_;
    auVar62._24_4_ = fVar482 * fVar40;
    auVar62._28_4_ = uVar128;
    auVar150 = vsubps_avx(auVar62,auVar61);
    auVar63._4_4_ = fVar282 * fVar283;
    auVar63._0_4_ = fVar244 * fVar221;
    auVar63._8_4_ = fVar304 * fVar305;
    auVar63._12_4_ = fVar337 * fVar338;
    auVar63._16_4_ = fVar362 * fVar364;
    auVar63._20_4_ = fVar408 * fVar423;
    auVar63._24_4_ = fVar40 * fVar41;
    auVar63._28_4_ = uVar128;
    auVar64._4_4_ = fVar264 * fVar284;
    auVar64._0_4_ = fVar260 * fVar261;
    auVar64._8_4_ = fVar288 * fVar306;
    auVar64._12_4_ = fVar333 * fVar342;
    auVar64._16_4_ = fVar358 * fVar378;
    auVar64._20_4_ = fVar398 * fVar424;
    auVar64._24_4_ = fVar38 * fVar42;
    auVar64._28_4_ = fStack_1e4;
    auVar32 = vsubps_avx(auVar64,auVar63);
    fVar263 = auVar32._28_4_;
    auVar65._4_4_ =
         (auVar202._4_4_ * auVar202._4_4_ +
         auVar35._4_4_ * auVar35._4_4_ + auVar45._4_4_ * auVar45._4_4_) * fVar354;
    auVar65._0_4_ =
         (auVar202._0_4_ * auVar202._0_4_ +
         auVar35._0_4_ * auVar35._0_4_ + auVar45._0_4_ * auVar45._0_4_) * fVar353;
    auVar65._8_4_ =
         (auVar202._8_4_ * auVar202._8_4_ +
         auVar35._8_4_ * auVar35._8_4_ + auVar45._8_4_ * auVar45._8_4_) * fVar356;
    auVar65._12_4_ =
         (auVar202._12_4_ * auVar202._12_4_ +
         auVar35._12_4_ * auVar35._12_4_ + auVar45._12_4_ * auVar45._12_4_) * fVar383;
    auVar65._16_4_ =
         (auVar202._16_4_ * auVar202._16_4_ +
         auVar35._16_4_ * auVar35._16_4_ + auVar45._16_4_ * auVar45._16_4_) * fVar388;
    auVar65._20_4_ =
         (auVar202._20_4_ * auVar202._20_4_ +
         auVar35._20_4_ * auVar35._20_4_ + auVar45._20_4_ * auVar45._20_4_) * fVar393;
    auVar65._24_4_ =
         (auVar202._24_4_ * auVar202._24_4_ +
         auVar35._24_4_ * auVar35._24_4_ + auVar45._24_4_ * auVar45._24_4_) * fVar446;
    auVar65._28_4_ = auVar202._28_4_ + auVar35._28_4_ + fVar179;
    auVar66._4_4_ =
         (auVar198._4_4_ * auVar198._4_4_ +
         auVar150._4_4_ * auVar150._4_4_ + auVar32._4_4_ * auVar32._4_4_) * fVar354;
    auVar66._0_4_ =
         (auVar198._0_4_ * auVar198._0_4_ +
         auVar150._0_4_ * auVar150._0_4_ + auVar32._0_4_ * auVar32._0_4_) * fVar353;
    auVar66._8_4_ =
         (auVar198._8_4_ * auVar198._8_4_ +
         auVar150._8_4_ * auVar150._8_4_ + auVar32._8_4_ * auVar32._8_4_) * fVar356;
    auVar66._12_4_ =
         (auVar198._12_4_ * auVar198._12_4_ +
         auVar150._12_4_ * auVar150._12_4_ + auVar32._12_4_ * auVar32._12_4_) * fVar383;
    auVar66._16_4_ =
         (auVar198._16_4_ * auVar198._16_4_ +
         auVar150._16_4_ * auVar150._16_4_ + auVar32._16_4_ * auVar32._16_4_) * fVar388;
    auVar66._20_4_ =
         (auVar198._20_4_ * auVar198._20_4_ +
         auVar150._20_4_ * auVar150._20_4_ + auVar32._20_4_ * auVar32._20_4_) * fVar393;
    auVar66._24_4_ =
         (auVar198._24_4_ * auVar198._24_4_ +
         auVar150._24_4_ * auVar150._24_4_ + auVar32._24_4_ * auVar32._24_4_) * fVar446;
    auVar66._28_4_ = auVar46._28_4_ + auVar149._28_4_;
    auVar149 = vmaxps_avx(auVar65,auVar66);
    auVar32 = vperm2f128_avx(local_860,local_860,1);
    auVar32 = vshufps_avx(auVar32,local_860,0x30);
    auVar202 = vshufps_avx(local_860,auVar32,0x29);
    auVar154._0_4_ = (float)local_860._0_4_ + fVar262;
    auVar154._4_4_ = local_860._4_4_ + fVar286;
    auVar154._8_4_ = local_860._8_4_ + fVar307;
    auVar154._12_4_ = local_860._12_4_ + fVar330;
    auVar154._16_4_ = local_860._16_4_ + fVar174;
    auVar154._20_4_ = local_860._20_4_ + fVar285;
    auVar154._24_4_ = local_860._24_4_ + fVar287;
    auVar154._28_4_ = local_860._28_4_ + fVar309;
    auVar32 = vmaxps_avx(local_860,auVar154);
    auVar198 = vmaxps_avx(auVar34,auVar202);
    auVar32 = vmaxps_avx(auVar32,auVar198);
    auVar198 = vrsqrtps_avx(auVar197);
    fVar179 = auVar198._0_4_;
    fVar174 = auVar198._4_4_;
    fVar262 = auVar198._8_4_;
    fVar285 = auVar198._12_4_;
    fVar286 = auVar198._16_4_;
    fVar287 = auVar198._20_4_;
    fVar307 = auVar198._24_4_;
    auVar67._4_4_ = fVar174 * fVar174 * fVar174 * auVar197._4_4_ * 0.5;
    auVar67._0_4_ = fVar179 * fVar179 * fVar179 * auVar197._0_4_ * 0.5;
    auVar67._8_4_ = fVar262 * fVar262 * fVar262 * auVar197._8_4_ * 0.5;
    auVar67._12_4_ = fVar285 * fVar285 * fVar285 * auVar197._12_4_ * 0.5;
    auVar67._16_4_ = fVar286 * fVar286 * fVar286 * auVar197._16_4_ * 0.5;
    auVar67._20_4_ = fVar287 * fVar287 * fVar287 * auVar197._20_4_ * 0.5;
    auVar67._24_4_ = fVar307 * fVar307 * fVar307 * auVar197._24_4_ * 0.5;
    auVar67._28_4_ = auVar197._28_4_;
    auVar68._4_4_ = fVar174 * 1.5;
    auVar68._0_4_ = fVar179 * 1.5;
    auVar68._8_4_ = fVar262 * 1.5;
    auVar68._12_4_ = fVar285 * 1.5;
    auVar68._16_4_ = fVar286 * 1.5;
    auVar68._20_4_ = fVar287 * 1.5;
    auVar68._24_4_ = fVar307 * 1.5;
    auVar68._28_4_ = auVar198._28_4_;
    auVar35 = vsubps_avx(auVar68,auVar67);
    auVar110._4_4_ = fVar380;
    auVar110._0_4_ = fVar366;
    auVar110._8_4_ = fVar385;
    auVar110._12_4_ = fVar390;
    auVar110._16_4_ = fVar395;
    auVar110._20_4_ = fVar400;
    auVar110._24_4_ = fVar405;
    auVar110._28_4_ = fVar410;
    auVar198 = ZEXT1232(ZEXT412(0)) << 0x20;
    local_800 = vsubps_avx(auVar198,auVar110);
    auVar112._4_4_ = fVar381;
    auVar112._0_4_ = fVar367;
    auVar112._8_4_ = fVar386;
    auVar112._12_4_ = fVar391;
    auVar112._16_4_ = fVar396;
    auVar112._20_4_ = fVar401;
    auVar112._24_4_ = fVar406;
    auVar112._28_4_ = fVar411;
    auVar45 = vsubps_avx(auVar198,auVar112);
    fVar174 = auVar45._0_4_;
    fVar285 = auVar45._4_4_;
    fVar307 = auVar45._8_4_;
    fVar353 = auVar45._12_4_;
    fVar383 = auVar45._16_4_;
    fVar446 = auVar45._20_4_;
    fVar43 = auVar45._24_4_;
    fVar262 = local_800._0_4_;
    fVar286 = local_800._4_4_;
    fVar309 = local_800._8_4_;
    fVar354 = local_800._12_4_;
    fVar388 = local_800._16_4_;
    fVar37 = local_800._20_4_;
    fVar44 = local_800._24_4_;
    auVar199 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar198 = vsubps_avx(auVar199,auVar113);
    auVar439 = ZEXT3264(auVar198);
    fVar432 = auVar198._0_4_;
    fVar440 = auVar198._4_4_;
    fVar441 = auVar198._8_4_;
    fVar442 = auVar198._12_4_;
    fVar443 = auVar198._16_4_;
    fVar444 = auVar198._20_4_;
    fVar445 = auVar198._24_4_;
    auVar452._0_4_ =
         fVar432 * (float)local_880._0_4_ +
         (float)local_8a0._0_4_ * fVar262 + (float)local_8c0._0_4_ * fVar174;
    auVar452._4_4_ =
         fVar440 * (float)local_880._4_4_ +
         (float)local_8a0._4_4_ * fVar286 + (float)local_8c0._4_4_ * fVar285;
    auVar452._8_4_ = fVar441 * fStack_878 + fStack_898 * fVar309 + fStack_8b8 * fVar307;
    auVar452._12_4_ = fVar442 * fStack_874 + fStack_894 * fVar354 + fStack_8b4 * fVar353;
    auVar452._16_4_ = fVar443 * fStack_870 + fStack_890 * fVar388 + fStack_8b0 * fVar383;
    auVar452._20_4_ = fVar444 * fStack_86c + fStack_88c * fVar37 + fStack_8ac * fVar446;
    auVar452._24_4_ = fVar445 * fStack_868 + fStack_888 * fVar44 + fStack_8a8 * fVar43;
    auVar452._28_4_ = fVar263 + fVar263 + auVar150._28_4_ + fVar263;
    auVar466._0_4_ = fVar432 * fVar432 + fVar262 * fVar262 + fVar174 * fVar174;
    auVar466._4_4_ = fVar440 * fVar440 + fVar286 * fVar286 + fVar285 * fVar285;
    auVar466._8_4_ = fVar441 * fVar441 + fVar309 * fVar309 + fVar307 * fVar307;
    auVar466._12_4_ = fVar442 * fVar442 + fVar354 * fVar354 + fVar353 * fVar353;
    auVar466._16_4_ = fVar443 * fVar443 + fVar388 * fVar388 + fVar383 * fVar383;
    auVar466._20_4_ = fVar444 * fVar444 + fVar37 * fVar37 + fVar446 * fVar446;
    auVar466._24_4_ = fVar445 * fVar445 + fVar44 * fVar44 + fVar43 * fVar43;
    auVar466._28_4_ = fStack_1e4 + fStack_1e4 + fVar263;
    fVar263 = auVar35._0_4_;
    fVar287 = auVar35._4_4_;
    fVar330 = auVar35._8_4_;
    fVar356 = auVar35._12_4_;
    fVar393 = auVar35._16_4_;
    fVar308 = auVar35._20_4_;
    fVar310 = auVar35._24_4_;
    fVar368 = (float)local_880._0_4_ * fVar244 * fVar263 +
              fVar260 * fVar263 * (float)local_8a0._0_4_ +
              fVar219 * fVar263 * (float)local_8c0._0_4_;
    fVar382 = (float)local_880._4_4_ * fVar282 * fVar287 +
              fVar264 * fVar287 * (float)local_8a0._4_4_ +
              fVar265 * fVar287 * (float)local_8c0._4_4_;
    fVar387 = fStack_878 * fVar304 * fVar330 +
              fVar288 * fVar330 * fStack_898 + fVar303 * fVar330 * fStack_8b8;
    fVar392 = fStack_874 * fVar337 * fVar356 +
              fVar333 * fVar356 * fStack_894 + fVar334 * fVar356 * fStack_8b4;
    fVar397 = fStack_870 * fVar362 * fVar393 +
              fVar358 * fVar393 * fStack_890 + fVar360 * fVar393 * fStack_8b0;
    fVar402 = fStack_86c * fVar408 * fVar308 +
              fVar398 * fVar308 * fStack_88c + fVar403 * fVar308 * fStack_8ac;
    fVar407 = fStack_868 * fVar40 * fVar310 +
              fVar38 * fVar310 * fStack_888 + fVar39 * fVar310 * fStack_8a8;
    fVar179 = fStack_864 + fStack_884 + fStack_8a4;
    local_540._0_4_ =
         fVar432 * fVar244 * fVar263 + fVar260 * fVar263 * fVar262 + fVar219 * fVar263 * fVar174;
    local_540._4_4_ =
         fVar440 * fVar282 * fVar287 + fVar264 * fVar287 * fVar286 + fVar265 * fVar287 * fVar285;
    local_540._8_4_ =
         fVar441 * fVar304 * fVar330 + fVar288 * fVar330 * fVar309 + fVar303 * fVar330 * fVar307;
    local_540._12_4_ =
         fVar442 * fVar337 * fVar356 + fVar333 * fVar356 * fVar354 + fVar334 * fVar356 * fVar353;
    local_540._16_4_ =
         fVar443 * fVar362 * fVar393 + fVar358 * fVar393 * fVar388 + fVar360 * fVar393 * fVar383;
    local_540._20_4_ =
         fVar444 * fVar408 * fVar308 + fVar398 * fVar308 * fVar37 + fVar403 * fVar308 * fVar446;
    local_540._24_4_ =
         fVar445 * fVar40 * fVar310 + fVar38 * fVar310 * fVar44 + fVar39 * fVar310 * fVar43;
    local_540._28_4_ = fStack_884 + fVar179;
    auVar431 = ZEXT3264(local_540);
    auVar69._4_4_ = fVar382 * local_540._4_4_;
    auVar69._0_4_ = fVar368 * local_540._0_4_;
    auVar69._8_4_ = fVar387 * local_540._8_4_;
    auVar69._12_4_ = fVar392 * local_540._12_4_;
    auVar69._16_4_ = fVar397 * local_540._16_4_;
    auVar69._20_4_ = fVar402 * local_540._20_4_;
    auVar69._24_4_ = fVar407 * local_540._24_4_;
    auVar69._28_4_ = fVar179;
    auVar46 = vsubps_avx(auVar452,auVar69);
    auVar70._4_4_ = local_540._4_4_ * local_540._4_4_;
    auVar70._0_4_ = local_540._0_4_ * local_540._0_4_;
    auVar70._8_4_ = local_540._8_4_ * local_540._8_4_;
    auVar70._12_4_ = local_540._12_4_ * local_540._12_4_;
    auVar70._16_4_ = local_540._16_4_ * local_540._16_4_;
    auVar70._20_4_ = local_540._20_4_ * local_540._20_4_;
    auVar70._24_4_ = local_540._24_4_ * local_540._24_4_;
    auVar70._28_4_ = fStack_884;
    auVar150 = vsubps_avx(auVar466,auVar70);
    auVar198 = vsqrtps_avx(auVar149);
    local_ba0 = auVar32._0_4_;
    fStack_b9c = auVar32._4_4_;
    fStack_b98 = auVar32._8_4_;
    fStack_b94 = auVar32._12_4_;
    fStack_b90 = auVar32._16_4_;
    fStack_b8c = auVar32._20_4_;
    fStack_b88 = auVar32._24_4_;
    fStack_b84 = auVar32._28_4_;
    fVar179 = (auVar198._0_4_ + local_ba0) * 1.0000002;
    fVar169 = (auVar198._4_4_ + fStack_b9c) * 1.0000002;
    fVar171 = (auVar198._8_4_ + fStack_b98) * 1.0000002;
    fVar173 = (auVar198._12_4_ + fStack_b94) * 1.0000002;
    fVar175 = (auVar198._16_4_ + fStack_b90) * 1.0000002;
    fVar176 = (auVar198._20_4_ + fStack_b8c) * 1.0000002;
    fVar177 = (auVar198._24_4_ + fStack_b88) * 1.0000002;
    auVar71._4_4_ = fVar169 * fVar169;
    auVar71._0_4_ = fVar179 * fVar179;
    auVar71._8_4_ = fVar171 * fVar171;
    auVar71._12_4_ = fVar173 * fVar173;
    auVar71._16_4_ = fVar175 * fVar175;
    auVar71._20_4_ = fVar176 * fVar176;
    auVar71._24_4_ = fVar177 * fVar177;
    auVar71._28_4_ = auVar198._28_4_ + fStack_b84;
    fVar463 = auVar46._0_4_ + auVar46._0_4_;
    fVar472 = auVar46._4_4_ + auVar46._4_4_;
    auVar467._0_8_ = CONCAT44(fVar472,fVar463);
    auVar467._8_4_ = auVar46._8_4_ + auVar46._8_4_;
    auVar467._12_4_ = auVar46._12_4_ + auVar46._12_4_;
    auVar467._16_4_ = auVar46._16_4_ + auVar46._16_4_;
    auVar467._20_4_ = auVar46._20_4_ + auVar46._20_4_;
    auVar467._24_4_ = auVar46._24_4_ + auVar46._24_4_;
    fVar179 = auVar46._28_4_;
    auVar467._28_4_ = fVar179 + fVar179;
    auVar32 = vsubps_avx(auVar150,auVar71);
    local_2e0._4_4_ = fVar382 * fVar382;
    local_2e0._0_4_ = fVar368 * fVar368;
    local_2e0._8_4_ = fVar387 * fVar387;
    local_2e0._12_4_ = fVar392 * fVar392;
    local_2e0._16_4_ = fVar397 * fVar397;
    local_2e0._20_4_ = fVar402 * fVar402;
    local_2e0._24_4_ = fVar407 * fVar407;
    local_2e0._28_4_ = auVar164._28_4_;
    auVar46 = vsubps_avx(local_260,local_2e0);
    auVar421 = ZEXT3264(auVar46);
    auVar72._4_4_ = fVar472 * fVar472;
    auVar72._0_4_ = fVar463 * fVar463;
    auVar72._8_4_ = auVar467._8_4_ * auVar467._8_4_;
    auVar72._12_4_ = auVar467._12_4_ * auVar467._12_4_;
    auVar72._16_4_ = auVar467._16_4_ * auVar467._16_4_;
    auVar72._20_4_ = auVar467._20_4_ * auVar467._20_4_;
    auVar72._24_4_ = auVar467._24_4_ * auVar467._24_4_;
    auVar72._28_4_ = fVar179;
    fVar169 = auVar46._0_4_;
    fVar171 = auVar46._4_4_;
    fVar173 = auVar46._8_4_;
    fVar175 = auVar46._12_4_;
    fVar176 = auVar46._16_4_;
    fVar177 = auVar46._20_4_;
    fVar422 = auVar46._24_4_;
    auVar73._4_4_ = fVar171 * 4.0 * auVar32._4_4_;
    auVar73._0_4_ = fVar169 * 4.0 * auVar32._0_4_;
    auVar73._8_4_ = fVar173 * 4.0 * auVar32._8_4_;
    auVar73._12_4_ = fVar175 * 4.0 * auVar32._12_4_;
    auVar73._16_4_ = fVar176 * 4.0 * auVar32._16_4_;
    auVar73._20_4_ = fVar177 * 4.0 * auVar32._20_4_;
    auVar73._24_4_ = fVar422 * 4.0 * auVar32._24_4_;
    auVar73._28_4_ = 0x40800000;
    auVar151 = vsubps_avx(auVar72,auVar73);
    auVar454 = ZEXT3264(auVar151);
    auVar149 = vcmpps_avx(auVar151,auVar199,5);
    fVar179 = auVar46._28_4_;
    if ((((((((auVar149 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar149 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar149 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar149 >> 0x7f,0) == '\0') &&
          (auVar149 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar149 >> 0xbf,0) == '\0') &&
        (auVar149 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar149[0x1f])
    {
      auVar200._8_4_ = 0x7f800000;
      auVar200._0_8_ = 0x7f8000007f800000;
      auVar200._12_4_ = 0x7f800000;
      auVar200._16_4_ = 0x7f800000;
      auVar200._20_4_ = 0x7f800000;
      auVar200._24_4_ = 0x7f800000;
      auVar200._28_4_ = 0x7f800000;
      auVar484._8_4_ = 0xff800000;
      auVar484._0_8_ = 0xff800000ff800000;
      auVar484._12_4_ = 0xff800000;
      auVar484._16_4_ = 0xff800000;
      auVar484._20_4_ = 0xff800000;
      auVar484._24_4_ = 0xff800000;
      auVar484._28_4_ = 0xff800000;
    }
    else {
      auVar196 = vsqrtps_avx(auVar151);
      auVar317._0_4_ = fVar169 + fVar169;
      auVar317._4_4_ = fVar171 + fVar171;
      auVar317._8_4_ = fVar173 + fVar173;
      auVar317._12_4_ = fVar175 + fVar175;
      auVar317._16_4_ = fVar176 + fVar176;
      auVar317._20_4_ = fVar177 + fVar177;
      auVar317._24_4_ = fVar422 + fVar422;
      auVar317._28_4_ = fVar179 + fVar179;
      auVar195 = vrcpps_avx(auVar317);
      auVar199 = vcmpps_avx(auVar151,auVar199,5);
      auVar454 = ZEXT3264(auVar199);
      fVar312 = auVar195._0_4_;
      fVar325 = auVar195._4_4_;
      auVar74._4_4_ = auVar317._4_4_ * fVar325;
      auVar74._0_4_ = auVar317._0_4_ * fVar312;
      fVar327 = auVar195._8_4_;
      auVar74._8_4_ = auVar317._8_4_ * fVar327;
      fVar329 = auVar195._12_4_;
      auVar74._12_4_ = auVar317._12_4_ * fVar329;
      fVar332 = auVar195._16_4_;
      auVar74._16_4_ = auVar317._16_4_ * fVar332;
      fVar336 = auVar195._20_4_;
      auVar74._20_4_ = auVar317._20_4_ * fVar336;
      fVar340 = auVar195._24_4_;
      auVar74._24_4_ = auVar317._24_4_ * fVar340;
      auVar74._28_4_ = auVar317._28_4_;
      auVar201._8_4_ = 0x3f800000;
      auVar201._0_8_ = &DAT_3f8000003f800000;
      auVar201._12_4_ = 0x3f800000;
      auVar201._16_4_ = 0x3f800000;
      auVar201._20_4_ = 0x3f800000;
      auVar201._24_4_ = 0x3f800000;
      auVar201._28_4_ = 0x3f800000;
      auVar151 = vsubps_avx(auVar201,auVar74);
      fVar312 = fVar312 + fVar312 * auVar151._0_4_;
      fVar325 = fVar325 + fVar325 * auVar151._4_4_;
      fVar327 = fVar327 + fVar327 * auVar151._8_4_;
      fVar329 = fVar329 + fVar329 * auVar151._12_4_;
      fVar332 = fVar332 + fVar332 * auVar151._16_4_;
      fVar336 = fVar336 + fVar336 * auVar151._20_4_;
      fVar340 = fVar340 + fVar340 * auVar151._24_4_;
      auVar348._0_8_ = CONCAT44(fVar472,fVar463) ^ 0x8000000080000000;
      auVar348._8_4_ = -auVar467._8_4_;
      auVar348._12_4_ = -auVar467._12_4_;
      auVar348._16_4_ = -auVar467._16_4_;
      auVar348._20_4_ = -auVar467._20_4_;
      auVar348._24_4_ = -auVar467._24_4_;
      auVar348._28_4_ = -auVar467._28_4_;
      auVar234 = vsubps_avx(auVar348,auVar196);
      fVar463 = auVar234._0_4_ * fVar312;
      fVar472 = auVar234._4_4_ * fVar325;
      auVar75._4_4_ = fVar472;
      auVar75._0_4_ = fVar463;
      fVar355 = auVar234._8_4_ * fVar327;
      auVar75._8_4_ = fVar355;
      fVar357 = auVar234._12_4_ * fVar329;
      auVar75._12_4_ = fVar357;
      fVar359 = auVar234._16_4_ * fVar332;
      auVar75._16_4_ = fVar359;
      fVar361 = auVar234._20_4_ * fVar336;
      auVar75._20_4_ = fVar361;
      fVar363 = auVar234._24_4_ * fVar340;
      auVar75._24_4_ = fVar363;
      auVar75._28_4_ = auVar234._28_4_;
      auVar196 = vsubps_avx(auVar196,auVar467);
      fVar312 = auVar196._0_4_ * fVar312;
      fVar325 = auVar196._4_4_ * fVar325;
      auVar76._4_4_ = fVar325;
      auVar76._0_4_ = fVar312;
      fVar327 = auVar196._8_4_ * fVar327;
      auVar76._8_4_ = fVar327;
      fVar329 = auVar196._12_4_ * fVar329;
      auVar76._12_4_ = fVar329;
      fVar332 = auVar196._16_4_ * fVar332;
      auVar76._16_4_ = fVar332;
      fVar336 = auVar196._20_4_ * fVar336;
      auVar76._20_4_ = fVar336;
      fVar340 = auVar196._24_4_ * fVar340;
      auVar76._24_4_ = fVar340;
      auVar76._28_4_ = auVar196._28_4_;
      fStack_664 = local_540._28_4_ + auVar195._28_4_ + auVar151._28_4_;
      local_680[0] = fVar263 * (local_540._0_4_ + fVar368 * fVar463);
      local_680[1] = fVar287 * (local_540._4_4_ + fVar382 * fVar472);
      local_680[2] = fVar330 * (local_540._8_4_ + fVar387 * fVar355);
      local_680[3] = fVar356 * (local_540._12_4_ + fVar392 * fVar357);
      fStack_670 = fVar393 * (local_540._16_4_ + fVar397 * fVar359);
      fStack_66c = fVar308 * (local_540._20_4_ + fVar402 * fVar361);
      fStack_668 = fVar310 * (local_540._24_4_ + fVar407 * fVar363);
      local_6a0[0] = fVar263 * (local_540._0_4_ + fVar368 * fVar312);
      local_6a0[1] = fVar287 * (local_540._4_4_ + fVar382 * fVar325);
      local_6a0[2] = fVar330 * (local_540._8_4_ + fVar387 * fVar327);
      local_6a0[3] = fVar356 * (local_540._12_4_ + fVar392 * fVar329);
      fStack_690 = fVar393 * (local_540._16_4_ + fVar397 * fVar332);
      fStack_68c = fVar308 * (local_540._20_4_ + fVar402 * fVar336);
      fStack_688 = fVar310 * (local_540._24_4_ + fVar407 * fVar340);
      fStack_684 = local_540._28_4_ + fStack_664;
      auVar318._8_4_ = 0x7f800000;
      auVar318._0_8_ = 0x7f8000007f800000;
      auVar318._12_4_ = 0x7f800000;
      auVar318._16_4_ = 0x7f800000;
      auVar318._20_4_ = 0x7f800000;
      auVar318._24_4_ = 0x7f800000;
      auVar318._28_4_ = 0x7f800000;
      auVar200 = vblendvps_avx(auVar318,auVar75,auVar199);
      auVar349._8_4_ = 0x7fffffff;
      auVar349._0_8_ = 0x7fffffff7fffffff;
      auVar349._12_4_ = 0x7fffffff;
      auVar349._16_4_ = 0x7fffffff;
      auVar349._20_4_ = 0x7fffffff;
      auVar349._24_4_ = 0x7fffffff;
      auVar349._28_4_ = 0x7fffffff;
      auVar151 = vandps_avx(local_2e0,auVar349);
      auVar151 = vmaxps_avx(local_4c0,auVar151);
      auVar77._4_4_ = auVar151._4_4_ * 1.9073486e-06;
      auVar77._0_4_ = auVar151._0_4_ * 1.9073486e-06;
      auVar77._8_4_ = auVar151._8_4_ * 1.9073486e-06;
      auVar77._12_4_ = auVar151._12_4_ * 1.9073486e-06;
      auVar77._16_4_ = auVar151._16_4_ * 1.9073486e-06;
      auVar77._20_4_ = auVar151._20_4_ * 1.9073486e-06;
      auVar77._24_4_ = auVar151._24_4_ * 1.9073486e-06;
      auVar77._28_4_ = auVar151._28_4_;
      auVar151 = vandps_avx(auVar46,auVar349);
      auVar151 = vcmpps_avx(auVar151,auVar77,1);
      auVar319._8_4_ = 0xff800000;
      auVar319._0_8_ = 0xff800000ff800000;
      auVar319._12_4_ = 0xff800000;
      auVar319._16_4_ = 0xff800000;
      auVar319._20_4_ = 0xff800000;
      auVar319._24_4_ = 0xff800000;
      auVar319._28_4_ = 0xff800000;
      auVar484 = vblendvps_avx(auVar319,auVar76,auVar199);
      auVar195 = auVar199 & auVar151;
      if ((((((((auVar195 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar195 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar195 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar195 >> 0x7f,0) != '\0') ||
            (auVar195 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar195 >> 0xbf,0) != '\0') ||
          (auVar195 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar195[0x1f] < '\0') {
        auVar149 = vandps_avx(auVar151,auVar199);
        auVar188 = vpackssdw_avx(auVar149._0_16_,auVar149._16_16_);
        auVar151 = vcmpps_avx(auVar32,ZEXT832(0) << 0x20,2);
        auVar376._8_4_ = 0xff800000;
        auVar376._0_8_ = 0xff800000ff800000;
        auVar376._12_4_ = 0xff800000;
        auVar376._16_4_ = 0xff800000;
        auVar376._20_4_ = 0xff800000;
        auVar376._24_4_ = 0xff800000;
        auVar376._28_4_ = 0xff800000;
        auVar469._8_4_ = 0x7f800000;
        auVar469._0_8_ = 0x7f8000007f800000;
        auVar469._12_4_ = 0x7f800000;
        auVar469._16_4_ = 0x7f800000;
        auVar469._20_4_ = 0x7f800000;
        auVar469._24_4_ = 0x7f800000;
        auVar469._28_4_ = 0x7f800000;
        auVar32 = vblendvps_avx(auVar469,auVar376,auVar151);
        auVar224 = vpmovsxwd_avx(auVar188);
        auVar188 = vpunpckhwd_avx(auVar188,auVar188);
        auVar302._16_16_ = auVar188;
        auVar302._0_16_ = auVar224;
        auVar200 = vblendvps_avx(auVar200,auVar32,auVar302);
        auVar32 = vblendvps_avx(auVar376,auVar469,auVar151);
        auVar484 = vblendvps_avx(auVar484,auVar32,auVar302);
        auVar32 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar165._0_4_ = auVar149._0_4_ ^ auVar32._0_4_;
        auVar165._4_4_ = auVar149._4_4_ ^ auVar32._4_4_;
        auVar165._8_4_ = auVar149._8_4_ ^ auVar32._8_4_;
        auVar165._12_4_ = auVar149._12_4_ ^ auVar32._12_4_;
        auVar165._16_4_ = auVar149._16_4_ ^ auVar32._16_4_;
        auVar165._20_4_ = auVar149._20_4_ ^ auVar32._20_4_;
        auVar165._24_4_ = auVar149._24_4_ ^ auVar32._24_4_;
        auVar165._28_4_ = auVar149._28_4_ ^ auVar32._28_4_;
        auVar149 = vorps_avx(auVar151,auVar165);
        auVar149 = vandps_avx(auVar199,auVar149);
      }
    }
    auVar32 = local_280 & auVar149;
    auVar276._8_4_ = 0x3f800000;
    auVar276._0_8_ = &DAT_3f8000003f800000;
    auVar276._12_4_ = 0x3f800000;
    auVar276._16_4_ = 0x3f800000;
    auVar276._20_4_ = 0x3f800000;
    auVar276._24_4_ = 0x3f800000;
    auVar276._28_4_ = 0x3f800000;
    auVar281 = ZEXT3264(auVar276);
    auVar323 = ZEXT3264(local_9a0);
    if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar32 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar32 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar32 >> 0x7f,0) == '\0') &&
          (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar32 >> 0xbf,0) == '\0') &&
        (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar32[0x1f]) {
      auVar352 = ZEXT1664((undefined1  [16])0x0);
    }
    else {
      auVar188 = vshufps_avx(ZEXT416((uint)(*(float *)(ray + k * 4 + 0x100) - (float)local_960._0_4_
                                           )),
                             ZEXT416((uint)(*(float *)(ray + k * 4 + 0x100) - (float)local_960._0_4_
                                           )),0);
      auVar277._16_16_ = auVar188;
      auVar277._0_16_ = auVar188;
      auVar199 = vminps_avx(auVar277,auVar484);
      fVar332 = auVar45._28_4_;
      auVar238._0_4_ =
           (float)local_880._0_4_ * fVar311 +
           (float)local_8a0._0_4_ * fVar447 + (float)local_8c0._0_4_ * fVar461;
      auVar238._4_4_ =
           (float)local_880._4_4_ * fVar324 +
           (float)local_8a0._4_4_ * fVar455 + (float)local_8c0._4_4_ * fVar470;
      auVar238._8_4_ = fStack_878 * fVar326 + fStack_898 * fVar456 + fStack_8b8 * fVar473;
      auVar238._12_4_ = fStack_874 * fVar328 + fStack_894 * fVar457 + fStack_8b4 * fVar475;
      auVar238._16_4_ = fStack_870 * fVar331 + fStack_890 * fVar458 + fStack_8b0 * fVar477;
      auVar238._20_4_ = fStack_86c * fVar335 + fStack_88c * fVar459 + fStack_8ac * fVar479;
      auVar238._24_4_ = fStack_868 * fVar339 + fStack_888 * fVar460 + fStack_8a8 * fVar481;
      auVar238._28_4_ = fVar341 + fStack_184 + fVar332;
      auVar32 = vrcpps_avx(auVar238);
      fVar341 = auVar32._0_4_;
      fVar463 = auVar32._4_4_;
      auVar78._4_4_ = auVar238._4_4_ * fVar463;
      auVar78._0_4_ = auVar238._0_4_ * fVar341;
      fVar472 = auVar32._8_4_;
      auVar78._8_4_ = auVar238._8_4_ * fVar472;
      fVar312 = auVar32._12_4_;
      auVar78._12_4_ = auVar238._12_4_ * fVar312;
      fVar325 = auVar32._16_4_;
      auVar78._16_4_ = auVar238._16_4_ * fVar325;
      fVar327 = auVar32._20_4_;
      auVar78._20_4_ = auVar238._20_4_ * fVar327;
      fVar329 = auVar32._24_4_;
      auVar78._24_4_ = auVar238._24_4_ * fVar329;
      auVar78._28_4_ = fStack_184;
      auVar151 = vsubps_avx(auVar276,auVar78);
      auVar350._8_4_ = 0x7fffffff;
      auVar350._0_8_ = 0x7fffffff7fffffff;
      auVar350._12_4_ = 0x7fffffff;
      auVar350._16_4_ = 0x7fffffff;
      auVar350._20_4_ = 0x7fffffff;
      auVar350._24_4_ = 0x7fffffff;
      auVar350._28_4_ = 0x7fffffff;
      auVar32 = vandps_avx(auVar238,auVar350);
      auVar419._8_4_ = 0x219392ef;
      auVar419._0_8_ = 0x219392ef219392ef;
      auVar419._12_4_ = 0x219392ef;
      auVar419._16_4_ = 0x219392ef;
      auVar419._20_4_ = 0x219392ef;
      auVar419._24_4_ = 0x219392ef;
      auVar419._28_4_ = 0x219392ef;
      auVar45 = vcmpps_avx(auVar32,auVar419,1);
      auVar439 = ZEXT3264(CONCAT428(0x80000000,
                                    CONCAT424(0x80000000,
                                              CONCAT420(0x80000000,
                                                        CONCAT416(0x80000000,
                                                                  CONCAT412(0x80000000,
                                                                            CONCAT48(0x80000000,
                                                                                                                                                                          
                                                  0x8000000080000000)))))));
      auVar79._4_4_ =
           (fVar463 + fVar463 * auVar151._4_4_) *
           -(fVar440 * fVar324 + fVar455 * fVar286 + fVar470 * fVar285);
      auVar79._0_4_ =
           (fVar341 + fVar341 * auVar151._0_4_) *
           -(fVar432 * fVar311 + fVar447 * fVar262 + fVar461 * fVar174);
      auVar79._8_4_ =
           (fVar472 + fVar472 * auVar151._8_4_) *
           -(fVar441 * fVar326 + fVar456 * fVar309 + fVar473 * fVar307);
      auVar79._12_4_ =
           (fVar312 + fVar312 * auVar151._12_4_) *
           -(fVar442 * fVar328 + fVar457 * fVar354 + fVar475 * fVar353);
      auVar79._16_4_ =
           (fVar325 + fVar325 * auVar151._16_4_) *
           -(fVar443 * fVar331 + fVar458 * fVar388 + fVar477 * fVar383);
      auVar79._20_4_ =
           (fVar327 + fVar327 * auVar151._20_4_) *
           -(fVar444 * fVar335 + fVar459 * fVar37 + fVar479 * fVar446);
      auVar79._24_4_ =
           (fVar329 + fVar329 * auVar151._24_4_) *
           -(fVar445 * fVar339 + fVar460 * fVar44 + fVar481 * fVar43);
      auVar79._28_4_ = -(fVar332 + auVar200._28_4_ + fVar332);
      auVar102 = ZEXT812(0);
      auVar421 = ZEXT1264(auVar102) << 0x20;
      auVar32 = vcmpps_avx(auVar238,ZEXT1232(auVar102) << 0x20,1);
      auVar32 = vorps_avx(auVar45,auVar32);
      auVar453._8_4_ = 0xff800000;
      auVar453._0_8_ = 0xff800000ff800000;
      auVar453._12_4_ = 0xff800000;
      auVar453._16_4_ = 0xff800000;
      auVar453._20_4_ = 0xff800000;
      auVar453._24_4_ = 0xff800000;
      auVar453._28_4_ = 0xff800000;
      auVar454 = ZEXT3264(auVar453);
      auVar32 = vblendvps_avx(auVar79,auVar453,auVar32);
      auVar151 = vcmpps_avx(auVar238,ZEXT1232(auVar102) << 0x20,6);
      auVar45 = vorps_avx(auVar45,auVar151);
      auVar468._8_4_ = 0x7f800000;
      auVar468._0_8_ = 0x7f8000007f800000;
      auVar468._12_4_ = 0x7f800000;
      auVar468._16_4_ = 0x7f800000;
      auVar468._20_4_ = 0x7f800000;
      auVar468._24_4_ = 0x7f800000;
      auVar468._28_4_ = 0x7f800000;
      auVar45 = vblendvps_avx(auVar79,auVar468,auVar45);
      auVar151 = vmaxps_avx(local_2a0,auVar200);
      auVar151 = vmaxps_avx(auVar151,auVar32);
      auVar45 = vminps_avx(auVar199,auVar45);
      auVar196 = ZEXT1232(auVar102) << 0x20;
      auVar32 = vsubps_avx(auVar196,auVar33);
      auVar33 = vsubps_avx(auVar196,auVar420);
      auVar80._4_4_ = auVar33._4_4_ * -fVar471;
      auVar80._0_4_ = auVar33._0_4_ * -fVar462;
      auVar80._8_4_ = auVar33._8_4_ * -fVar474;
      auVar80._12_4_ = auVar33._12_4_ * -fVar476;
      auVar80._16_4_ = auVar33._16_4_ * -fVar478;
      auVar80._20_4_ = auVar33._20_4_ * -fVar480;
      auVar80._24_4_ = auVar33._24_4_ * -fVar482;
      auVar80._28_4_ = auVar33._28_4_;
      auVar81._4_4_ = fVar283 * auVar32._4_4_;
      auVar81._0_4_ = fVar221 * auVar32._0_4_;
      auVar81._8_4_ = fVar305 * auVar32._8_4_;
      auVar81._12_4_ = fVar338 * auVar32._12_4_;
      auVar81._16_4_ = fVar364 * auVar32._16_4_;
      auVar81._20_4_ = fVar423 * auVar32._20_4_;
      auVar81._24_4_ = fVar41 * auVar32._24_4_;
      auVar81._28_4_ = auVar32._28_4_;
      auVar32 = vsubps_avx(auVar80,auVar81);
      auVar33 = vsubps_avx(auVar196,local_a00);
      auVar82._4_4_ = fVar284 * auVar33._4_4_;
      auVar82._0_4_ = fVar261 * auVar33._0_4_;
      auVar82._8_4_ = fVar306 * auVar33._8_4_;
      auVar82._12_4_ = fVar342 * auVar33._12_4_;
      auVar82._16_4_ = fVar378 * auVar33._16_4_;
      auVar82._20_4_ = fVar424 * auVar33._20_4_;
      uVar8 = auVar33._28_4_;
      auVar82._24_4_ = fVar42 * auVar33._24_4_;
      auVar82._28_4_ = uVar8;
      auVar420 = vsubps_avx(auVar32,auVar82);
      auVar83._4_4_ = (float)local_8c0._4_4_ * -fVar471;
      auVar83._0_4_ = (float)local_8c0._0_4_ * -fVar462;
      auVar83._8_4_ = fStack_8b8 * -fVar474;
      auVar83._12_4_ = fStack_8b4 * -fVar476;
      auVar83._16_4_ = fStack_8b0 * -fVar478;
      auVar83._20_4_ = fStack_8ac * -fVar480;
      auVar83._24_4_ = fStack_8a8 * -fVar482;
      auVar83._28_4_ = uVar128 ^ 0x80000000;
      auVar430._8_4_ = 0x3f800000;
      auVar430._0_8_ = &DAT_3f8000003f800000;
      auVar430._12_4_ = 0x3f800000;
      auVar430._16_4_ = 0x3f800000;
      auVar430._20_4_ = 0x3f800000;
      auVar430._24_4_ = 0x3f800000;
      auVar430._28_4_ = 0x3f800000;
      auVar431 = ZEXT3264(auVar430);
      auVar84._4_4_ = (float)local_8a0._4_4_ * fVar283;
      auVar84._0_4_ = (float)local_8a0._0_4_ * fVar221;
      auVar84._8_4_ = fStack_898 * fVar305;
      auVar84._12_4_ = fStack_894 * fVar338;
      auVar84._16_4_ = fStack_890 * fVar364;
      auVar84._20_4_ = fStack_88c * fVar423;
      auVar84._24_4_ = fStack_888 * fVar41;
      auVar84._28_4_ = uVar8;
      auVar32 = vsubps_avx(auVar83,auVar84);
      auVar85._4_4_ = (float)local_880._4_4_ * fVar284;
      auVar85._0_4_ = (float)local_880._0_4_ * fVar261;
      auVar85._8_4_ = fStack_878 * fVar306;
      auVar85._12_4_ = fStack_874 * fVar342;
      auVar85._16_4_ = fStack_870 * fVar378;
      auVar85._20_4_ = fStack_86c * fVar424;
      auVar85._24_4_ = fStack_868 * fVar42;
      auVar85._28_4_ = uVar8;
      auVar199 = vsubps_avx(auVar32,auVar85);
      auVar32 = vrcpps_avx(auVar199);
      fVar221 = auVar32._0_4_;
      fVar261 = auVar32._4_4_;
      auVar86._4_4_ = auVar199._4_4_ * fVar261;
      auVar86._0_4_ = auVar199._0_4_ * fVar221;
      fVar174 = auVar32._8_4_;
      auVar86._8_4_ = auVar199._8_4_ * fVar174;
      fVar262 = auVar32._12_4_;
      auVar86._12_4_ = auVar199._12_4_ * fVar262;
      fVar283 = auVar32._16_4_;
      auVar86._16_4_ = auVar199._16_4_ * fVar283;
      fVar284 = auVar32._20_4_;
      auVar86._20_4_ = auVar199._20_4_ * fVar284;
      fVar285 = auVar32._24_4_;
      auVar86._24_4_ = auVar199._24_4_ * fVar285;
      auVar86._28_4_ = fStack_864;
      auVar195 = vsubps_avx(auVar430,auVar86);
      auVar320._8_4_ = 0x7fffffff;
      auVar320._0_8_ = 0x7fffffff7fffffff;
      auVar320._12_4_ = 0x7fffffff;
      auVar320._16_4_ = 0x7fffffff;
      auVar320._20_4_ = 0x7fffffff;
      auVar320._24_4_ = 0x7fffffff;
      auVar320._28_4_ = 0x7fffffff;
      auVar32 = vandps_avx(auVar199,auVar320);
      auVar351._8_4_ = 0x219392ef;
      auVar351._0_8_ = 0x219392ef219392ef;
      auVar351._12_4_ = 0x219392ef;
      auVar351._16_4_ = 0x219392ef;
      auVar351._20_4_ = 0x219392ef;
      auVar351._24_4_ = 0x219392ef;
      auVar351._28_4_ = 0x219392ef;
      auVar33 = vcmpps_avx(auVar32,auVar351,1);
      auVar87._4_4_ = (fVar261 + fVar261 * auVar195._4_4_) * -auVar420._4_4_;
      auVar87._0_4_ = (fVar221 + fVar221 * auVar195._0_4_) * -auVar420._0_4_;
      auVar87._8_4_ = (fVar174 + fVar174 * auVar195._8_4_) * -auVar420._8_4_;
      auVar87._12_4_ = (fVar262 + fVar262 * auVar195._12_4_) * -auVar420._12_4_;
      auVar87._16_4_ = (fVar283 + fVar283 * auVar195._16_4_) * -auVar420._16_4_;
      auVar87._20_4_ = (fVar284 + fVar284 * auVar195._20_4_) * -auVar420._20_4_;
      auVar87._24_4_ = (fVar285 + fVar285 * auVar195._24_4_) * -auVar420._24_4_;
      auVar87._28_4_ = auVar420._28_4_ ^ 0x80000000;
      auVar32 = vcmpps_avx(auVar199,auVar196,1);
      auVar32 = vorps_avx(auVar33,auVar32);
      auVar32 = vblendvps_avx(auVar87,auVar453,auVar32);
      local_4e0 = vmaxps_avx(auVar151,auVar32);
      auVar420 = ZEXT1232(auVar102) << 0x20;
      auVar32 = vcmpps_avx(auVar199,auVar420,6);
      auVar32 = vorps_avx(auVar33,auVar32);
      auVar32 = vblendvps_avx(auVar87,auVar468,auVar32);
      auVar149 = vandps_avx(local_280,auVar149);
      local_300 = vminps_avx(auVar45,auVar32);
      auVar32 = vcmpps_avx(local_4e0,local_300,2);
      auVar33 = auVar149 & auVar32;
      if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar33 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar33 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar33 >> 0x7f,0) == '\0') &&
            (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar33 >> 0xbf,0) == '\0') &&
          (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar33[0x1f])
      {
        auVar281 = ZEXT3264(auVar430);
        auVar352 = ZEXT864(0) << 0x20;
        auVar323 = ZEXT3264(local_9a0);
      }
      else {
        auVar33 = vminps_avx(local_860,auVar154);
        auVar202 = vminps_avx(auVar34,auVar202);
        auVar33 = vminps_avx(auVar33,auVar202);
        auVar198 = vsubps_avx(auVar33,auVar198);
        auVar149 = vandps_avx(auVar32,auVar149);
        auVar125._4_4_ = local_680[1];
        auVar125._0_4_ = local_680[0];
        auVar125._8_4_ = local_680[2];
        auVar125._12_4_ = local_680[3];
        auVar125._16_4_ = fStack_670;
        auVar125._20_4_ = fStack_66c;
        auVar125._24_4_ = fStack_668;
        auVar125._28_4_ = fStack_664;
        auVar32 = vminps_avx(auVar125,auVar430);
        auVar32 = vmaxps_avx(auVar32,ZEXT832(0) << 0x20);
        local_680[0] = fVar136 + fVar178 * (auVar32._0_4_ + 0.0) * 0.125;
        local_680[1] = fVar168 + fVar217 * (auVar32._4_4_ + 1.0) * 0.125;
        local_680[2] = fVar170 + fVar218 * (auVar32._8_4_ + 2.0) * 0.125;
        local_680[3] = fVar172 + fVar220 * (auVar32._12_4_ + 3.0) * 0.125;
        fStack_670 = fVar136 + fVar178 * (auVar32._16_4_ + 4.0) * 0.125;
        fStack_66c = fVar168 + fVar217 * (auVar32._20_4_ + 5.0) * 0.125;
        fStack_668 = fVar170 + fVar218 * (auVar32._24_4_ + 6.0) * 0.125;
        fStack_664 = fVar172 + auVar32._28_4_ + 7.0;
        auVar124._4_4_ = local_6a0[1];
        auVar124._0_4_ = local_6a0[0];
        auVar124._8_4_ = local_6a0[2];
        auVar124._12_4_ = local_6a0[3];
        auVar124._16_4_ = fStack_690;
        auVar124._20_4_ = fStack_68c;
        auVar124._24_4_ = fStack_688;
        auVar124._28_4_ = fStack_684;
        auVar32 = vminps_avx(auVar124,auVar430);
        auVar32 = vmaxps_avx(auVar32,ZEXT832(0) << 0x20);
        local_6a0[0] = fVar136 + fVar178 * (auVar32._0_4_ + 0.0) * 0.125;
        local_6a0[1] = fVar168 + fVar217 * (auVar32._4_4_ + 1.0) * 0.125;
        local_6a0[2] = fVar170 + fVar218 * (auVar32._8_4_ + 2.0) * 0.125;
        local_6a0[3] = fVar172 + fVar220 * (auVar32._12_4_ + 3.0) * 0.125;
        fStack_690 = fVar136 + fVar178 * (auVar32._16_4_ + 4.0) * 0.125;
        fStack_68c = fVar168 + fVar217 * (auVar32._20_4_ + 5.0) * 0.125;
        fStack_688 = fVar170 + fVar218 * (auVar32._24_4_ + 6.0) * 0.125;
        fStack_684 = fVar172 + auVar32._28_4_ + 7.0;
        auVar88._4_4_ = auVar198._4_4_ * 0.99999976;
        auVar88._0_4_ = auVar198._0_4_ * 0.99999976;
        auVar88._8_4_ = auVar198._8_4_ * 0.99999976;
        auVar88._12_4_ = auVar198._12_4_ * 0.99999976;
        auVar88._16_4_ = auVar198._16_4_ * 0.99999976;
        auVar88._20_4_ = auVar198._20_4_ * 0.99999976;
        auVar88._24_4_ = auVar198._24_4_ * 0.99999976;
        auVar88._28_4_ = 0x3f7ffffc;
        auVar32 = vmaxps_avx(auVar420,auVar88);
        auVar89._4_4_ = auVar32._4_4_ * auVar32._4_4_;
        auVar89._0_4_ = auVar32._0_4_ * auVar32._0_4_;
        auVar89._8_4_ = auVar32._8_4_ * auVar32._8_4_;
        auVar89._12_4_ = auVar32._12_4_ * auVar32._12_4_;
        auVar89._16_4_ = auVar32._16_4_ * auVar32._16_4_;
        auVar89._20_4_ = auVar32._20_4_ * auVar32._20_4_;
        auVar89._24_4_ = auVar32._24_4_ * auVar32._24_4_;
        auVar89._28_4_ = auVar32._28_4_;
        local_aa0 = vsubps_avx(auVar150,auVar89);
        auVar90._4_4_ = local_aa0._4_4_ * fVar171 * 4.0;
        auVar90._0_4_ = local_aa0._0_4_ * fVar169 * 4.0;
        auVar90._8_4_ = local_aa0._8_4_ * fVar173 * 4.0;
        auVar90._12_4_ = local_aa0._12_4_ * fVar175 * 4.0;
        auVar90._16_4_ = local_aa0._16_4_ * fVar176 * 4.0;
        auVar90._20_4_ = local_aa0._20_4_ * fVar177 * 4.0;
        auVar90._24_4_ = local_aa0._24_4_ * fVar422 * 4.0;
        auVar90._28_4_ = auVar32._28_4_;
        auVar198 = vsubps_avx(auVar72,auVar90);
        auVar32 = vcmpps_avx(auVar198,ZEXT832(0) << 0x20,5);
        fVar221 = local_9a0._28_4_;
        if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar32 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar32 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar32 >> 0x7f,0) == '\0') &&
              (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar32 >> 0xbf,0) == '\0') &&
            (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar32[0x1f]) {
          auVar202 = SUB6432(ZEXT864(0),0) << 0x20;
          _local_920 = ZEXT832(0) << 0x20;
          _local_940 = ZEXT832(0) << 0x20;
          auVar252 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar278._8_4_ = 0x7f800000;
          auVar278._0_8_ = 0x7f8000007f800000;
          auVar278._12_4_ = 0x7f800000;
          auVar278._16_4_ = 0x7f800000;
          auVar278._20_4_ = 0x7f800000;
          auVar278._24_4_ = 0x7f800000;
          auVar278._28_4_ = 0x7f800000;
          auVar296._8_4_ = 0xff800000;
          auVar296._0_8_ = 0xff800000ff800000;
          auVar296._12_4_ = 0xff800000;
          auVar296._16_4_ = 0xff800000;
          auVar296._20_4_ = 0xff800000;
          auVar296._24_4_ = 0xff800000;
          auVar296._28_4_ = 0xff800000;
          local_aa0 = auVar50;
          _local_900 = _local_920;
        }
        else {
          auVar202 = vsqrtps_avx(auVar198);
          auVar257._0_4_ = fVar169 + fVar169;
          auVar257._4_4_ = fVar171 + fVar171;
          auVar257._8_4_ = fVar173 + fVar173;
          auVar257._12_4_ = fVar175 + fVar175;
          auVar257._16_4_ = fVar176 + fVar176;
          auVar257._20_4_ = fVar177 + fVar177;
          auVar257._24_4_ = fVar422 + fVar422;
          auVar257._28_4_ = fVar179 + fVar179;
          auVar33 = vrcpps_avx(auVar257);
          fVar179 = auVar33._0_4_;
          fVar261 = auVar33._4_4_;
          auVar91._4_4_ = auVar257._4_4_ * fVar261;
          auVar91._0_4_ = auVar257._0_4_ * fVar179;
          fVar174 = auVar33._8_4_;
          auVar91._8_4_ = auVar257._8_4_ * fVar174;
          fVar262 = auVar33._12_4_;
          auVar91._12_4_ = auVar257._12_4_ * fVar262;
          fVar283 = auVar33._16_4_;
          auVar91._16_4_ = auVar257._16_4_ * fVar283;
          fVar284 = auVar33._20_4_;
          auVar91._20_4_ = auVar257._20_4_ * fVar284;
          fVar285 = auVar33._24_4_;
          auVar91._24_4_ = auVar257._24_4_ * fVar285;
          auVar91._28_4_ = auVar257._28_4_;
          auVar45 = vsubps_avx(auVar430,auVar91);
          fVar179 = fVar179 + fVar179 * auVar45._0_4_;
          fVar261 = fVar261 + fVar261 * auVar45._4_4_;
          fVar174 = fVar174 + fVar174 * auVar45._8_4_;
          fVar262 = fVar262 + fVar262 * auVar45._12_4_;
          fVar283 = fVar283 + fVar283 * auVar45._16_4_;
          fVar284 = fVar284 + fVar284 * auVar45._20_4_;
          fVar285 = fVar285 + fVar285 * auVar45._24_4_;
          fVar286 = auVar33._28_4_ + auVar45._28_4_;
          auVar297._0_8_ = auVar467._0_8_ ^ 0x8000000080000000;
          auVar297._8_4_ = -auVar467._8_4_;
          auVar297._12_4_ = -auVar467._12_4_;
          auVar297._16_4_ = -auVar467._16_4_;
          auVar297._20_4_ = -auVar467._20_4_;
          auVar297._24_4_ = -auVar467._24_4_;
          auVar297._28_4_ = -auVar467._28_4_;
          auVar33 = vsubps_avx(auVar297,auVar202);
          fVar354 = auVar33._0_4_ * fVar179;
          fVar364 = auVar33._4_4_ * fVar261;
          auVar92._4_4_ = fVar364;
          auVar92._0_4_ = fVar354;
          fVar378 = auVar33._8_4_ * fVar174;
          auVar92._8_4_ = fVar378;
          fVar383 = auVar33._12_4_ * fVar262;
          auVar92._12_4_ = fVar383;
          fVar388 = auVar33._16_4_ * fVar283;
          auVar92._16_4_ = fVar388;
          fVar423 = auVar33._20_4_ * fVar284;
          auVar92._20_4_ = fVar423;
          fVar424 = auVar33._24_4_ * fVar285;
          auVar92._24_4_ = fVar424;
          auVar92._28_4_ = 0x7f800000;
          auVar202 = vsubps_avx(auVar202,auVar467);
          fVar179 = auVar202._0_4_ * fVar179;
          fVar261 = auVar202._4_4_ * fVar261;
          auVar93._4_4_ = fVar261;
          auVar93._0_4_ = fVar179;
          fVar174 = auVar202._8_4_ * fVar174;
          auVar93._8_4_ = fVar174;
          fVar262 = auVar202._12_4_ * fVar262;
          auVar93._12_4_ = fVar262;
          fVar283 = auVar202._16_4_ * fVar283;
          auVar93._16_4_ = fVar283;
          fVar284 = auVar202._20_4_ * fVar284;
          auVar93._20_4_ = fVar284;
          fVar285 = auVar202._24_4_ * fVar285;
          auVar93._24_4_ = fVar285;
          auVar93._28_4_ = 0xff800000;
          auVar454 = ZEXT3264(auVar93);
          fVar305 = (fVar354 * fVar368 + local_540._0_4_) * fVar263;
          fVar306 = (fVar364 * fVar382 + local_540._4_4_) * fVar287;
          fVar307 = (fVar378 * fVar387 + local_540._8_4_) * fVar330;
          fVar309 = (fVar383 * fVar392 + local_540._12_4_) * fVar356;
          fVar338 = (fVar388 * fVar397 + local_540._16_4_) * fVar393;
          fVar342 = (fVar423 * fVar402 + local_540._20_4_) * fVar308;
          fVar353 = (fVar424 * fVar407 + local_540._24_4_) * fVar310;
          auVar203._0_4_ = fVar365 + fVar244 * fVar305;
          auVar203._4_4_ = fVar379 + fVar282 * fVar306;
          auVar203._8_4_ = fVar384 + fVar304 * fVar307;
          auVar203._12_4_ = fVar389 + fVar337 * fVar309;
          auVar203._16_4_ = fVar394 + fVar362 * fVar338;
          auVar203._20_4_ = fVar399 + fVar408 * fVar342;
          auVar203._24_4_ = fVar404 + fVar40 * fVar353;
          auVar203._28_4_ = fVar409 + auVar202._28_4_ + local_540._28_4_;
          auVar94._4_4_ = (float)local_880._4_4_ * fVar364;
          auVar94._0_4_ = (float)local_880._0_4_ * fVar354;
          auVar94._8_4_ = fStack_878 * fVar378;
          auVar94._12_4_ = fStack_874 * fVar383;
          auVar94._16_4_ = fStack_870 * fVar388;
          auVar94._20_4_ = fStack_86c * fVar423;
          auVar94._24_4_ = fStack_868 * fVar424;
          auVar94._28_4_ = fVar286;
          auVar202 = vsubps_avx(auVar94,auVar203);
          auVar258._0_4_ = fVar366 + fVar260 * fVar305;
          auVar258._4_4_ = fVar380 + fVar264 * fVar306;
          auVar258._8_4_ = fVar385 + fVar288 * fVar307;
          auVar258._12_4_ = fVar390 + fVar333 * fVar309;
          auVar258._16_4_ = fVar395 + fVar358 * fVar338;
          auVar258._20_4_ = fVar400 + fVar398 * fVar342;
          auVar258._24_4_ = fVar405 + fVar38 * fVar353;
          auVar258._28_4_ = fVar410 + fVar286;
          auVar95._4_4_ = (float)local_8a0._4_4_ * fVar364;
          auVar95._0_4_ = (float)local_8a0._0_4_ * fVar354;
          auVar95._8_4_ = fStack_898 * fVar378;
          auVar95._12_4_ = fStack_894 * fVar383;
          auVar95._16_4_ = fStack_890 * fVar388;
          auVar95._20_4_ = fStack_88c * fVar423;
          auVar95._24_4_ = fStack_888 * fVar424;
          auVar95._28_4_ = fVar221;
          auVar45 = vsubps_avx(auVar95,auVar258);
          auVar298._0_4_ = fVar367 + fVar219 * fVar305;
          auVar298._4_4_ = fVar381 + fVar265 * fVar306;
          auVar298._8_4_ = fVar386 + fVar303 * fVar307;
          auVar298._12_4_ = fVar391 + fVar334 * fVar309;
          auVar298._16_4_ = fVar396 + fVar360 * fVar338;
          auVar298._20_4_ = fVar401 + fVar403 * fVar342;
          auVar298._24_4_ = fVar406 + fVar39 * fVar353;
          auVar298._28_4_ = fVar411 + auVar33._28_4_;
          auVar96._4_4_ = (float)local_8c0._4_4_ * fVar364;
          auVar96._0_4_ = (float)local_8c0._0_4_ * fVar354;
          auVar96._8_4_ = fStack_8b8 * fVar378;
          auVar96._12_4_ = fStack_8b4 * fVar383;
          auVar96._16_4_ = fStack_8b0 * fVar388;
          auVar96._20_4_ = fStack_8ac * fVar423;
          auVar96._24_4_ = fStack_8a8 * fVar424;
          auVar96._28_4_ = fVar221;
          local_9c0 = vsubps_avx(auVar96,auVar298);
          fVar263 = (fVar179 * fVar368 + local_540._0_4_) * fVar263;
          fVar287 = (fVar261 * fVar382 + local_540._4_4_) * fVar287;
          fVar330 = (fVar174 * fVar387 + local_540._8_4_) * fVar330;
          fVar356 = (fVar262 * fVar392 + local_540._12_4_) * fVar356;
          fVar393 = (fVar283 * fVar397 + local_540._16_4_) * fVar393;
          fVar308 = (fVar284 * fVar402 + local_540._20_4_) * fVar308;
          fVar310 = (fVar285 * fVar407 + local_540._24_4_) * fVar310;
          auVar321._0_4_ = fVar365 + fVar244 * fVar263;
          auVar321._4_4_ = fVar379 + fVar282 * fVar287;
          auVar321._8_4_ = fVar384 + fVar304 * fVar330;
          auVar321._12_4_ = fVar389 + fVar337 * fVar356;
          auVar321._16_4_ = fVar394 + fVar362 * fVar393;
          auVar321._20_4_ = fVar399 + fVar408 * fVar308;
          auVar321._24_4_ = fVar404 + fVar40 * fVar310;
          auVar321._28_4_ = fVar409 + fVar221;
          auVar97._4_4_ = (float)local_880._4_4_ * fVar261;
          auVar97._0_4_ = (float)local_880._0_4_ * fVar179;
          auVar97._8_4_ = fStack_878 * fVar174;
          auVar97._12_4_ = fStack_874 * fVar262;
          auVar97._16_4_ = fStack_870 * fVar283;
          auVar97._20_4_ = fStack_86c * fVar284;
          auVar97._24_4_ = fStack_868 * fVar285;
          auVar97._28_4_ = fStack_864;
          _local_900 = vsubps_avx(auVar97,auVar321);
          auVar322._0_4_ = fVar366 + fVar260 * fVar263;
          auVar322._4_4_ = fVar380 + fVar264 * fVar287;
          auVar322._8_4_ = fVar385 + fVar288 * fVar330;
          auVar322._12_4_ = fVar390 + fVar333 * fVar356;
          auVar322._16_4_ = fVar395 + fVar358 * fVar393;
          auVar322._20_4_ = fVar400 + fVar398 * fVar308;
          auVar322._24_4_ = fVar405 + fVar38 * fVar310;
          auVar322._28_4_ = fVar410 + local_900._28_4_;
          auVar98._4_4_ = (float)local_8a0._4_4_ * fVar261;
          auVar98._0_4_ = (float)local_8a0._0_4_ * fVar179;
          auVar98._8_4_ = fStack_898 * fVar174;
          auVar98._12_4_ = fStack_894 * fVar262;
          auVar98._16_4_ = fStack_890 * fVar283;
          auVar98._20_4_ = fStack_88c * fVar284;
          auVar98._24_4_ = fStack_888 * fVar285;
          auVar98._28_4_ = fStack_864;
          _local_920 = vsubps_avx(auVar98,auVar322);
          auVar299._0_4_ = fVar367 + fVar219 * fVar263;
          auVar299._4_4_ = fVar381 + fVar265 * fVar287;
          auVar299._8_4_ = fVar386 + fVar303 * fVar330;
          auVar299._12_4_ = fVar391 + fVar334 * fVar356;
          auVar299._16_4_ = fVar396 + fVar360 * fVar393;
          auVar299._20_4_ = fVar401 + fVar403 * fVar308;
          auVar299._24_4_ = fVar406 + fVar39 * fVar310;
          auVar299._28_4_ = fVar411 + local_9c0._28_4_ + local_540._28_4_;
          auVar99._4_4_ = (float)local_8c0._4_4_ * fVar261;
          auVar99._0_4_ = (float)local_8c0._0_4_ * fVar179;
          auVar99._8_4_ = fStack_8b8 * fVar174;
          auVar99._12_4_ = fStack_8b4 * fVar262;
          auVar99._16_4_ = fStack_8b0 * fVar283;
          auVar99._20_4_ = fStack_8ac * fVar284;
          auVar99._24_4_ = fStack_8a8 * fVar285;
          auVar99._28_4_ = local_920._28_4_;
          _local_940 = vsubps_avx(auVar99,auVar299);
          auVar33 = vcmpps_avx(auVar198,auVar420,5);
          auVar279._8_4_ = 0x7f800000;
          auVar279._0_8_ = 0x7f8000007f800000;
          auVar279._12_4_ = 0x7f800000;
          auVar279._16_4_ = 0x7f800000;
          auVar279._20_4_ = 0x7f800000;
          auVar279._24_4_ = 0x7f800000;
          auVar279._28_4_ = 0x7f800000;
          auVar278 = vblendvps_avx(auVar279,auVar92,auVar33);
          auVar375._8_4_ = 0x7fffffff;
          auVar375._0_8_ = 0x7fffffff7fffffff;
          auVar375._12_4_ = 0x7fffffff;
          auVar375._16_4_ = 0x7fffffff;
          auVar375._20_4_ = 0x7fffffff;
          auVar375._24_4_ = 0x7fffffff;
          auVar375._28_4_ = 0x7fffffff;
          auVar198 = vandps_avx(auVar375,local_2e0);
          auVar198 = vmaxps_avx(local_4c0,auVar198);
          auVar100._4_4_ = auVar198._4_4_ * 1.9073486e-06;
          auVar100._0_4_ = auVar198._0_4_ * 1.9073486e-06;
          auVar100._8_4_ = auVar198._8_4_ * 1.9073486e-06;
          auVar100._12_4_ = auVar198._12_4_ * 1.9073486e-06;
          auVar100._16_4_ = auVar198._16_4_ * 1.9073486e-06;
          auVar100._20_4_ = auVar198._20_4_ * 1.9073486e-06;
          auVar100._24_4_ = auVar198._24_4_ * 1.9073486e-06;
          auVar100._28_4_ = auVar198._28_4_;
          auVar198 = vandps_avx(auVar375,auVar46);
          auVar198 = vcmpps_avx(auVar198,auVar100,1);
          auVar300._8_4_ = 0xff800000;
          auVar300._0_8_ = 0xff800000ff800000;
          auVar300._12_4_ = 0xff800000;
          auVar300._16_4_ = 0xff800000;
          auVar300._20_4_ = 0xff800000;
          auVar300._24_4_ = 0xff800000;
          auVar300._28_4_ = 0xff800000;
          auVar296 = vblendvps_avx(auVar300,auVar93,auVar33);
          auVar420 = auVar33 & auVar198;
          if ((((((((auVar420 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar420 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar420 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar420 >> 0x7f,0) != '\0') ||
                (auVar420 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar420 >> 0xbf,0) != '\0') ||
              (auVar420 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar420[0x1f] < '\0') {
            auVar32 = vandps_avx(auVar198,auVar33);
            auVar188 = vpackssdw_avx(auVar32._0_16_,auVar32._16_16_);
            auVar420 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar198 = vcmpps_avx(local_aa0,auVar420,2);
            auVar485._8_4_ = 0xff800000;
            auVar485._0_8_ = 0xff800000ff800000;
            auVar485._12_4_ = 0xff800000;
            auVar485._16_4_ = 0xff800000;
            auVar485._20_4_ = 0xff800000;
            auVar485._24_4_ = 0xff800000;
            auVar485._28_4_ = 0xff800000;
            auVar486._8_4_ = 0x7f800000;
            auVar486._0_8_ = 0x7f8000007f800000;
            auVar486._12_4_ = 0x7f800000;
            auVar486._16_4_ = 0x7f800000;
            auVar486._20_4_ = 0x7f800000;
            auVar486._24_4_ = 0x7f800000;
            auVar486._28_4_ = 0x7f800000;
            auVar164 = vblendvps_avx(auVar486,auVar485,auVar198);
            auVar224 = vpmovsxwd_avx(auVar188);
            auVar454 = ZEXT1664(auVar224);
            auVar188 = vpunpckhwd_avx(auVar188,auVar188);
            auVar377._16_16_ = auVar188;
            auVar377._0_16_ = auVar224;
            auVar278 = vblendvps_avx(auVar278,auVar164,auVar377);
            auVar164 = vblendvps_avx(auVar485,auVar486,auVar198);
            auVar296 = vblendvps_avx(auVar296,auVar164,auVar377);
            auVar420 = vcmpps_avx(auVar420,ZEXT1232(ZEXT412(0)) << 0x20,0xf);
            auVar166._0_4_ = auVar420._0_4_ ^ auVar32._0_4_;
            auVar166._4_4_ = auVar420._4_4_ ^ auVar32._4_4_;
            auVar166._8_4_ = auVar420._8_4_ ^ auVar32._8_4_;
            auVar166._12_4_ = auVar420._12_4_ ^ auVar32._12_4_;
            auVar166._16_4_ = auVar420._16_4_ ^ auVar32._16_4_;
            auVar166._20_4_ = auVar420._20_4_ ^ auVar32._20_4_;
            auVar166._24_4_ = auVar420._24_4_ ^ auVar32._24_4_;
            auVar166._28_4_ = auVar420._28_4_ ^ auVar32._28_4_;
            auVar32 = vorps_avx(auVar198,auVar166);
            auVar32 = vandps_avx(auVar33,auVar32);
          }
          auVar439 = ZEXT3264(auVar164);
          auVar252 = auVar45._0_28_;
          auVar421 = ZEXT3264(local_9c0);
        }
        auVar323 = ZEXT3264(local_9a0);
        _local_360 = local_4e0;
        local_340 = vminps_avx(local_300,auVar278);
        _local_6e0 = vmaxps_avx(local_4e0,auVar296);
        auVar431 = ZEXT3264(_local_6e0);
        _local_320 = _local_6e0;
        auVar164 = vcmpps_avx(local_4e0,local_340,2);
        local_6c0 = vandps_avx(auVar164,auVar149);
        auVar164 = vcmpps_avx(_local_6e0,local_300,2);
        local_780 = vandps_avx(auVar164,auVar149);
        auVar149 = vorps_avx(local_780,local_6c0);
        if ((((((((auVar149 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar149 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar149 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar149 >> 0x7f,0) == '\0') &&
              (auVar149 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar149 >> 0xbf,0) == '\0') &&
            (auVar149 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar149[0x1f]) {
          auVar352 = ZEXT864(0) << 0x20;
        }
        else {
          local_a60 = vcmpps_avx(ZEXT1632(ZEXT816(0) << 0x20),ZEXT1632(ZEXT816(0) << 0x20),0xf);
          local_740._0_4_ = auVar32._0_4_ ^ local_a60._0_4_;
          local_740._4_4_ = auVar32._4_4_ ^ local_a60._4_4_;
          local_740._8_4_ = auVar32._8_4_ ^ local_a60._8_4_;
          local_740._12_4_ = auVar32._12_4_ ^ local_a60._12_4_;
          local_740._16_4_ = auVar32._16_4_ ^ local_a60._16_4_;
          local_740._20_4_ = auVar32._20_4_ ^ local_a60._20_4_;
          local_740._24_4_ = auVar32._24_4_ ^ local_a60._24_4_;
          local_740._28_4_ = (uint)auVar32._28_4_ ^ (uint)local_a60._28_4_;
          auVar155._0_4_ =
               auVar202._0_4_ * (float)local_880._0_4_ +
               auVar252._0_4_ * (float)local_8a0._0_4_ + auVar421._0_4_ * (float)local_8c0._0_4_;
          auVar155._4_4_ =
               auVar202._4_4_ * (float)local_880._4_4_ +
               auVar252._4_4_ * (float)local_8a0._4_4_ + auVar421._4_4_ * (float)local_8c0._4_4_;
          auVar155._8_4_ =
               auVar202._8_4_ * fStack_878 +
               auVar252._8_4_ * fStack_898 + auVar421._8_4_ * fStack_8b8;
          auVar155._12_4_ =
               auVar202._12_4_ * fStack_874 +
               auVar252._12_4_ * fStack_894 + auVar421._12_4_ * fStack_8b4;
          auVar155._16_4_ =
               auVar202._16_4_ * fStack_870 +
               auVar252._16_4_ * fStack_890 + auVar421._16_4_ * fStack_8b0;
          auVar155._20_4_ =
               auVar202._20_4_ * fStack_86c +
               auVar252._20_4_ * fStack_88c + auVar421._20_4_ * fStack_8ac;
          auVar155._24_4_ =
               auVar202._24_4_ * fStack_868 +
               auVar252._24_4_ * fStack_888 + auVar421._24_4_ * fStack_8a8;
          auVar155._28_4_ = auVar32._28_4_ + auVar202._28_4_ + local_a60._28_4_;
          auVar204._8_4_ = 0x7fffffff;
          auVar204._0_8_ = 0x7fffffff7fffffff;
          auVar204._12_4_ = 0x7fffffff;
          auVar204._16_4_ = 0x7fffffff;
          auVar204._20_4_ = 0x7fffffff;
          auVar204._24_4_ = 0x7fffffff;
          auVar204._28_4_ = 0x7fffffff;
          auVar149 = vandps_avx(auVar155,auVar204);
          auVar205._8_4_ = 0x3e99999a;
          auVar205._0_8_ = 0x3e99999a3e99999a;
          auVar205._12_4_ = 0x3e99999a;
          auVar205._16_4_ = 0x3e99999a;
          auVar205._20_4_ = 0x3e99999a;
          auVar205._24_4_ = 0x3e99999a;
          auVar205._28_4_ = 0x3e99999a;
          auVar149 = vcmpps_avx(auVar149,auVar205,1);
          auVar149 = vorps_avx(auVar149,local_740);
          auVar206._8_4_ = 3;
          auVar206._0_8_ = 0x300000003;
          auVar206._12_4_ = 3;
          auVar206._16_4_ = 3;
          auVar206._20_4_ = 3;
          auVar206._24_4_ = 3;
          auVar206._28_4_ = 3;
          auVar239._8_4_ = 2;
          auVar239._0_8_ = 0x200000002;
          auVar239._12_4_ = 2;
          auVar239._16_4_ = 2;
          auVar239._20_4_ = 2;
          auVar239._24_4_ = 2;
          auVar239._28_4_ = 2;
          auVar149 = vblendvps_avx(auVar239,auVar206,auVar149);
          local_720 = ZEXT432((uint)uVar133);
          local_7e0 = vpshufd_avx(ZEXT416((uint)uVar133),0);
          auVar188 = vpcmpgtd_avx(auVar149._16_16_,local_7e0);
          auStack_7d0 = auVar35._16_16_;
          auVar224 = vpcmpgtd_avx(auVar149._0_16_,local_7e0);
          auVar207._16_16_ = auVar188;
          auVar207._0_16_ = auVar224;
          local_7c0 = vblendps_avx(ZEXT1632(auVar224),auVar207,0xf0);
          auVar149 = vandnps_avx(local_7c0,local_6c0);
          auVar164 = local_6c0 & ~local_7c0;
          auVar352 = ZEXT464(0) << 0x20;
          auVar281 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
          auStack_798 = auVar34._8_24_;
          local_7a0 = uVar133;
          local_760 = auVar149;
          local_700 = local_780;
          if ((((((((auVar164 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar164 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar164 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar164 >> 0x7f,0) != '\0') ||
                (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar164 >> 0xbf,0) != '\0') ||
              (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar164[0x1f] < '\0') {
            local_8e0._4_4_ = local_4e0._4_4_ + local_9a0._4_4_;
            local_8e0._0_4_ = local_4e0._0_4_ + local_9a0._0_4_;
            fStack_8d8 = local_4e0._8_4_ + local_9a0._8_4_;
            fStack_8d4 = local_4e0._12_4_ + local_9a0._12_4_;
            fStack_8d0 = local_4e0._16_4_ + local_9a0._16_4_;
            fStack_8cc = local_4e0._20_4_ + local_9a0._20_4_;
            fStack_8c8 = local_4e0._24_4_ + local_9a0._24_4_;
            fStack_8c4 = local_4e0._28_4_ + fVar221;
            do {
              auVar268 = auVar281._0_16_;
              auVar208._8_4_ = 0x7f800000;
              auVar208._0_8_ = 0x7f8000007f800000;
              auVar208._12_4_ = 0x7f800000;
              auVar208._16_4_ = 0x7f800000;
              auVar208._20_4_ = 0x7f800000;
              auVar208._24_4_ = 0x7f800000;
              auVar208._28_4_ = 0x7f800000;
              auVar164 = vblendvps_avx(auVar208,local_4e0,auVar149);
              auVar32 = vshufps_avx(auVar164,auVar164,0xb1);
              auVar32 = vminps_avx(auVar164,auVar32);
              auVar198 = vshufpd_avx(auVar32,auVar32,5);
              auVar32 = vminps_avx(auVar32,auVar198);
              auVar198 = vperm2f128_avx(auVar32,auVar32,1);
              auVar32 = vminps_avx(auVar32,auVar198);
              auVar32 = vcmpps_avx(auVar164,auVar32,0);
              auVar198 = auVar149 & auVar32;
              auVar164 = auVar149;
              if ((((((((auVar198 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar198 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar198 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar198 >> 0x7f,0) != '\0') ||
                    (auVar198 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar198 >> 0xbf,0) != '\0') ||
                  (auVar198 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar198[0x1f] < '\0') {
                auVar164 = vandps_avx(auVar32,auVar149);
              }
              uVar130 = vmovmskps_avx(auVar164);
              uVar128 = 0;
              if (uVar130 != 0) {
                for (; (uVar130 >> uVar128 & 1) == 0; uVar128 = uVar128 + 1) {
                }
              }
              uVar133 = (ulong)uVar128;
              local_760 = auVar149;
              *(undefined4 *)(local_760 + uVar133 * 4) = 0;
              fVar179 = local_680[uVar133];
              uVar128 = *(uint *)(local_360 + uVar133 * 4);
              fVar260 = auVar183._0_4_;
              if ((float)local_9e0._0_4_ < 0.0) {
                fVar260 = sqrtf((float)local_9e0._0_4_);
                auVar268._8_4_ = 0x7fffffff;
                auVar268._0_8_ = 0x7fffffff7fffffff;
                auVar268._12_4_ = 0x7fffffff;
                auVar352 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              auVar454 = ZEXT464(uVar128);
              auVar439 = ZEXT464((uint)fVar179);
              auVar224 = vminps_avx(_local_ae0,_local_b00);
              auVar188 = vmaxps_avx(_local_ae0,_local_b00);
              auVar225 = vminps_avx(_local_af0,_local_b10);
              auVar141 = vminps_avx(auVar224,auVar225);
              auVar224 = vmaxps_avx(_local_af0,_local_b10);
              auVar225 = vmaxps_avx(auVar188,auVar224);
              auVar188 = vandps_avx(auVar141,auVar268);
              auVar224 = vandps_avx(auVar225,auVar268);
              auVar188 = vmaxps_avx(auVar188,auVar224);
              auVar224 = vmovshdup_avx(auVar188);
              auVar224 = vmaxss_avx(auVar224,auVar188);
              auVar188 = vshufpd_avx(auVar188,auVar188,1);
              auVar188 = vmaxss_avx(auVar188,auVar224);
              fVar179 = auVar188._0_4_ * 1.9073486e-06;
              local_a00._0_4_ = fVar260 * 1.9073486e-06;
              local_860._0_16_ = vshufps_avx(auVar225,auVar225,0xff);
              lVar129 = 4;
              do {
                fVar174 = auVar439._0_4_;
                fVar261 = 1.0 - fVar174;
                fVar260 = fVar261 * fVar261 * fVar261;
                fVar219 = fVar174 * fVar174;
                fVar244 = fVar174 * fVar219;
                fVar221 = fVar174 * fVar261;
                auVar188 = vshufps_avx(ZEXT416((uint)(fVar244 * 0.16666667)),
                                       ZEXT416((uint)(fVar244 * 0.16666667)),0);
                auVar224 = ZEXT416((uint)((fVar244 * 4.0 + fVar260 +
                                          fVar174 * fVar221 * 12.0 + fVar261 * fVar221 * 6.0) *
                                         0.16666667));
                auVar224 = vshufps_avx(auVar224,auVar224,0);
                auVar225 = ZEXT416((uint)((fVar260 * 4.0 + fVar244 +
                                          fVar261 * fVar221 * 12.0 + fVar174 * fVar221 * 6.0) *
                                         0.16666667));
                auVar225 = vshufps_avx(auVar225,auVar225,0);
                auVar141 = vshufps_avx(auVar454._0_16_,auVar454._0_16_,0);
                auVar226._0_4_ = auVar141._0_4_ * (float)local_9d0._0_4_ + 0.0;
                auVar226._4_4_ = auVar141._4_4_ * (float)local_9d0._4_4_ + 0.0;
                auVar226._8_4_ = auVar141._8_4_ * fStack_9c8 + 0.0;
                auVar226._12_4_ = auVar141._12_4_ * fStack_9c4 + 0.0;
                auVar141 = vshufps_avx(ZEXT416((uint)(fVar260 * 0.16666667)),
                                       ZEXT416((uint)(fVar260 * 0.16666667)),0);
                auVar139._0_4_ =
                     auVar141._0_4_ * (float)local_ae0._0_4_ +
                     auVar225._0_4_ * (float)local_b00._0_4_ +
                     auVar188._0_4_ * (float)local_b10._0_4_ +
                     auVar224._0_4_ * (float)local_af0._0_4_;
                auVar139._4_4_ =
                     auVar141._4_4_ * (float)local_ae0._4_4_ +
                     auVar225._4_4_ * (float)local_b00._4_4_ +
                     auVar188._4_4_ * (float)local_b10._4_4_ +
                     auVar224._4_4_ * (float)local_af0._4_4_;
                auVar139._8_4_ =
                     auVar141._8_4_ * fStack_ad8 +
                     auVar225._8_4_ * fStack_af8 +
                     auVar188._8_4_ * fStack_b08 + auVar224._8_4_ * fStack_ae8;
                auVar139._12_4_ =
                     auVar141._12_4_ * fStack_ad4 +
                     auVar225._12_4_ * fStack_af4 +
                     auVar188._12_4_ * fStack_b04 + auVar224._12_4_ * fStack_ae4;
                local_9c0._0_16_ = auVar139;
                auVar224 = vsubps_avx(auVar226,auVar139);
                auVar188 = vdpps_avx(auVar224,auVar224,0x7f);
                fVar260 = auVar188._0_4_;
                local_c80 = auVar454._0_4_;
                if (fVar260 < 0.0) {
                  local_aa0._0_4_ = fVar219;
                  fVar244 = sqrtf(fVar260);
                  auVar352 = ZEXT1664(ZEXT816(0) << 0x40);
                  fVar219 = (float)local_aa0._0_4_;
                }
                else {
                  auVar225 = vsqrtss_avx(auVar188,auVar188);
                  fVar244 = auVar225._0_4_;
                }
                auVar225 = vshufps_avx(ZEXT416((uint)(fVar219 * 0.5)),ZEXT416((uint)(fVar219 * 0.5))
                                       ,0);
                auVar141 = ZEXT416((uint)((fVar261 * fVar261 + fVar221 * 4.0) * 0.5));
                auVar141 = vshufps_avx(auVar141,auVar141,0);
                auVar184 = ZEXT416((uint)((fVar174 * -fVar174 - fVar221 * 4.0) * 0.5));
                auVar184 = vshufps_avx(auVar184,auVar184,0);
                auVar140 = ZEXT416((uint)(fVar261 * -fVar261 * 0.5));
                auVar140 = vshufps_avx(auVar140,auVar140,0);
                auVar413._0_4_ =
                     (float)local_ae0._0_4_ * auVar140._0_4_ +
                     (float)local_b00._0_4_ * auVar184._0_4_ +
                     (float)local_b10._0_4_ * auVar225._0_4_ +
                     (float)local_af0._0_4_ * auVar141._0_4_;
                auVar413._4_4_ =
                     (float)local_ae0._4_4_ * auVar140._4_4_ +
                     (float)local_b00._4_4_ * auVar184._4_4_ +
                     (float)local_b10._4_4_ * auVar225._4_4_ +
                     (float)local_af0._4_4_ * auVar141._4_4_;
                auVar413._8_4_ =
                     fStack_ad8 * auVar140._8_4_ +
                     fStack_af8 * auVar184._8_4_ +
                     fStack_b08 * auVar225._8_4_ + fStack_ae8 * auVar141._8_4_;
                auVar413._12_4_ =
                     fStack_ad4 * auVar140._12_4_ +
                     fStack_af4 * auVar184._12_4_ +
                     fStack_b04 * auVar225._12_4_ + fStack_ae4 * auVar141._12_4_;
                auVar225 = vshufps_avx(auVar439._0_16_,auVar439._0_16_,0);
                auVar141 = ZEXT416((uint)(fVar261 - (fVar174 + fVar174)));
                auVar184 = vshufps_avx(auVar141,auVar141,0);
                auVar141 = ZEXT416((uint)(fVar174 - (fVar261 + fVar261)));
                auVar140 = vshufps_avx(auVar141,auVar141,0);
                auVar10 = vshufps_avx(ZEXT416((uint)fVar261),ZEXT416((uint)fVar261),0);
                auVar141 = vdpps_avx(auVar413,auVar413,0x7f);
                auVar185._0_4_ =
                     (float)local_ae0._0_4_ * auVar10._0_4_ +
                     (float)local_b00._0_4_ * auVar140._0_4_ +
                     (float)local_b10._0_4_ * auVar225._0_4_ +
                     (float)local_af0._0_4_ * auVar184._0_4_;
                auVar185._4_4_ =
                     (float)local_ae0._4_4_ * auVar10._4_4_ +
                     (float)local_b00._4_4_ * auVar140._4_4_ +
                     (float)local_b10._4_4_ * auVar225._4_4_ +
                     (float)local_af0._4_4_ * auVar184._4_4_;
                auVar185._8_4_ =
                     fStack_ad8 * auVar10._8_4_ +
                     fStack_af8 * auVar140._8_4_ +
                     fStack_b08 * auVar225._8_4_ + fStack_ae8 * auVar184._8_4_;
                auVar185._12_4_ =
                     fStack_ad4 * auVar10._12_4_ +
                     fStack_af4 * auVar140._12_4_ +
                     fStack_b04 * auVar225._12_4_ + fStack_ae4 * auVar184._12_4_;
                auVar225 = vblendps_avx(auVar141,_DAT_01feba10,0xe);
                auVar184 = vrsqrtss_avx(auVar225,auVar225);
                fVar221 = auVar184._0_4_;
                fVar219 = auVar141._0_4_;
                auVar184 = vdpps_avx(auVar413,auVar185,0x7f);
                auVar140 = vshufps_avx(auVar141,auVar141,0);
                auVar186._0_4_ = auVar185._0_4_ * auVar140._0_4_;
                auVar186._4_4_ = auVar185._4_4_ * auVar140._4_4_;
                auVar186._8_4_ = auVar185._8_4_ * auVar140._8_4_;
                auVar186._12_4_ = auVar185._12_4_ * auVar140._12_4_;
                auVar184 = vshufps_avx(auVar184,auVar184,0);
                auVar269._0_4_ = auVar413._0_4_ * auVar184._0_4_;
                auVar269._4_4_ = auVar413._4_4_ * auVar184._4_4_;
                auVar269._8_4_ = auVar413._8_4_ * auVar184._8_4_;
                auVar269._12_4_ = auVar413._12_4_ * auVar184._12_4_;
                auVar10 = vsubps_avx(auVar186,auVar269);
                auVar184 = vrcpss_avx(auVar225,auVar225);
                auVar225 = vmaxss_avx(ZEXT416((uint)fVar179),
                                      ZEXT416((uint)(local_c80 * (float)local_a00._0_4_)));
                auVar184 = ZEXT416((uint)(auVar184._0_4_ * (2.0 - fVar219 * auVar184._0_4_)));
                auVar184 = vshufps_avx(auVar184,auVar184,0);
                uVar133 = CONCAT44(auVar413._4_4_,auVar413._0_4_);
                auVar291._0_8_ = uVar133 ^ 0x8000000080000000;
                auVar291._8_4_ = -auVar413._8_4_;
                auVar291._12_4_ = -auVar413._12_4_;
                auVar140 = ZEXT416((uint)(fVar221 * 1.5 +
                                         fVar219 * -0.5 * fVar221 * fVar221 * fVar221));
                auVar140 = vshufps_avx(auVar140,auVar140,0);
                auVar248._0_4_ = auVar140._0_4_ * auVar10._0_4_ * auVar184._0_4_;
                auVar248._4_4_ = auVar140._4_4_ * auVar10._4_4_ * auVar184._4_4_;
                auVar248._8_4_ = auVar140._8_4_ * auVar10._8_4_ * auVar184._8_4_;
                auVar248._12_4_ = auVar140._12_4_ * auVar10._12_4_ * auVar184._12_4_;
                auVar314._0_4_ = auVar413._0_4_ * auVar140._0_4_;
                auVar314._4_4_ = auVar413._4_4_ * auVar140._4_4_;
                auVar314._8_4_ = auVar413._8_4_ * auVar140._8_4_;
                auVar314._12_4_ = auVar413._12_4_ * auVar140._12_4_;
                if (fVar219 < 0.0) {
                  local_aa0._0_4_ = fVar244;
                  local_a20._0_16_ = auVar314;
                  local_a40._0_16_ = auVar248;
                  fVar219 = sqrtf(fVar219);
                  auVar352 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar248 = local_a40._0_16_;
                  auVar314 = local_a20._0_16_;
                }
                else {
                  auVar141 = vsqrtss_avx(auVar141,auVar141);
                  fVar219 = auVar141._0_4_;
                  local_aa0._0_4_ = fVar244;
                }
                auVar141 = vdpps_avx(auVar224,auVar314,0x7f);
                fVar219 = (fVar179 / fVar219) * ((float)local_aa0._0_4_ + 1.0) +
                          auVar225._0_4_ + (float)local_aa0._0_4_ * fVar179;
                auVar184 = vdpps_avx(auVar291,auVar314,0x7f);
                auVar140 = vdpps_avx(auVar224,auVar248,0x7f);
                auVar10 = vdpps_avx(_local_9d0,auVar314,0x7f);
                auVar11 = vdpps_avx(auVar224,auVar291,0x7f);
                fVar244 = auVar184._0_4_ + auVar140._0_4_;
                fVar221 = auVar141._0_4_;
                auVar142._0_4_ = fVar221 * fVar221;
                auVar142._4_4_ = auVar141._4_4_ * auVar141._4_4_;
                auVar142._8_4_ = auVar141._8_4_ * auVar141._8_4_;
                auVar142._12_4_ = auVar141._12_4_ * auVar141._12_4_;
                auVar140 = vsubps_avx(auVar188,auVar142);
                local_aa0._0_16_ = ZEXT416((uint)fVar244);
                auVar184 = vdpps_avx(auVar224,_local_9d0,0x7f);
                fVar261 = auVar11._0_4_ - fVar221 * fVar244;
                fVar221 = auVar184._0_4_ - fVar221 * auVar10._0_4_;
                auVar184 = vrsqrtss_avx(auVar140,auVar140);
                fVar262 = auVar140._0_4_;
                fVar244 = auVar184._0_4_;
                fVar244 = fVar244 * 1.5 + fVar262 * -0.5 * fVar244 * fVar244 * fVar244;
                if (fVar262 < 0.0) {
                  local_a20._0_4_ = fVar219;
                  local_a40._0_16_ = auVar10;
                  local_800._0_4_ = fVar261;
                  local_820._0_4_ = fVar221;
                  local_840._0_4_ = fVar244;
                  fVar262 = sqrtf(fVar262);
                  auVar352 = ZEXT1664(ZEXT816(0) << 0x40);
                  fVar219 = (float)local_a20._0_4_;
                  fVar244 = (float)local_840._0_4_;
                  fVar261 = (float)local_800._0_4_;
                  fVar221 = (float)local_820._0_4_;
                  auVar10 = local_a40._0_16_;
                }
                else {
                  auVar184 = vsqrtss_avx(auVar140,auVar140);
                  fVar262 = auVar184._0_4_;
                }
                auVar421 = ZEXT1664(auVar413);
                auVar140 = vpermilps_avx(local_9c0._0_16_,0xff);
                auVar11 = vshufps_avx(auVar413,auVar413,0xff);
                fVar261 = fVar261 * fVar244 - auVar11._0_4_;
                auVar270._0_8_ = auVar10._0_8_ ^ 0x8000000080000000;
                auVar270._8_4_ = auVar10._8_4_ ^ 0x80000000;
                auVar270._12_4_ = auVar10._12_4_ ^ 0x80000000;
                auVar292._0_4_ = -fVar261;
                auVar292._4_4_ = 0x80000000;
                auVar292._8_4_ = 0x80000000;
                auVar292._12_4_ = 0x80000000;
                auVar431 = ZEXT1664(local_aa0._0_16_);
                auVar184 = vinsertps_avx(ZEXT416((uint)(fVar221 * fVar244)),auVar270,0x10);
                auVar10 = vmovsldup_avx(ZEXT416((uint)(local_aa0._0_4_ * fVar221 * fVar244 -
                                                      auVar10._0_4_ * fVar261)));
                auVar184 = vdivps_avx(auVar184,auVar10);
                auVar187 = ZEXT416((uint)(fVar262 - auVar140._0_4_));
                auVar140 = vinsertps_avx(auVar141,auVar187,0x10);
                auVar249._0_4_ = auVar140._0_4_ * auVar184._0_4_;
                auVar249._4_4_ = auVar140._4_4_ * auVar184._4_4_;
                auVar249._8_4_ = auVar140._8_4_ * auVar184._8_4_;
                auVar249._12_4_ = auVar140._12_4_ * auVar184._12_4_;
                auVar184 = vinsertps_avx(auVar292,local_aa0._0_16_,0x1c);
                auVar184 = vdivps_avx(auVar184,auVar10);
                auVar227._0_4_ = auVar140._0_4_ * auVar184._0_4_;
                auVar227._4_4_ = auVar140._4_4_ * auVar184._4_4_;
                auVar227._8_4_ = auVar140._8_4_ * auVar184._8_4_;
                auVar227._12_4_ = auVar140._12_4_ * auVar184._12_4_;
                auVar184 = vhaddps_avx(auVar249,auVar249);
                auVar140 = vhaddps_avx(auVar227,auVar227);
                fVar174 = fVar174 - auVar184._0_4_;
                local_c80 = local_c80 - auVar140._0_4_;
                auVar454 = ZEXT464((uint)local_c80);
                auVar271._8_4_ = 0x7fffffff;
                auVar271._0_8_ = 0x7fffffff7fffffff;
                auVar271._12_4_ = 0x7fffffff;
                auVar281 = ZEXT1664(auVar271);
                auVar141 = vandps_avx(auVar141,auVar271);
                if (fVar219 <= auVar141._0_4_) {
LAB_0122079c:
                  bVar101 = false;
                }
                else {
                  auVar141 = vandps_avx(auVar187,auVar271);
                  if ((float)local_860._0_4_ * 1.9073486e-06 + auVar225._0_4_ + fVar219 <=
                      auVar141._0_4_) goto LAB_0122079c;
                  local_c80 = local_c80 + (float)local_960._0_4_;
                  auVar454 = ZEXT464((uint)local_c80);
                  bVar101 = true;
                  if ((((fVar245 <= local_c80) &&
                       (fVar219 = *(float *)(ray + k * 4 + 0x100), local_c80 <= fVar219)) &&
                      (0.0 <= fVar174)) && (fVar174 <= 1.0)) {
                    auVar188 = vrsqrtss_avx(auVar188,auVar188);
                    fVar244 = auVar188._0_4_;
                    pGVar26 = (context->scene->geometries).items[uVar126].ptr;
                    if ((pGVar26->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      auVar188 = ZEXT416((uint)(fVar244 * 1.5 +
                                               fVar260 * -0.5 * fVar244 * fVar244 * fVar244));
                      auVar188 = vshufps_avx(auVar188,auVar188,0);
                      local_bc0 = auVar224._0_4_;
                      fStack_bbc = auVar224._4_4_;
                      fStack_bb8 = auVar224._8_4_;
                      fStack_bb4 = auVar224._12_4_;
                      auVar189._0_4_ = auVar188._0_4_ * local_bc0;
                      auVar189._4_4_ = auVar188._4_4_ * fStack_bbc;
                      auVar189._8_4_ = auVar188._8_4_ * fStack_bb8;
                      auVar189._12_4_ = auVar188._12_4_ * fStack_bb4;
                      auVar143._0_4_ = auVar413._0_4_ + auVar11._0_4_ * auVar189._0_4_;
                      auVar143._4_4_ = auVar413._4_4_ + auVar11._4_4_ * auVar189._4_4_;
                      auVar143._8_4_ = auVar413._8_4_ + auVar11._8_4_ * auVar189._8_4_;
                      auVar143._12_4_ = auVar413._12_4_ + auVar11._12_4_ * auVar189._12_4_;
                      auVar188 = vshufps_avx(auVar189,auVar189,0xc9);
                      auVar224 = vshufps_avx(auVar413,auVar413,0xc9);
                      auVar190._0_4_ = auVar224._0_4_ * auVar189._0_4_;
                      auVar190._4_4_ = auVar224._4_4_ * auVar189._4_4_;
                      auVar190._8_4_ = auVar224._8_4_ * auVar189._8_4_;
                      auVar190._12_4_ = auVar224._12_4_ * auVar189._12_4_;
                      auVar228._0_4_ = auVar413._0_4_ * auVar188._0_4_;
                      auVar228._4_4_ = auVar413._4_4_ * auVar188._4_4_;
                      auVar228._8_4_ = auVar413._8_4_ * auVar188._8_4_;
                      auVar228._12_4_ = auVar413._12_4_ * auVar188._12_4_;
                      auVar225 = vsubps_avx(auVar228,auVar190);
                      auVar188 = vshufps_avx(auVar225,auVar225,0xc9);
                      auVar224 = vshufps_avx(auVar143,auVar143,0xc9);
                      auVar229._0_4_ = auVar224._0_4_ * auVar188._0_4_;
                      auVar229._4_4_ = auVar224._4_4_ * auVar188._4_4_;
                      auVar229._8_4_ = auVar224._8_4_ * auVar188._8_4_;
                      auVar229._12_4_ = auVar224._12_4_ * auVar188._12_4_;
                      auVar188 = vshufps_avx(auVar225,auVar225,0xd2);
                      auVar144._0_4_ = auVar143._0_4_ * auVar188._0_4_;
                      auVar144._4_4_ = auVar143._4_4_ * auVar188._4_4_;
                      auVar144._8_4_ = auVar143._8_4_ * auVar188._8_4_;
                      auVar144._12_4_ = auVar143._12_4_ * auVar188._12_4_;
                      auVar188 = vsubps_avx(auVar229,auVar144);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar26->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x100) = local_c80;
                        uVar8 = vextractps_avx(auVar188,1);
                        *(undefined4 *)(ray + k * 4 + 0x180) = uVar8;
                        uVar8 = vextractps_avx(auVar188,2);
                        *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar8;
                        *(int *)(ray + k * 4 + 0x1c0) = auVar188._0_4_;
                        *(float *)(ray + k * 4 + 0x1e0) = fVar174;
                        *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                        *(int *)(ray + k * 4 + 0x220) = (int)local_a68;
                        *(uint *)(ray + k * 4 + 0x240) = uVar126;
                        *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      }
                      else {
                        pRVar30 = context->user;
                        auStack_5f0 = vshufps_avx(ZEXT416((uint)fVar174),ZEXT416((uint)fVar174),0);
                        auStack_650 = vshufps_avx(auVar188,auVar188,0x55);
                        auStack_630 = vshufps_avx(auVar188,auVar188,0xaa);
                        auStack_610 = vshufps_avx(auVar188,auVar188,0);
                        local_660 = (RTCHitN  [16])auStack_650;
                        local_640 = auStack_630;
                        local_620 = auStack_610;
                        local_600 = auStack_5f0;
                        local_5e0 = ZEXT832(0) << 0x20;
                        local_5c0 = local_520._0_8_;
                        uStack_5b8 = local_520._8_8_;
                        uStack_5b0 = local_520._16_8_;
                        uStack_5a8 = local_520._24_8_;
                        local_5a0 = local_500._0_8_;
                        uStack_598 = local_500._8_8_;
                        uStack_590 = local_500._16_8_;
                        uStack_588 = local_500._24_8_;
                        local_a70[1] = local_a60;
                        *local_a70 = local_a60;
                        local_580 = pRVar30->instID[0];
                        uStack_57c = local_580;
                        uStack_578 = local_580;
                        uStack_574 = local_580;
                        uStack_570 = local_580;
                        uStack_56c = local_580;
                        uStack_568 = local_580;
                        uStack_564 = local_580;
                        local_560 = pRVar30->instPrimID[0];
                        uStack_55c = local_560;
                        uStack_558 = local_560;
                        uStack_554 = local_560;
                        uStack_550 = local_560;
                        uStack_54c = local_560;
                        uStack_548 = local_560;
                        uStack_544 = local_560;
                        *(float *)(ray + k * 4 + 0x100) = local_c80;
                        local_b40 = *local_a78;
                        uStack_b38 = local_a78[1];
                        local_b30 = *local_a80;
                        uStack_b28 = local_a80[1];
                        local_ad0.valid = (int *)&local_b40;
                        local_ad0.geometryUserPtr = pGVar26->userPtr;
                        local_ad0.context = context->user;
                        local_ad0.hit = local_660;
                        local_ad0.N = 8;
                        local_ad0.ray = (RTCRayN *)ray;
                        if (pGVar26->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar421 = ZEXT1664(auVar413);
                          auVar431 = ZEXT1664(local_aa0._0_16_);
                          (*pGVar26->intersectionFilterN)(&local_ad0);
                        }
                        auVar114._8_8_ = uStack_b38;
                        auVar114._0_8_ = local_b40;
                        auVar188 = vpcmpeqd_avx((undefined1  [16])0x0,auVar114);
                        auVar118._8_8_ = uStack_b28;
                        auVar118._0_8_ = local_b30;
                        auVar224 = vpcmpeqd_avx((undefined1  [16])0x0,auVar118);
                        auVar156._16_16_ = auVar224;
                        auVar156._0_16_ = auVar188;
                        auVar149 = local_a60 & ~auVar156;
                        if ((((((((auVar149 >> 0x1f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0 &&
                                 (auVar149 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 ) && (auVar149 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar149 >> 0x7f,0) == '\0')
                              && (auVar149 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                              ) && SUB321(auVar149 >> 0xbf,0) == '\0') &&
                            (auVar149 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar149[0x1f]) {
                          auVar157._0_4_ = auVar188._0_4_ ^ local_a60._0_4_;
                          auVar157._4_4_ = auVar188._4_4_ ^ local_a60._4_4_;
                          auVar157._8_4_ = auVar188._8_4_ ^ local_a60._8_4_;
                          auVar157._12_4_ = auVar188._12_4_ ^ local_a60._12_4_;
                          auVar157._16_4_ = auVar224._0_4_ ^ local_a60._16_4_;
                          auVar157._20_4_ = auVar224._4_4_ ^ local_a60._20_4_;
                          auVar157._24_4_ = auVar224._8_4_ ^ local_a60._24_4_;
                          auVar157._28_4_ = auVar224._12_4_ ^ local_a60._28_4_;
                          auVar352 = ZEXT864(0);
                          auVar281 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        }
                        else {
                          p_Var31 = context->args->filter;
                          auVar352 = ZEXT1664(ZEXT816(0));
                          auVar281 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          if ((p_Var31 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar26->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar421 = ZEXT1664(auVar421._0_16_);
                            auVar431 = ZEXT1664(auVar431._0_16_);
                            (*p_Var31)(&local_ad0);
                            auVar281 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                            auVar352 = ZEXT1664(ZEXT816(0) << 0x40);
                          }
                          auVar115._8_8_ = uStack_b38;
                          auVar115._0_8_ = local_b40;
                          auVar188 = vpcmpeqd_avx((undefined1  [16])0x0,auVar115);
                          auVar119._8_8_ = uStack_b28;
                          auVar119._0_8_ = local_b30;
                          auVar224 = vpcmpeqd_avx((undefined1  [16])0x0,auVar119);
                          auVar209._16_16_ = auVar224;
                          auVar209._0_16_ = auVar188;
                          auVar157._0_4_ = auVar188._0_4_ ^ local_a60._0_4_;
                          auVar157._4_4_ = auVar188._4_4_ ^ local_a60._4_4_;
                          auVar157._8_4_ = auVar188._8_4_ ^ local_a60._8_4_;
                          auVar157._12_4_ = auVar188._12_4_ ^ local_a60._12_4_;
                          auVar157._16_4_ = auVar224._0_4_ ^ local_a60._16_4_;
                          auVar157._20_4_ = auVar224._4_4_ ^ local_a60._20_4_;
                          auVar157._24_4_ = auVar224._8_4_ ^ local_a60._24_4_;
                          auVar157._28_4_ = auVar224._12_4_ ^ local_a60._28_4_;
                          auVar149 = local_a60 & ~auVar209;
                          if ((((((((auVar149 >> 0x1f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0 ||
                                   (auVar149 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar149 >> 0x5f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) || SUB321(auVar149 >> 0x7f,0) != '\0') ||
                                (auVar149 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                               || SUB321(auVar149 >> 0xbf,0) != '\0') ||
                              (auVar149 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                              || auVar149[0x1f] < '\0') {
                            auVar149 = vmaskmovps_avx(auVar157,*(undefined1 (*) [32])local_ad0.hit);
                            *(undefined1 (*) [32])(local_ad0.ray + 0x180) = auVar149;
                            auVar149 = vmaskmovps_avx(auVar157,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0x20));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x1a0) = auVar149;
                            auVar149 = vmaskmovps_avx(auVar157,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0x40));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x1c0) = auVar149;
                            auVar149 = vmaskmovps_avx(auVar157,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0x60));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x1e0) = auVar149;
                            auVar149 = vmaskmovps_avx(auVar157,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0x80));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x200) = auVar149;
                            auVar149 = vmaskmovps_avx(auVar157,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0xa0));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x220) = auVar149;
                            auVar149 = vmaskmovps_avx(auVar157,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0xc0));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x240) = auVar149;
                            auVar149 = vmaskmovps_avx(auVar157,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0xe0));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x260) = auVar149;
                            auVar149 = vmaskmovps_avx(auVar157,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0x100));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x280) = auVar149;
                          }
                        }
                        auVar454 = ZEXT464((uint)local_c80);
                        if ((((((((auVar157 >> 0x1f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0 &&
                                 (auVar157 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 ) && (auVar157 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar157 >> 0x7f,0) == '\0')
                              && (auVar157 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                              ) && SUB321(auVar157 >> 0xbf,0) == '\0') &&
                            (auVar157 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar157[0x1f]) {
                          *(float *)(ray + k * 4 + 0x100) = fVar219;
                        }
                      }
                    }
                  }
                }
                auVar439 = ZEXT464((uint)fVar174);
                bVar135 = lVar129 != 0;
                lVar129 = lVar129 + -1;
              } while ((!bVar101) && (bVar135));
              uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar158._4_4_ = uVar8;
              auVar158._0_4_ = uVar8;
              auVar158._8_4_ = uVar8;
              auVar158._12_4_ = uVar8;
              auVar158._16_4_ = uVar8;
              auVar158._20_4_ = uVar8;
              auVar158._24_4_ = uVar8;
              auVar158._28_4_ = uVar8;
              auVar164 = vcmpps_avx(_local_8e0,auVar158,2);
              auVar149 = vandps_avx(auVar164,local_760);
              auVar164 = local_760 & auVar164;
              auVar323 = ZEXT3264(local_9a0);
              uVar133 = local_7a0;
              local_760 = auVar149;
            } while ((((((((auVar164 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar164 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar164 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar164 >> 0x7f,0) != '\0') ||
                       (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar164 >> 0xbf,0) != '\0') ||
                     (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar164[0x1f] < '\0');
          }
          auVar159._0_4_ =
               (float)local_900._0_4_ * (float)local_880._0_4_ +
               (float)local_920._0_4_ * (float)local_8a0._0_4_ +
               (float)local_940._0_4_ * (float)local_8c0._0_4_;
          auVar159._4_4_ =
               (float)local_900._4_4_ * (float)local_880._4_4_ +
               (float)local_920._4_4_ * (float)local_8a0._4_4_ +
               (float)local_940._4_4_ * (float)local_8c0._4_4_;
          auVar159._8_4_ =
               fStack_8f8 * fStack_878 + fStack_918 * fStack_898 + fStack_938 * fStack_8b8;
          auVar159._12_4_ =
               fStack_8f4 * fStack_874 + fStack_914 * fStack_894 + fStack_934 * fStack_8b4;
          auVar159._16_4_ =
               fStack_8f0 * fStack_870 + fStack_910 * fStack_890 + fStack_930 * fStack_8b0;
          auVar159._20_4_ =
               fStack_8ec * fStack_86c + fStack_90c * fStack_88c + fStack_92c * fStack_8ac;
          auVar159._24_4_ =
               fStack_8e8 * fStack_868 + fStack_908 * fStack_888 + fStack_928 * fStack_8a8;
          auVar159._28_4_ = fStack_8e4 + fStack_904 + fStack_924;
          auVar210._8_4_ = 0x7fffffff;
          auVar210._0_8_ = 0x7fffffff7fffffff;
          auVar210._12_4_ = 0x7fffffff;
          auVar210._16_4_ = 0x7fffffff;
          auVar210._20_4_ = 0x7fffffff;
          auVar210._24_4_ = 0x7fffffff;
          auVar210._28_4_ = 0x7fffffff;
          auVar149 = vandps_avx(auVar159,auVar210);
          auVar211._8_4_ = 0x3e99999a;
          auVar211._0_8_ = 0x3e99999a3e99999a;
          auVar211._12_4_ = 0x3e99999a;
          auVar211._16_4_ = 0x3e99999a;
          auVar211._20_4_ = 0x3e99999a;
          auVar211._24_4_ = 0x3e99999a;
          auVar211._28_4_ = 0x3e99999a;
          auVar149 = vcmpps_avx(auVar149,auVar211,1);
          auVar164 = vorps_avx(auVar149,local_740);
          auVar212._0_4_ = auVar323._0_4_ + (float)local_6e0._0_4_;
          auVar212._4_4_ = auVar323._4_4_ + (float)local_6e0._4_4_;
          auVar212._8_4_ = auVar323._8_4_ + fStack_6d8;
          auVar212._12_4_ = auVar323._12_4_ + fStack_6d4;
          auVar212._16_4_ = auVar323._16_4_ + fStack_6d0;
          auVar212._20_4_ = auVar323._20_4_ + fStack_6cc;
          auVar212._24_4_ = auVar323._24_4_ + fStack_6c8;
          auVar212._28_4_ = auVar323._28_4_ + fStack_6c4;
          uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar240._4_4_ = uVar8;
          auVar240._0_4_ = uVar8;
          auVar240._8_4_ = uVar8;
          auVar240._12_4_ = uVar8;
          auVar240._16_4_ = uVar8;
          auVar240._20_4_ = uVar8;
          auVar240._24_4_ = uVar8;
          auVar240._28_4_ = uVar8;
          auVar149 = vcmpps_avx(auVar212,auVar240,2);
          _local_920 = vandps_avx(auVar149,local_700);
          auVar213._8_4_ = 3;
          auVar213._0_8_ = 0x300000003;
          auVar213._12_4_ = 3;
          auVar213._16_4_ = 3;
          auVar213._20_4_ = 3;
          auVar213._24_4_ = 3;
          auVar213._28_4_ = 3;
          auVar241._8_4_ = 2;
          auVar241._0_8_ = 0x200000002;
          auVar241._12_4_ = 2;
          auVar241._16_4_ = 2;
          auVar241._20_4_ = 2;
          auVar241._24_4_ = 2;
          auVar241._28_4_ = 2;
          auVar149 = vblendvps_avx(auVar241,auVar213,auVar164);
          auVar188 = vpcmpgtd_avx(auVar149._16_16_,local_7e0);
          auVar224 = vpshufd_avx(local_720._0_16_,0);
          auVar224 = vpcmpgtd_avx(auVar149._0_16_,auVar224);
          auVar214._16_16_ = auVar188;
          auVar214._0_16_ = auVar224;
          _local_940 = vblendps_avx(ZEXT1632(auVar224),auVar214,0xf0);
          auVar149 = vandnps_avx(_local_940,_local_920);
          auVar164 = _local_920 & ~_local_940;
          if ((((((((auVar164 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar164 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar164 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar164 >> 0x7f,0) != '\0') ||
                (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar164 >> 0xbf,0) != '\0') ||
              (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar164[0x1f] < '\0') {
            _local_8e0 = _local_320;
            local_900._4_4_ = auVar323._4_4_ + (float)local_320._4_4_;
            local_900._0_4_ = auVar323._0_4_ + (float)local_320._0_4_;
            fStack_8f8 = auVar323._8_4_ + fStack_318;
            fStack_8f4 = auVar323._12_4_ + fStack_314;
            fStack_8f0 = auVar323._16_4_ + fStack_310;
            fStack_8ec = auVar323._20_4_ + fStack_30c;
            fStack_8e8 = auVar323._24_4_ + fStack_308;
            fStack_8e4 = auVar323._28_4_ + fStack_304;
            do {
              auVar272 = auVar281._0_16_;
              auVar215._8_4_ = 0x7f800000;
              auVar215._0_8_ = 0x7f8000007f800000;
              auVar215._12_4_ = 0x7f800000;
              auVar215._16_4_ = 0x7f800000;
              auVar215._20_4_ = 0x7f800000;
              auVar215._24_4_ = 0x7f800000;
              auVar215._28_4_ = 0x7f800000;
              auVar164 = vblendvps_avx(auVar215,_local_8e0,auVar149);
              auVar32 = vshufps_avx(auVar164,auVar164,0xb1);
              auVar32 = vminps_avx(auVar164,auVar32);
              auVar198 = vshufpd_avx(auVar32,auVar32,5);
              auVar32 = vminps_avx(auVar32,auVar198);
              auVar198 = vperm2f128_avx(auVar32,auVar32,1);
              auVar32 = vminps_avx(auVar32,auVar198);
              auVar32 = vcmpps_avx(auVar164,auVar32,0);
              auVar198 = auVar149 & auVar32;
              auVar164 = auVar149;
              if ((((((((auVar198 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar198 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar198 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar198 >> 0x7f,0) != '\0') ||
                    (auVar198 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar198 >> 0xbf,0) != '\0') ||
                  (auVar198 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar198[0x1f] < '\0') {
                auVar164 = vandps_avx(auVar32,auVar149);
              }
              uVar130 = vmovmskps_avx(auVar164);
              uVar128 = 0;
              if (uVar130 != 0) {
                for (; (uVar130 >> uVar128 & 1) == 0; uVar128 = uVar128 + 1) {
                }
              }
              uVar133 = (ulong)uVar128;
              local_780 = auVar149;
              *(undefined4 *)(local_780 + uVar133 * 4) = 0;
              fVar179 = local_6a0[uVar133];
              uVar128 = *(uint *)(local_300 + uVar133 * 4);
              fVar260 = auVar36._0_4_;
              if ((float)local_9e0._0_4_ < 0.0) {
                fVar260 = sqrtf((float)local_9e0._0_4_);
                auVar272._8_4_ = 0x7fffffff;
                auVar272._0_8_ = 0x7fffffff7fffffff;
                auVar272._12_4_ = 0x7fffffff;
                auVar352 = ZEXT1664(ZEXT816(0) << 0x40);
              }
              auVar439 = ZEXT464(uVar128);
              auVar431 = ZEXT464((uint)fVar179);
              auVar224 = vminps_avx(_local_ae0,_local_b00);
              auVar188 = vmaxps_avx(_local_ae0,_local_b00);
              auVar225 = vminps_avx(_local_af0,_local_b10);
              auVar141 = vminps_avx(auVar224,auVar225);
              auVar224 = vmaxps_avx(_local_af0,_local_b10);
              auVar225 = vmaxps_avx(auVar188,auVar224);
              auVar188 = vandps_avx(auVar141,auVar272);
              auVar224 = vandps_avx(auVar225,auVar272);
              auVar188 = vmaxps_avx(auVar188,auVar224);
              auVar224 = vmovshdup_avx(auVar188);
              auVar224 = vmaxss_avx(auVar224,auVar188);
              auVar188 = vshufpd_avx(auVar188,auVar188,1);
              auVar188 = vmaxss_avx(auVar188,auVar224);
              fVar179 = auVar188._0_4_ * 1.9073486e-06;
              local_aa0._0_4_ = fVar260 * 1.9073486e-06;
              local_860._0_16_ = vshufps_avx(auVar225,auVar225,0xff);
              lVar129 = 4;
              do {
                fVar174 = auVar431._0_4_;
                fVar261 = 1.0 - fVar174;
                fVar260 = fVar261 * fVar261 * fVar261;
                fVar219 = fVar174 * fVar174;
                fVar244 = fVar174 * fVar219;
                fVar221 = fVar174 * fVar261;
                auVar188 = vshufps_avx(ZEXT416((uint)(fVar244 * 0.16666667)),
                                       ZEXT416((uint)(fVar244 * 0.16666667)),0);
                auVar224 = ZEXT416((uint)((fVar244 * 4.0 + fVar260 +
                                          fVar174 * fVar221 * 12.0 + fVar261 * fVar221 * 6.0) *
                                         0.16666667));
                auVar224 = vshufps_avx(auVar224,auVar224,0);
                auVar225 = ZEXT416((uint)((fVar260 * 4.0 + fVar244 +
                                          fVar261 * fVar221 * 12.0 + fVar174 * fVar221 * 6.0) *
                                         0.16666667));
                auVar225 = vshufps_avx(auVar225,auVar225,0);
                auVar141 = vshufps_avx(auVar439._0_16_,auVar439._0_16_,0);
                auVar230._0_4_ = auVar141._0_4_ * (float)local_9d0._0_4_ + 0.0;
                auVar230._4_4_ = auVar141._4_4_ * (float)local_9d0._4_4_ + 0.0;
                auVar230._8_4_ = auVar141._8_4_ * fStack_9c8 + 0.0;
                auVar230._12_4_ = auVar141._12_4_ * fStack_9c4 + 0.0;
                auVar141 = vshufps_avx(ZEXT416((uint)(fVar260 * 0.16666667)),
                                       ZEXT416((uint)(fVar260 * 0.16666667)),0);
                auVar145._0_4_ =
                     auVar141._0_4_ * (float)local_ae0._0_4_ +
                     auVar225._0_4_ * (float)local_b00._0_4_ +
                     auVar188._0_4_ * (float)local_b10._0_4_ +
                     auVar224._0_4_ * (float)local_af0._0_4_;
                auVar145._4_4_ =
                     auVar141._4_4_ * (float)local_ae0._4_4_ +
                     auVar225._4_4_ * (float)local_b00._4_4_ +
                     auVar188._4_4_ * (float)local_b10._4_4_ +
                     auVar224._4_4_ * (float)local_af0._4_4_;
                auVar145._8_4_ =
                     auVar141._8_4_ * fStack_ad8 +
                     auVar225._8_4_ * fStack_af8 +
                     auVar188._8_4_ * fStack_b08 + auVar224._8_4_ * fStack_ae8;
                auVar145._12_4_ =
                     auVar141._12_4_ * fStack_ad4 +
                     auVar225._12_4_ * fStack_af4 +
                     auVar188._12_4_ * fStack_b04 + auVar224._12_4_ * fStack_ae4;
                local_9c0._0_16_ = auVar145;
                auVar224 = vsubps_avx(auVar230,auVar145);
                auVar188 = vdpps_avx(auVar224,auVar224,0x7f);
                fVar260 = auVar188._0_4_;
                local_c80 = auVar439._0_4_;
                if (fVar260 < 0.0) {
                  local_a00._0_4_ = fVar219;
                  fVar244 = sqrtf(fVar260);
                  auVar352 = ZEXT1664(ZEXT816(0) << 0x40);
                  fVar219 = (float)local_a00._0_4_;
                }
                else {
                  auVar225 = vsqrtss_avx(auVar188,auVar188);
                  fVar244 = auVar225._0_4_;
                }
                auVar225 = vshufps_avx(ZEXT416((uint)(fVar219 * 0.5)),ZEXT416((uint)(fVar219 * 0.5))
                                       ,0);
                auVar141 = ZEXT416((uint)((fVar261 * fVar261 + fVar221 * 4.0) * 0.5));
                auVar141 = vshufps_avx(auVar141,auVar141,0);
                auVar184 = ZEXT416((uint)((fVar174 * -fVar174 - fVar221 * 4.0) * 0.5));
                auVar184 = vshufps_avx(auVar184,auVar184,0);
                auVar140 = ZEXT416((uint)(fVar261 * -fVar261 * 0.5));
                auVar140 = vshufps_avx(auVar140,auVar140,0);
                auVar414._0_4_ =
                     (float)local_ae0._0_4_ * auVar140._0_4_ +
                     (float)local_b00._0_4_ * auVar184._0_4_ +
                     (float)local_b10._0_4_ * auVar225._0_4_ +
                     (float)local_af0._0_4_ * auVar141._0_4_;
                auVar414._4_4_ =
                     (float)local_ae0._4_4_ * auVar140._4_4_ +
                     (float)local_b00._4_4_ * auVar184._4_4_ +
                     (float)local_b10._4_4_ * auVar225._4_4_ +
                     (float)local_af0._4_4_ * auVar141._4_4_;
                auVar414._8_4_ =
                     fStack_ad8 * auVar140._8_4_ +
                     fStack_af8 * auVar184._8_4_ +
                     fStack_b08 * auVar225._8_4_ + fStack_ae8 * auVar141._8_4_;
                auVar414._12_4_ =
                     fStack_ad4 * auVar140._12_4_ +
                     fStack_af4 * auVar184._12_4_ +
                     fStack_b04 * auVar225._12_4_ + fStack_ae4 * auVar141._12_4_;
                auVar225 = vshufps_avx(auVar431._0_16_,auVar431._0_16_,0);
                auVar141 = ZEXT416((uint)(fVar261 - (fVar174 + fVar174)));
                auVar184 = vshufps_avx(auVar141,auVar141,0);
                auVar141 = ZEXT416((uint)(fVar174 - (fVar261 + fVar261)));
                auVar140 = vshufps_avx(auVar141,auVar141,0);
                auVar10 = vshufps_avx(ZEXT416((uint)fVar261),ZEXT416((uint)fVar261),0);
                auVar141 = vdpps_avx(auVar414,auVar414,0x7f);
                auVar191._0_4_ =
                     (float)local_ae0._0_4_ * auVar10._0_4_ +
                     (float)local_b00._0_4_ * auVar140._0_4_ +
                     (float)local_b10._0_4_ * auVar225._0_4_ +
                     (float)local_af0._0_4_ * auVar184._0_4_;
                auVar191._4_4_ =
                     (float)local_ae0._4_4_ * auVar10._4_4_ +
                     (float)local_b00._4_4_ * auVar140._4_4_ +
                     (float)local_b10._4_4_ * auVar225._4_4_ +
                     (float)local_af0._4_4_ * auVar184._4_4_;
                auVar191._8_4_ =
                     fStack_ad8 * auVar10._8_4_ +
                     fStack_af8 * auVar140._8_4_ +
                     fStack_b08 * auVar225._8_4_ + fStack_ae8 * auVar184._8_4_;
                auVar191._12_4_ =
                     fStack_ad4 * auVar10._12_4_ +
                     fStack_af4 * auVar140._12_4_ +
                     fStack_b04 * auVar225._12_4_ + fStack_ae4 * auVar184._12_4_;
                auVar225 = vblendps_avx(auVar141,_DAT_01feba10,0xe);
                auVar184 = vrsqrtss_avx(auVar225,auVar225);
                fVar221 = auVar184._0_4_;
                fVar219 = auVar141._0_4_;
                auVar184 = vdpps_avx(auVar414,auVar191,0x7f);
                auVar140 = vshufps_avx(auVar141,auVar141,0);
                auVar192._0_4_ = auVar191._0_4_ * auVar140._0_4_;
                auVar192._4_4_ = auVar191._4_4_ * auVar140._4_4_;
                auVar192._8_4_ = auVar191._8_4_ * auVar140._8_4_;
                auVar192._12_4_ = auVar191._12_4_ * auVar140._12_4_;
                auVar184 = vshufps_avx(auVar184,auVar184,0);
                auVar273._0_4_ = auVar414._0_4_ * auVar184._0_4_;
                auVar273._4_4_ = auVar414._4_4_ * auVar184._4_4_;
                auVar273._8_4_ = auVar414._8_4_ * auVar184._8_4_;
                auVar273._12_4_ = auVar414._12_4_ * auVar184._12_4_;
                auVar10 = vsubps_avx(auVar192,auVar273);
                auVar184 = vrcpss_avx(auVar225,auVar225);
                auVar225 = vmaxss_avx(ZEXT416((uint)fVar179),
                                      ZEXT416((uint)(local_c80 * (float)local_aa0._0_4_)));
                auVar454 = ZEXT1664(auVar225);
                auVar184 = ZEXT416((uint)(auVar184._0_4_ * (2.0 - fVar219 * auVar184._0_4_)));
                auVar184 = vshufps_avx(auVar184,auVar184,0);
                uVar133 = CONCAT44(auVar414._4_4_,auVar414._0_4_);
                auVar293._0_8_ = uVar133 ^ 0x8000000080000000;
                auVar293._8_4_ = -auVar414._8_4_;
                auVar293._12_4_ = -auVar414._12_4_;
                auVar140 = ZEXT416((uint)(fVar221 * 1.5 +
                                         fVar219 * -0.5 * fVar221 * fVar221 * fVar221));
                auVar140 = vshufps_avx(auVar140,auVar140,0);
                auVar250._0_4_ = auVar140._0_4_ * auVar10._0_4_ * auVar184._0_4_;
                auVar250._4_4_ = auVar140._4_4_ * auVar10._4_4_ * auVar184._4_4_;
                auVar250._8_4_ = auVar140._8_4_ * auVar10._8_4_ * auVar184._8_4_;
                auVar250._12_4_ = auVar140._12_4_ * auVar10._12_4_ * auVar184._12_4_;
                auVar315._0_4_ = auVar414._0_4_ * auVar140._0_4_;
                auVar315._4_4_ = auVar414._4_4_ * auVar140._4_4_;
                auVar315._8_4_ = auVar414._8_4_ * auVar140._8_4_;
                auVar315._12_4_ = auVar414._12_4_ * auVar140._12_4_;
                if (fVar219 < 0.0) {
                  local_a00._0_4_ = fVar244;
                  local_a20._0_16_ = auVar315;
                  local_a40._0_16_ = auVar250;
                  fVar219 = sqrtf(fVar219);
                  auVar454 = ZEXT464(auVar225._0_4_);
                  auVar352 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar250 = local_a40._0_16_;
                  auVar315 = local_a20._0_16_;
                  fVar244 = (float)local_a00._0_4_;
                }
                else {
                  auVar141 = vsqrtss_avx(auVar141,auVar141);
                  fVar219 = auVar141._0_4_;
                }
                auVar141 = vdpps_avx(auVar224,auVar315,0x7f);
                fVar219 = (fVar179 / fVar219) * (fVar244 + 1.0) + auVar454._0_4_ + fVar244 * fVar179
                ;
                auVar184 = vdpps_avx(auVar293,auVar315,0x7f);
                auVar140 = vdpps_avx(auVar224,auVar250,0x7f);
                auVar10 = vdpps_avx(_local_9d0,auVar315,0x7f);
                auVar11 = vdpps_avx(auVar224,auVar293,0x7f);
                fVar244 = auVar184._0_4_ + auVar140._0_4_;
                fVar221 = auVar141._0_4_;
                auVar146._0_4_ = fVar221 * fVar221;
                auVar146._4_4_ = auVar141._4_4_ * auVar141._4_4_;
                auVar146._8_4_ = auVar141._8_4_ * auVar141._8_4_;
                auVar146._12_4_ = auVar141._12_4_ * auVar141._12_4_;
                auVar140 = vsubps_avx(auVar188,auVar146);
                auVar184 = vdpps_avx(auVar224,_local_9d0,0x7f);
                fVar261 = auVar11._0_4_ - fVar221 * fVar244;
                fVar262 = auVar184._0_4_ - fVar221 * auVar10._0_4_;
                auVar184 = vrsqrtss_avx(auVar140,auVar140);
                fVar263 = auVar140._0_4_;
                fVar221 = auVar184._0_4_;
                fVar221 = fVar221 * 1.5 + fVar263 * -0.5 * fVar221 * fVar221 * fVar221;
                if (fVar263 < 0.0) {
                  local_a00._0_16_ = auVar141;
                  local_a20._0_16_ = ZEXT416((uint)fVar244);
                  local_a40._0_16_ = auVar10;
                  local_800._0_4_ = fVar261;
                  local_820._0_4_ = fVar262;
                  local_840._0_4_ = fVar221;
                  fVar263 = sqrtf(fVar263);
                  auVar454 = ZEXT464(auVar225._0_4_);
                  auVar352 = ZEXT1664(ZEXT816(0) << 0x40);
                  fVar221 = (float)local_840._0_4_;
                  fVar261 = (float)local_800._0_4_;
                  fVar262 = (float)local_820._0_4_;
                  auVar10 = local_a40._0_16_;
                  auVar141 = local_a00._0_16_;
                  auVar225 = local_a20._0_16_;
                }
                else {
                  auVar225 = vsqrtss_avx(auVar140,auVar140);
                  fVar263 = auVar225._0_4_;
                  auVar225 = ZEXT416((uint)fVar244);
                }
                auVar421 = ZEXT1664(auVar414);
                auVar140 = vpermilps_avx(local_9c0._0_16_,0xff);
                auVar11 = vshufps_avx(auVar414,auVar414,0xff);
                fVar244 = fVar261 * fVar221 - auVar11._0_4_;
                auVar274._0_8_ = auVar10._0_8_ ^ 0x8000000080000000;
                auVar274._8_4_ = auVar10._8_4_ ^ 0x80000000;
                auVar274._12_4_ = auVar10._12_4_ ^ 0x80000000;
                auVar294._0_4_ = -fVar244;
                auVar294._4_4_ = 0x80000000;
                auVar294._8_4_ = 0x80000000;
                auVar294._12_4_ = 0x80000000;
                auVar184 = vinsertps_avx(ZEXT416((uint)(fVar262 * fVar221)),auVar274,0x10);
                auVar10 = vmovsldup_avx(ZEXT416((uint)(auVar225._0_4_ * fVar262 * fVar221 -
                                                      auVar10._0_4_ * fVar244)));
                auVar184 = vdivps_avx(auVar184,auVar10);
                auVar187 = ZEXT416((uint)(fVar263 - auVar140._0_4_));
                auVar140 = vinsertps_avx(auVar141,auVar187,0x10);
                auVar251._0_4_ = auVar140._0_4_ * auVar184._0_4_;
                auVar251._4_4_ = auVar140._4_4_ * auVar184._4_4_;
                auVar251._8_4_ = auVar140._8_4_ * auVar184._8_4_;
                auVar251._12_4_ = auVar140._12_4_ * auVar184._12_4_;
                auVar225 = vinsertps_avx(auVar294,auVar225,0x1c);
                auVar225 = vdivps_avx(auVar225,auVar10);
                auVar231._0_4_ = auVar140._0_4_ * auVar225._0_4_;
                auVar231._4_4_ = auVar140._4_4_ * auVar225._4_4_;
                auVar231._8_4_ = auVar140._8_4_ * auVar225._8_4_;
                auVar231._12_4_ = auVar140._12_4_ * auVar225._12_4_;
                auVar225 = vhaddps_avx(auVar251,auVar251);
                auVar184 = vhaddps_avx(auVar231,auVar231);
                fVar174 = fVar174 - auVar225._0_4_;
                local_c80 = local_c80 - auVar184._0_4_;
                auVar439 = ZEXT464((uint)local_c80);
                auVar275._8_4_ = 0x7fffffff;
                auVar275._0_8_ = 0x7fffffff7fffffff;
                auVar275._12_4_ = 0x7fffffff;
                auVar281 = ZEXT1664(auVar275);
                auVar225 = vandps_avx(auVar141,auVar275);
                if (fVar219 <= auVar225._0_4_) {
LAB_0122149f:
                  bVar101 = false;
                }
                else {
                  auVar225 = vandps_avx(auVar187,auVar275);
                  if ((float)local_860._0_4_ * 1.9073486e-06 + auVar454._0_4_ + fVar219 <=
                      auVar225._0_4_) goto LAB_0122149f;
                  local_c80 = local_c80 + (float)local_960._0_4_;
                  auVar439 = ZEXT464((uint)local_c80);
                  bVar101 = true;
                  if ((((fVar245 <= local_c80) &&
                       (fVar219 = *(float *)(ray + k * 4 + 0x100), local_c80 <= fVar219)) &&
                      (0.0 <= fVar174)) && (fVar174 <= 1.0)) {
                    auVar188 = vrsqrtss_avx(auVar188,auVar188);
                    fVar244 = auVar188._0_4_;
                    pGVar26 = (context->scene->geometries).items[uVar126].ptr;
                    if ((pGVar26->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      auVar188 = ZEXT416((uint)(fVar244 * 1.5 +
                                               fVar260 * -0.5 * fVar244 * fVar244 * fVar244));
                      auVar188 = vshufps_avx(auVar188,auVar188,0);
                      local_bc0 = auVar224._0_4_;
                      fStack_bbc = auVar224._4_4_;
                      fStack_bb8 = auVar224._8_4_;
                      fStack_bb4 = auVar224._12_4_;
                      auVar193._0_4_ = auVar188._0_4_ * local_bc0;
                      auVar193._4_4_ = auVar188._4_4_ * fStack_bbc;
                      auVar193._8_4_ = auVar188._8_4_ * fStack_bb8;
                      auVar193._12_4_ = auVar188._12_4_ * fStack_bb4;
                      auVar147._0_4_ = auVar414._0_4_ + auVar11._0_4_ * auVar193._0_4_;
                      auVar147._4_4_ = auVar414._4_4_ + auVar11._4_4_ * auVar193._4_4_;
                      auVar147._8_4_ = auVar414._8_4_ + auVar11._8_4_ * auVar193._8_4_;
                      auVar147._12_4_ = auVar414._12_4_ + auVar11._12_4_ * auVar193._12_4_;
                      auVar188 = vshufps_avx(auVar193,auVar193,0xc9);
                      auVar224 = vshufps_avx(auVar414,auVar414,0xc9);
                      auVar194._0_4_ = auVar224._0_4_ * auVar193._0_4_;
                      auVar194._4_4_ = auVar224._4_4_ * auVar193._4_4_;
                      auVar194._8_4_ = auVar224._8_4_ * auVar193._8_4_;
                      auVar194._12_4_ = auVar224._12_4_ * auVar193._12_4_;
                      auVar232._0_4_ = auVar414._0_4_ * auVar188._0_4_;
                      auVar232._4_4_ = auVar414._4_4_ * auVar188._4_4_;
                      auVar232._8_4_ = auVar414._8_4_ * auVar188._8_4_;
                      auVar232._12_4_ = auVar414._12_4_ * auVar188._12_4_;
                      auVar225 = vsubps_avx(auVar232,auVar194);
                      auVar188 = vshufps_avx(auVar225,auVar225,0xc9);
                      auVar224 = vshufps_avx(auVar147,auVar147,0xc9);
                      auVar233._0_4_ = auVar224._0_4_ * auVar188._0_4_;
                      auVar233._4_4_ = auVar224._4_4_ * auVar188._4_4_;
                      auVar233._8_4_ = auVar224._8_4_ * auVar188._8_4_;
                      auVar233._12_4_ = auVar224._12_4_ * auVar188._12_4_;
                      auVar188 = vshufps_avx(auVar225,auVar225,0xd2);
                      auVar148._0_4_ = auVar147._0_4_ * auVar188._0_4_;
                      auVar148._4_4_ = auVar147._4_4_ * auVar188._4_4_;
                      auVar148._8_4_ = auVar147._8_4_ * auVar188._8_4_;
                      auVar148._12_4_ = auVar147._12_4_ * auVar188._12_4_;
                      auVar188 = vsubps_avx(auVar233,auVar148);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar26->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x100) = local_c80;
                        uVar8 = vextractps_avx(auVar188,1);
                        *(undefined4 *)(ray + k * 4 + 0x180) = uVar8;
                        uVar8 = vextractps_avx(auVar188,2);
                        *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar8;
                        *(int *)(ray + k * 4 + 0x1c0) = auVar188._0_4_;
                        *(float *)(ray + k * 4 + 0x1e0) = fVar174;
                        *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                        *(int *)(ray + k * 4 + 0x220) = (int)local_a68;
                        *(uint *)(ray + k * 4 + 0x240) = uVar126;
                        *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      }
                      else {
                        pRVar30 = context->user;
                        auStack_5f0 = vshufps_avx(ZEXT416((uint)fVar174),ZEXT416((uint)fVar174),0);
                        auStack_650 = vshufps_avx(auVar188,auVar188,0x55);
                        auStack_630 = vshufps_avx(auVar188,auVar188,0xaa);
                        auStack_610 = vshufps_avx(auVar188,auVar188,0);
                        local_660 = (RTCHitN  [16])auStack_650;
                        local_640 = auStack_630;
                        local_620 = auStack_610;
                        local_600 = auStack_5f0;
                        local_5e0 = ZEXT832(0) << 0x20;
                        local_5c0 = local_520._0_8_;
                        uStack_5b8 = local_520._8_8_;
                        uStack_5b0 = local_520._16_8_;
                        uStack_5a8 = local_520._24_8_;
                        local_5a0 = local_500._0_8_;
                        uStack_598 = local_500._8_8_;
                        uStack_590 = local_500._16_8_;
                        uStack_588 = local_500._24_8_;
                        local_a70[1] = local_a60;
                        *local_a70 = local_a60;
                        local_580 = pRVar30->instID[0];
                        uStack_57c = local_580;
                        uStack_578 = local_580;
                        uStack_574 = local_580;
                        uStack_570 = local_580;
                        uStack_56c = local_580;
                        uStack_568 = local_580;
                        uStack_564 = local_580;
                        local_560 = pRVar30->instPrimID[0];
                        uStack_55c = local_560;
                        uStack_558 = local_560;
                        uStack_554 = local_560;
                        uStack_550 = local_560;
                        uStack_54c = local_560;
                        uStack_548 = local_560;
                        uStack_544 = local_560;
                        *(float *)(ray + k * 4 + 0x100) = local_c80;
                        local_b40 = *local_a78;
                        uStack_b38 = local_a78[1];
                        local_b30 = *local_a80;
                        uStack_b28 = local_a80[1];
                        local_ad0.valid = (int *)&local_b40;
                        local_ad0.geometryUserPtr = pGVar26->userPtr;
                        local_ad0.context = context->user;
                        local_ad0.hit = local_660;
                        local_ad0.N = 8;
                        local_ad0.ray = (RTCRayN *)ray;
                        if (pGVar26->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar421 = ZEXT1664(auVar414);
                          auVar454 = ZEXT1664(auVar454._0_16_);
                          (*pGVar26->intersectionFilterN)(&local_ad0);
                        }
                        auVar116._8_8_ = uStack_b38;
                        auVar116._0_8_ = local_b40;
                        auVar188 = vpcmpeqd_avx((undefined1  [16])0x0,auVar116);
                        auVar120._8_8_ = uStack_b28;
                        auVar120._0_8_ = local_b30;
                        auVar224 = vpcmpeqd_avx((undefined1  [16])0x0,auVar120);
                        auVar160._16_16_ = auVar224;
                        auVar160._0_16_ = auVar188;
                        auVar149 = local_a60 & ~auVar160;
                        if ((((((((auVar149 >> 0x1f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0 &&
                                 (auVar149 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 ) && (auVar149 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar149 >> 0x7f,0) == '\0')
                              && (auVar149 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                              ) && SUB321(auVar149 >> 0xbf,0) == '\0') &&
                            (auVar149 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar149[0x1f]) {
                          auVar161._0_4_ = auVar188._0_4_ ^ local_a60._0_4_;
                          auVar161._4_4_ = auVar188._4_4_ ^ local_a60._4_4_;
                          auVar161._8_4_ = auVar188._8_4_ ^ local_a60._8_4_;
                          auVar161._12_4_ = auVar188._12_4_ ^ local_a60._12_4_;
                          auVar161._16_4_ = auVar224._0_4_ ^ local_a60._16_4_;
                          auVar161._20_4_ = auVar224._4_4_ ^ local_a60._20_4_;
                          auVar161._24_4_ = auVar224._8_4_ ^ local_a60._24_4_;
                          auVar161._28_4_ = auVar224._12_4_ ^ local_a60._28_4_;
                          auVar352 = ZEXT864(0);
                          auVar281 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        }
                        else {
                          p_Var31 = context->args->filter;
                          auVar352 = ZEXT1664(ZEXT816(0));
                          auVar281 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          if ((p_Var31 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar26->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar421 = ZEXT1664(auVar421._0_16_);
                            auVar454 = ZEXT1664(auVar454._0_16_);
                            (*p_Var31)(&local_ad0);
                            auVar281 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                            auVar352 = ZEXT1664(ZEXT816(0) << 0x40);
                          }
                          auVar117._8_8_ = uStack_b38;
                          auVar117._0_8_ = local_b40;
                          auVar188 = vpcmpeqd_avx((undefined1  [16])0x0,auVar117);
                          auVar121._8_8_ = uStack_b28;
                          auVar121._0_8_ = local_b30;
                          auVar224 = vpcmpeqd_avx((undefined1  [16])0x0,auVar121);
                          auVar216._16_16_ = auVar224;
                          auVar216._0_16_ = auVar188;
                          auVar161._0_4_ = auVar188._0_4_ ^ local_a60._0_4_;
                          auVar161._4_4_ = auVar188._4_4_ ^ local_a60._4_4_;
                          auVar161._8_4_ = auVar188._8_4_ ^ local_a60._8_4_;
                          auVar161._12_4_ = auVar188._12_4_ ^ local_a60._12_4_;
                          auVar161._16_4_ = auVar224._0_4_ ^ local_a60._16_4_;
                          auVar161._20_4_ = auVar224._4_4_ ^ local_a60._20_4_;
                          auVar161._24_4_ = auVar224._8_4_ ^ local_a60._24_4_;
                          auVar161._28_4_ = auVar224._12_4_ ^ local_a60._28_4_;
                          auVar149 = local_a60 & ~auVar216;
                          if ((((((((auVar149 >> 0x1f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0 ||
                                   (auVar149 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar149 >> 0x5f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) || SUB321(auVar149 >> 0x7f,0) != '\0') ||
                                (auVar149 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                               || SUB321(auVar149 >> 0xbf,0) != '\0') ||
                              (auVar149 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                              || auVar149[0x1f] < '\0') {
                            auVar149 = vmaskmovps_avx(auVar161,*(undefined1 (*) [32])local_ad0.hit);
                            *(undefined1 (*) [32])(local_ad0.ray + 0x180) = auVar149;
                            auVar149 = vmaskmovps_avx(auVar161,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0x20));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x1a0) = auVar149;
                            auVar149 = vmaskmovps_avx(auVar161,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0x40));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x1c0) = auVar149;
                            auVar149 = vmaskmovps_avx(auVar161,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0x60));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x1e0) = auVar149;
                            auVar149 = vmaskmovps_avx(auVar161,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0x80));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x200) = auVar149;
                            auVar149 = vmaskmovps_avx(auVar161,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0xa0));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x220) = auVar149;
                            auVar149 = vmaskmovps_avx(auVar161,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0xc0));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x240) = auVar149;
                            auVar149 = vmaskmovps_avx(auVar161,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0xe0));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x260) = auVar149;
                            auVar149 = vmaskmovps_avx(auVar161,*(undefined1 (*) [32])
                                                                (local_ad0.hit + 0x100));
                            *(undefined1 (*) [32])(local_ad0.ray + 0x280) = auVar149;
                          }
                        }
                        auVar439 = ZEXT464((uint)local_c80);
                        if ((((((((auVar161 >> 0x1f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0 &&
                                 (auVar161 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                 ) && (auVar161 >> 0x5f & (undefined1  [32])0x1) ==
                                      (undefined1  [32])0x0) && SUB321(auVar161 >> 0x7f,0) == '\0')
                              && (auVar161 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0
                              ) && SUB321(auVar161 >> 0xbf,0) == '\0') &&
                            (auVar161 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                            -1 < auVar161[0x1f]) {
                          *(float *)(ray + k * 4 + 0x100) = fVar219;
                        }
                      }
                    }
                  }
                }
                auVar431 = ZEXT464((uint)fVar174);
                bVar135 = lVar129 != 0;
                lVar129 = lVar129 + -1;
              } while ((!bVar101) && (bVar135));
              uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar162._4_4_ = uVar8;
              auVar162._0_4_ = uVar8;
              auVar162._8_4_ = uVar8;
              auVar162._12_4_ = uVar8;
              auVar162._16_4_ = uVar8;
              auVar162._20_4_ = uVar8;
              auVar162._24_4_ = uVar8;
              auVar162._28_4_ = uVar8;
              auVar164 = vcmpps_avx(_local_900,auVar162,2);
              auVar149 = vandps_avx(auVar164,local_780);
              local_780 = local_780 & auVar164;
              auVar323 = ZEXT3264(local_9a0);
              uVar133 = local_7a0;
            } while ((((((((local_780 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (local_780 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_780 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(local_780 >> 0x7f,0) != '\0') ||
                       (local_780 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(local_780 >> 0xbf,0) != '\0') ||
                     (local_780 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     local_780[0x1f] < '\0');
          }
          auVar149 = vandps_avx(local_7c0,local_6c0);
          auVar164 = vandps_avx(_local_940,_local_920);
          auVar242._0_4_ = auVar323._0_4_ + local_360._0_4_;
          auVar242._4_4_ = auVar323._4_4_ + local_360._4_4_;
          auVar242._8_4_ = auVar323._8_4_ + local_360._8_4_;
          auVar242._12_4_ = auVar323._12_4_ + local_360._12_4_;
          auVar242._16_4_ = auVar323._16_4_ + local_360._16_4_;
          auVar242._20_4_ = auVar323._20_4_ + local_360._20_4_;
          auVar242._24_4_ = auVar323._24_4_ + local_360._24_4_;
          auVar242._28_4_ = auVar323._28_4_ + local_360._28_4_;
          uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar280._4_4_ = uVar8;
          auVar280._0_4_ = uVar8;
          auVar280._8_4_ = uVar8;
          auVar280._12_4_ = uVar8;
          auVar280._16_4_ = uVar8;
          auVar280._20_4_ = uVar8;
          auVar280._24_4_ = uVar8;
          auVar280._28_4_ = uVar8;
          auVar32 = vcmpps_avx(auVar242,auVar280,2);
          auVar149 = vandps_avx(auVar32,auVar149);
          auVar301._0_4_ = auVar323._0_4_ + local_320._0_4_;
          auVar301._4_4_ = auVar323._4_4_ + local_320._4_4_;
          auVar301._8_4_ = auVar323._8_4_ + local_320._8_4_;
          auVar301._12_4_ = auVar323._12_4_ + local_320._12_4_;
          auVar301._16_4_ = auVar323._16_4_ + local_320._16_4_;
          auVar301._20_4_ = auVar323._20_4_ + local_320._20_4_;
          auVar301._24_4_ = auVar323._24_4_ + local_320._24_4_;
          auVar301._28_4_ = auVar323._28_4_ + local_320._28_4_;
          auVar32 = vcmpps_avx(auVar301,auVar280,2);
          auVar164 = vandps_avx(auVar32,auVar164);
          auVar164 = vorps_avx(auVar149,auVar164);
          if ((((((((auVar164 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar164 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar164 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar164 >> 0x7f,0) != '\0') ||
                (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar164 >> 0xbf,0) != '\0') ||
              (auVar164 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar164[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar127 * 0x60) = auVar164;
            auVar149 = vblendvps_avx(_local_320,_local_360,auVar149);
            *(undefined1 (*) [32])(auStack_160 + uVar127 * 0x60) = auVar149;
            auVar123._8_8_ = uStack_968;
            auVar123._0_8_ = local_970;
            uVar9 = vmovlps_avx(auVar123);
            *(undefined8 *)(afStack_140 + uVar127 * 0x18) = uVar9;
            auStack_138[uVar127 * 0x18] = (int)uVar133 + 1;
            uVar127 = (ulong)((int)uVar127 + 1);
          }
        }
        auVar281 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                       &
                                                  DAT_3f8000003f800000)))))));
      }
    }
    do {
      if ((int)uVar127 == 0) {
        uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar167._4_4_ = uVar8;
        auVar167._0_4_ = uVar8;
        auVar167._8_4_ = uVar8;
        auVar167._12_4_ = uVar8;
        auVar167._16_4_ = uVar8;
        auVar167._20_4_ = uVar8;
        auVar167._24_4_ = uVar8;
        auVar167._28_4_ = uVar8;
        auVar149 = vcmpps_avx(local_2c0,auVar167,2);
        uVar126 = vmovmskps_avx(auVar149);
        uVar126 = (uint)local_948 - 1 & (uint)local_948 & uVar126;
        if (uVar126 == 0) {
          return;
        }
        goto LAB_0121ec41;
      }
      uVar134 = (ulong)((int)uVar127 - 1);
      lVar129 = uVar134 * 0x60;
      auVar149 = *(undefined1 (*) [32])(auStack_160 + lVar129);
      auVar163._0_4_ = auVar323._0_4_ + auVar149._0_4_;
      auVar163._4_4_ = auVar323._4_4_ + auVar149._4_4_;
      auVar163._8_4_ = auVar323._8_4_ + auVar149._8_4_;
      auVar163._12_4_ = auVar323._12_4_ + auVar149._12_4_;
      auVar163._16_4_ = auVar323._16_4_ + auVar149._16_4_;
      auVar163._20_4_ = auVar323._20_4_ + auVar149._20_4_;
      auVar163._24_4_ = auVar323._24_4_ + auVar149._24_4_;
      auVar163._28_4_ = auVar323._28_4_ + auVar149._28_4_;
      uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar259._4_4_ = uVar8;
      auVar259._0_4_ = uVar8;
      auVar259._8_4_ = uVar8;
      auVar259._12_4_ = uVar8;
      auVar259._16_4_ = uVar8;
      auVar259._20_4_ = uVar8;
      auVar259._24_4_ = uVar8;
      auVar259._28_4_ = uVar8;
      auVar32 = vcmpps_avx(auVar163,auVar259,2);
      auVar164 = vandps_avx(auVar32,*(undefined1 (*) [32])(auStack_180 + lVar129));
      _local_660 = auVar164;
      auVar32 = *(undefined1 (*) [32])(auStack_180 + lVar129) & auVar32;
      bVar107 = (auVar32 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar108 = (auVar32 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar106 = (auVar32 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar105 = SUB321(auVar32 >> 0x7f,0) == '\0';
      bVar104 = (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar103 = SUB321(auVar32 >> 0xbf,0) == '\0';
      bVar135 = (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar101 = -1 < auVar32[0x1f];
      if (((((((!bVar107 || !bVar108) || !bVar106) || !bVar105) || !bVar104) || !bVar103) ||
          !bVar135) || !bVar101) {
        auVar243._8_4_ = 0x7f800000;
        auVar243._0_8_ = 0x7f8000007f800000;
        auVar243._12_4_ = 0x7f800000;
        auVar243._16_4_ = 0x7f800000;
        auVar243._20_4_ = 0x7f800000;
        auVar243._24_4_ = 0x7f800000;
        auVar243._28_4_ = 0x7f800000;
        auVar149 = vblendvps_avx(auVar243,auVar149,auVar164);
        auVar32 = vshufps_avx(auVar149,auVar149,0xb1);
        auVar32 = vminps_avx(auVar149,auVar32);
        auVar198 = vshufpd_avx(auVar32,auVar32,5);
        auVar32 = vminps_avx(auVar32,auVar198);
        auVar198 = vperm2f128_avx(auVar32,auVar32,1);
        auVar32 = vminps_avx(auVar32,auVar198);
        auVar149 = vcmpps_avx(auVar149,auVar32,0);
        auVar32 = auVar164 & auVar149;
        if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar32 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar32 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar32 >> 0x7f,0) != '\0') ||
              (auVar32 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar32 >> 0xbf,0) != '\0') ||
            (auVar32 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar32[0x1f] < '\0') {
          auVar164 = vandps_avx(auVar149,auVar164);
        }
        fVar179 = afStack_140[uVar134 * 0x18 + 1];
        uVar133 = (ulong)auStack_138[uVar134 * 0x18];
        uVar130 = vmovmskps_avx(auVar164);
        uVar128 = 0;
        if (uVar130 != 0) {
          for (; (uVar130 >> uVar128 & 1) == 0; uVar128 = uVar128 + 1) {
          }
        }
        fVar260 = afStack_140[uVar134 * 0x18];
        *(undefined4 *)(local_660 + (ulong)uVar128 * 4) = 0;
        if ((((((((_local_660 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (_local_660 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (_local_660 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(_local_660 >> 0x7f,0) != '\0') ||
              (_local_660 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(_local_660 >> 0xbf,0) != '\0') ||
            (_local_660 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_660[0x1f] < '\0') {
          uVar134 = uVar127;
        }
        *(undefined1 (*) [32])(auStack_180 + lVar129) = _local_660;
        auVar188 = vshufps_avx(ZEXT416((uint)(fVar179 - fVar260)),ZEXT416((uint)(fVar179 - fVar260))
                               ,0);
        local_360._4_4_ = fVar260 + auVar188._4_4_ * 0.14285715;
        local_360._0_4_ = fVar260 + auVar188._0_4_ * 0.0;
        fStack_358 = fVar260 + auVar188._8_4_ * 0.2857143;
        fStack_354 = fVar260 + auVar188._12_4_ * 0.42857146;
        fStack_350 = fVar260 + auVar188._0_4_ * 0.5714286;
        fStack_34c = fVar260 + auVar188._4_4_ * 0.71428573;
        fStack_348 = fVar260 + auVar188._8_4_ * 0.8571429;
        fStack_344 = fVar260 + auVar188._12_4_;
        local_970 = *(undefined8 *)(local_360 + (ulong)uVar128 * 4);
        uStack_968 = 0;
      }
      uVar127 = uVar134;
    } while (((((((bVar107 && bVar108) && bVar106) && bVar105) && bVar104) && bVar103) && bVar135)
             && bVar101);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }